

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_x86_avx512.cpp
# Opt level: O2

int __thiscall
ncnn::ConvolutionDepthWise_x86_avx512::forward
          (ConvolutionDepthWise_x86_avx512 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float *pfVar1;
  undefined4 uVar2;
  undefined1 auVar3 [64];
  undefined1 auVar4 [64];
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  int iVar11;
  int iVar12;
  size_t sVar13;
  void *pvVar14;
  size_t sVar15;
  int *piVar16;
  _func_int **pp_Var17;
  Layer *pLVar18;
  ulong uVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined8 uVar28;
  undefined8 uVar29;
  Allocator *pAVar30;
  int iVar31;
  int iVar32;
  int iVar33;
  int iVar34;
  ulong uVar35;
  uint uVar36;
  int iVar37;
  void *pvVar38;
  _func_int ***ppp_Var39;
  _func_int *p_Var40;
  uint uVar41;
  _func_int ***ppp_Var42;
  _func_int ***ppp_Var43;
  int i_1;
  uint uVar44;
  int iVar45;
  pointer piVar46;
  float *pfVar47;
  int iVar48;
  int iVar49;
  ulong uVar50;
  long lVar51;
  undefined1 (*pauVar52) [64];
  int j;
  int iVar53;
  int iVar54;
  long lVar55;
  long lVar56;
  uint uVar57;
  long lVar58;
  undefined1 (*pauVar59) [16];
  undefined1 (*pauVar60) [16];
  undefined1 (*pauVar61) [64];
  undefined1 (*pauVar62) [32];
  size_t _elemsize;
  void *pvVar63;
  void *pvVar64;
  _func_int ***ppp_Var65;
  ulong uVar66;
  int j_2;
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  void *pvVar67;
  pointer piVar68;
  void *pvVar69;
  ulong uVar70;
  long lVar71;
  ulong uVar72;
  undefined1 (*pauVar73) [16];
  bool bVar74;
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [64];
  undefined1 auVar118 [64];
  undefined1 auVar119 [64];
  undefined1 auVar120 [64];
  undefined1 auVar121 [64];
  undefined1 auVar122 [64];
  undefined1 auVar123 [64];
  undefined1 auVar124 [64];
  undefined1 auVar125 [64];
  undefined1 auVar126 [64];
  undefined1 auVar127 [64];
  undefined1 auVar128 [64];
  undefined1 auVar129 [64];
  undefined1 auVar130 [64];
  float fVar131;
  undefined1 auVar132 [16];
  undefined1 auVar133 [64];
  undefined1 auVar134 [32];
  undefined1 auVar135 [16];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [16];
  v4sf one;
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 in_ZMM30 [64];
  Mat local_218;
  long local_1d0;
  Option opt_p;
  vector<int,_std::allocator<int>_> _space_ofs;
  Mat m_1;
  Mat m;
  Option opt_g;
  undefined1 auVar93 [16];
  
  auVar90 = in_ZMM30._0_16_;
  p_Var40 = this->_vptr_ConvolutionDepthWise_x86_avx512[-3];
  if ((opt->use_int8_inference == true) && (*(int *)(&this->field_0x10c + (long)p_Var40) != 0)) {
    iVar33 = forward_int8_x86(this,bottom_blob,top_blob,opt);
    return iVar33;
  }
  uVar44 = bottom_blob->c;
  uVar72 = (ulong)uVar44;
  uVar66 = bottom_blob->elemsize;
  iVar33 = bottom_blob->elempack;
  iVar45 = *(int *)(&this->field_0xd4 + (long)p_Var40);
  iVar53 = *(int *)(&this->field_0xdc + (long)p_Var40);
  iVar37 = *(int *)(&this->field_0xd8 + (long)p_Var40);
  iVar11 = *(int *)(&this->field_0xe0 + (long)p_Var40);
  local_218.cstep = 0;
  local_218.data = (Allocator *)0x0;
  local_218.refcount._0_4_ = 0;
  local_218.refcount._4_4_ = 0;
  local_218.elemsize = SUB168(ZEXT816(0) << 0x40,4);
  local_218.elempack = 0;
  local_218.h = 0;
  local_218.allocator = (Allocator *)local_218.data;
  local_218.dims = (int)local_218.refcount;
  local_218.w = local_218.refcount._4_4_;
  local_218.d = (int)local_218.refcount;
  local_218.c = local_218.elempack;
  ConvolutionDepthWise::make_padding
            ((ConvolutionDepthWise *)
             ((long)&this->_vptr_ConvolutionDepthWise_x86_avx512 +
             (long)this->_vptr_ConvolutionDepthWise_x86_avx512[-3]),bottom_blob,&local_218,opt);
  iVar31 = local_218.w;
  iVar49 = -100;
  if (((Allocator *)local_218.data == (Allocator *)0x0) ||
     ((long)local_218.c * local_218.cstep == 0)) goto LAB_003dd700;
  p_Var40 = this->_vptr_ConvolutionDepthWise_x86_avx512[-3];
  iVar45 = (~((iVar45 + -1) * iVar53) + local_218.w) / *(int *)(&this->field_0xe4 + (long)p_Var40);
  iVar48 = iVar45 + 1;
  iVar53 = (~((iVar37 + -1) * iVar11) + local_218.h) / *(int *)(&this->field_0xe8 + (long)p_Var40);
  uVar41 = *(uint *)(&this->field_0xd0 + (long)p_Var40);
  if (opt->use_packing_layout == true) {
    if ((uVar41 & 0xf) == 0) {
      uVar57 = 0x10;
    }
    else if ((uVar41 & 7) == 0) {
      uVar57 = 8;
    }
    else {
      uVar57 = (uint)((uVar41 & 3) == 0) * 3 + 1;
    }
  }
  else {
    uVar57 = 1;
  }
  _elemsize = (uVar66 / (ulong)(long)iVar33) * (ulong)uVar57;
  local_1d0 = CONCAT44(local_1d0._4_4_,iVar53 + 1);
  Mat::create(top_blob,iVar48,iVar53 + 1,(int)uVar41 / (int)uVar57,_elemsize,uVar57,
              opt->blob_allocator);
  sVar15 = local_218.cstep;
  iVar32 = local_218.d;
  iVar54 = local_218.h;
  iVar11 = local_218.w;
  pAVar30 = local_218.allocator;
  iVar37 = local_218.elempack;
  auVar81 = _DAT_004ce640;
  pvVar67 = top_blob->data;
  if ((pvVar67 == (void *)0x0) || (sVar13 = top_blob->cstep, (long)top_blob->c * sVar13 == 0))
  goto LAB_003dd700;
  iVar34 = iVar33 * uVar44;
  p_Var40 = this->_vptr_ConvolutionDepthWise_x86_avx512[-3];
  iVar49 = *(int *)(&this->field_0xd0 + (long)p_Var40);
  iVar12 = *(int *)(&this->field_0x108 + (long)p_Var40);
  if ((iVar34 == iVar12) && (iVar34 == iVar49)) {
    iVar49 = iVar34;
    if (iVar33 == 1) {
      if ((*(int *)(&this->field_0xd4 + (long)p_Var40) != 3) ||
         (*(int *)(&this->field_0xd8 + (long)p_Var40) != 3)) goto LAB_003db252;
      if ((*(int *)(&this->field_0xdc + (long)p_Var40) == 1) &&
         (((*(int *)(&this->field_0xe0 + (long)p_Var40) == 1 &&
           (*(int *)(&this->field_0xe4 + (long)p_Var40) == 1)) &&
          (*(int *)(&this->field_0xe8 + (long)p_Var40) == 1)))) {
        local_1d0 = (long)local_218.w;
        iVar33 = top_blob->w;
        iVar45 = top_blob->h;
        pvVar14 = (this->weight_data_tm).data;
        lVar56 = *(long *)(&this->field_0x1b0 + (long)p_Var40);
        sVar15 = top_blob->elemsize;
        lVar51 = (long)iVar33;
        uVar72 = 0;
        uVar66 = (ulong)(uint)local_218.c;
        if (local_218.c < 1) {
          uVar66 = uVar72;
        }
        lVar58 = (long)(local_218.w + 2) * 4;
        for (; uVar72 != uVar66; uVar72 = uVar72 + 1) {
          if (lVar56 == 0) {
            fVar131 = 0.0;
          }
          else {
            fVar131 = *(float *)(lVar56 + uVar72 * 4);
          }
          pvVar64 = (void *)(sVar13 * sVar15 * uVar72 + (long)pvVar67);
          lVar55 = uVar72 * 0x24;
          ppp_Var42 = (_func_int ***)
                      ((long)(_func_int ***)local_218.data +
                      local_218.elemsize * local_218.cstep * uVar72);
          piVar46 = (pointer)((long)ppp_Var42 + local_1d0 * 4);
          ppp_Var43 = ppp_Var42 + local_1d0;
          piVar68 = (pointer)((long)ppp_Var42 + local_1d0 * 0xc);
          pvVar38 = pvVar64;
          for (uVar44 = 0; (int)(uVar44 | 1) < iVar45; uVar44 = uVar44 + 2) {
            lVar71 = 0;
            for (iVar53 = iVar33; 0 < iVar53; iVar53 = iVar53 + -1) {
              auVar134 = *(undefined1 (*) [32])((long)pvVar14 + lVar55);
              auVar83._8_8_ = 0;
              auVar83._0_8_ = *(ulong *)((long)ppp_Var42 + lVar71 + 4);
              auVar90 = vmovlhps_avx(ZEXT416(*(uint *)((long)ppp_Var42 + lVar71)),auVar83);
              auVar90 = vshufps_avx(auVar90,auVar83,0xd8);
              auVar90 = vinsertps_avx(auVar90,ZEXT416(*(uint *)((long)piVar46 + lVar71)),0x30);
              uVar50 = *(ulong *)((long)piVar46 + lVar71 + 4);
              auVar85._8_8_ = 0;
              auVar85._0_8_ = uVar50;
              auVar107._16_8_ = uVar50;
              auVar107._0_16_ = auVar90;
              auVar107._24_8_ = 0;
              auVar87._8_8_ = 0;
              auVar87._0_8_ = *(ulong *)((long)ppp_Var43 + lVar71);
              auVar137._16_8_ = *(ulong *)((long)ppp_Var43 + lVar71);
              auVar137._0_16_ = auVar90;
              auVar137._24_8_ = 0;
              auVar111 = vshufpd_avx(auVar107,auVar137,2);
              auVar84._0_4_ = auVar134._0_4_ * auVar111._0_4_;
              auVar84._4_4_ = auVar134._4_4_ * auVar111._4_4_;
              auVar84._8_4_ = auVar134._8_4_ * auVar111._8_4_;
              auVar84._12_4_ = auVar134._12_4_ * auVar111._12_4_;
              auVar102._16_4_ = auVar134._16_4_ * auVar111._16_4_;
              auVar102._0_16_ = auVar84;
              auVar102._20_4_ = auVar134._20_4_ * auVar111._20_4_;
              auVar102._24_4_ = auVar134._24_4_ * auVar111._24_4_;
              auVar102._28_4_ = auVar111._28_4_;
              auVar90 = vhaddps_avx(auVar102._16_16_,auVar84);
              auVar90 = vhaddps_avx(auVar90,auVar90);
              auVar90 = vhaddps_avx(auVar90,auVar90);
              uVar2 = *(undefined4 *)((long)(ppp_Var43 + 1) + lVar71);
              auVar86._4_4_ = uVar2;
              auVar86._0_4_ = uVar2;
              auVar86._8_4_ = uVar2;
              auVar86._12_4_ = uVar2;
              auVar112._16_4_ = uVar2;
              auVar112._0_16_ = auVar86;
              auVar112._20_4_ = uVar2;
              auVar112._24_4_ = uVar2;
              auVar112._28_4_ = uVar2;
              auVar82 = vshufps_avx(auVar87,auVar85,0x41);
              auVar111 = vpermt2ps_avx512vl(ZEXT1632(auVar82),ZEXT1632(auVar81),auVar134);
              auVar113._16_8_ = *(undefined8 *)((long)piVar68 + lVar71);
              auVar113._0_16_ = auVar111._0_16_;
              auVar113._24_8_ = 0;
              auVar111 = vblendps_avx(auVar111,auVar112,0x20);
              auVar111 = vshufpd_avx(auVar111,auVar113,2);
              auVar134 = vblendps_avx(auVar134,ZEXT432(*(uint *)((long)piVar46 + lVar71)),1);
              auVar82._0_4_ = auVar111._0_4_ * auVar134._0_4_;
              auVar82._4_4_ = auVar111._4_4_ * auVar134._4_4_;
              auVar82._8_4_ = auVar111._8_4_ * auVar134._8_4_;
              auVar82._12_4_ = auVar111._12_4_ * auVar134._12_4_;
              auVar103._16_4_ = auVar111._16_4_ * auVar134._16_4_;
              auVar103._0_16_ = auVar82;
              auVar103._20_4_ = auVar111._20_4_ * auVar134._20_4_;
              auVar103._24_4_ = auVar111._24_4_ * auVar134._24_4_;
              auVar103._28_4_ = auVar134._28_4_;
              auVar82 = vhaddps_avx(auVar103._16_16_,auVar82);
              auVar82 = vhaddps_avx(auVar82,auVar82);
              auVar84 = ZEXT416(*(uint *)((long)pvVar14 + lVar55 + 0x20));
              auVar83 = vfmadd231ss_fma(auVar90,auVar84,auVar86);
              auVar90 = vhaddps_avx(auVar82,auVar82);
              auVar90 = vfmadd231ss_fma(auVar90,auVar84,
                                        ZEXT416(*(uint *)((long)piVar68 + lVar71 + 8)));
              *(float *)((long)pvVar64 + lVar71) = auVar83._0_4_ + fVar131;
              *(float *)((long)pvVar38 + lVar71 + lVar51 * 4) = auVar90._0_4_ + fVar131;
              lVar71 = lVar71 + 4;
            }
            ppp_Var42 = (_func_int ***)((long)ppp_Var42 + lVar71 + lVar58);
            piVar46 = (pointer)((long)piVar46 + lVar71 + lVar58);
            ppp_Var43 = (_func_int ***)((long)ppp_Var43 + lVar71 + lVar58);
            piVar68 = (pointer)((long)piVar68 + lVar71 + lVar58);
            pvVar64 = (void *)((long)pvVar64 + lVar71 + lVar51 * 4);
            pvVar38 = (void *)((long)pvVar38 + lVar71 + lVar51 * 4);
          }
          for (; (int)uVar44 < iVar45; uVar44 = uVar44 + 1) {
            lVar71 = 0;
            for (iVar53 = iVar33; 0 < iVar53; iVar53 = iVar53 + -1) {
              auVar88._8_8_ = 0;
              auVar88._0_8_ = *(ulong *)((long)ppp_Var42 + lVar71 + 4);
              auVar90 = vmovlhps_avx(ZEXT416(*(uint *)((long)ppp_Var42 + lVar71)),auVar88);
              auVar90 = vshufps_avx(auVar90,auVar88,0xd8);
              auVar90 = vinsertps_avx(auVar90,ZEXT416(*(uint *)((long)piVar46 + lVar71)),0x30);
              auVar116._16_8_ = *(undefined8 *)((long)piVar46 + lVar71 + 4);
              auVar116._0_16_ = auVar90;
              auVar116._24_8_ = 0;
              auVar115._16_8_ = *(undefined8 *)((long)ppp_Var43 + lVar71);
              auVar115._0_16_ = auVar90;
              auVar115._24_8_ = 0;
              auVar134 = vshufpd_avx(auVar116,auVar115,2);
              pfVar47 = (float *)((long)pvVar14 + lVar55);
              auVar89._0_4_ = auVar134._0_4_ * *pfVar47;
              auVar89._4_4_ = auVar134._4_4_ * pfVar47[1];
              auVar89._8_4_ = auVar134._8_4_ * pfVar47[2];
              auVar89._12_4_ = auVar134._12_4_ * pfVar47[3];
              auVar114._16_4_ = auVar134._16_4_ * pfVar47[4];
              auVar114._0_16_ = auVar89;
              auVar114._20_4_ = auVar134._20_4_ * pfVar47[5];
              auVar114._24_4_ = auVar134._24_4_ * pfVar47[6];
              auVar114._28_4_ = auVar134._28_4_;
              auVar90 = vhaddps_avx(auVar114._16_16_,auVar89);
              auVar90 = vhaddps_avx(auVar90,auVar90);
              auVar90 = vhaddps_avx(auVar90,auVar90);
              auVar90 = vfmadd231ss_fma(auVar90,ZEXT416(*(uint *)((long)pvVar14 + lVar55 + 0x20)),
                                        ZEXT416(*(uint *)((long)(ppp_Var43 + 1) + lVar71)));
              *(float *)((long)pvVar64 + lVar71) = auVar90._0_4_ + fVar131;
              lVar71 = lVar71 + 4;
            }
            ppp_Var42 = (_func_int ***)((long)(ppp_Var42 + 1) + lVar71);
            piVar46 = (pointer)((long)piVar46 + lVar71 + 8);
            ppp_Var43 = (_func_int ***)((long)(ppp_Var43 + 1) + lVar71);
            pvVar64 = (void *)((long)pvVar64 + lVar71);
          }
        }
      }
      else {
        if ((((*(int *)(&this->field_0xdc + (long)p_Var40) != 1) ||
             (*(int *)(&this->field_0xe0 + (long)p_Var40) != 1)) ||
            (*(int *)(&this->field_0xe4 + (long)p_Var40) != 2)) ||
           (*(int *)(&this->field_0xe8 + (long)p_Var40) != 2)) goto LAB_003db252;
        lVar51 = (long)local_218.w;
        iVar33 = top_blob->w;
        pvVar14 = (this->weight_data_tm).data;
        lVar56 = *(long *)(&this->field_0x1b0 + (long)p_Var40);
        sVar15 = top_blob->elemsize;
        local_1d0 = lVar51 * 2;
        uVar72 = 0;
        uVar66 = (ulong)(uint)top_blob->h;
        if (top_blob->h < 1) {
          uVar66 = uVar72;
        }
        uVar50 = (ulong)(uint)local_218.c;
        if (local_218.c < 1) {
          uVar50 = uVar72;
        }
        lVar58 = (long)((local_218.w - iVar33) * 2) * 4;
        for (; uVar72 != uVar50; uVar72 = uVar72 + 1) {
          if (lVar56 == 0) {
            fVar131 = 0.0;
          }
          else {
            fVar131 = *(float *)(lVar56 + uVar72 * 4);
          }
          pfVar47 = (float *)(sVar13 * sVar15 * uVar72 + (long)pvVar67);
          ppp_Var42 = (_func_int ***)
                      ((long)(_func_int ***)local_218.data +
                      local_218.elemsize * local_218.cstep * uVar72);
          piVar46 = (pointer)((long)ppp_Var42 + lVar51 * 4);
          ppp_Var43 = ppp_Var42 + lVar51;
          for (iVar45 = 0; iVar45 != (int)uVar66; iVar45 = iVar45 + 1) {
            lVar55 = 0;
            for (iVar53 = iVar33; 0 < iVar53; iVar53 = iVar53 + -1) {
              auVar81._8_8_ = 0;
              auVar81._0_8_ = *(ulong *)((long)ppp_Var42 + lVar55 + 4);
              auVar90 = vmovlhps_avx(ZEXT416(*(uint *)((long)ppp_Var42 + lVar55)),auVar81);
              auVar90 = vshufps_avx(auVar90,auVar81,0xd8);
              auVar90 = vinsertps_avx(auVar90,ZEXT416(*(uint *)((long)piVar46 + lVar55)),0x30);
              auVar136._16_8_ = *(undefined8 *)((long)piVar46 + lVar55 + 4);
              auVar136._0_16_ = auVar90;
              auVar136._24_8_ = 0;
              auVar134._16_8_ = *(undefined8 *)((long)ppp_Var43 + lVar55);
              auVar134._0_16_ = auVar90;
              auVar134._24_8_ = 0;
              auVar134 = vshufpd_avx(auVar136,auVar134,2);
              pfVar1 = (float *)((long)pvVar14 + uVar72 * 0x24);
              auVar90._0_4_ = auVar134._0_4_ * *pfVar1;
              auVar90._4_4_ = auVar134._4_4_ * pfVar1[1];
              auVar90._8_4_ = auVar134._8_4_ * pfVar1[2];
              auVar90._12_4_ = auVar134._12_4_ * pfVar1[3];
              auVar111._16_4_ = auVar134._16_4_ * pfVar1[4];
              auVar111._0_16_ = auVar90;
              auVar111._20_4_ = auVar134._20_4_ * pfVar1[5];
              auVar111._24_4_ = auVar134._24_4_ * pfVar1[6];
              auVar111._28_4_ = auVar134._28_4_;
              auVar90 = vhaddps_avx(auVar111._16_16_,auVar90);
              auVar90 = vhaddps_avx(auVar90,auVar90);
              auVar90 = vhaddps_avx(auVar90,auVar90);
              auVar90 = vfmadd231ss_fma(auVar90,ZEXT416(*(uint *)((long)pvVar14 +
                                                                 uVar72 * 0x24 + 0x20)),
                                        ZEXT416(*(uint *)((long)(ppp_Var43 + 1) + lVar55)));
              *pfVar47 = auVar90._0_4_ + fVar131;
              pfVar47 = pfVar47 + 1;
              lVar55 = lVar55 + 8;
            }
            ppp_Var42 = (_func_int ***)((long)ppp_Var42 + lVar55 + lVar58);
            piVar46 = (pointer)((long)piVar46 + lVar55 + lVar58);
            ppp_Var43 = (_func_int ***)((long)ppp_Var43 + lVar55 + lVar58);
          }
        }
      }
LAB_003dd74c:
      pLVar18 = this->activation;
      if (pLVar18 != (Layer *)0x0) {
        (*pLVar18->_vptr_Layer[9])(pLVar18,top_blob,opt);
      }
    }
    else {
      if (iVar33 == 4) {
        iVar33 = *(int *)(&this->field_0xd4 + (long)p_Var40);
        iVar37 = *(int *)(&this->field_0xd8 + (long)p_Var40);
        if (iVar33 == 5) {
          if (iVar37 == 5) {
            if (((*(int *)(&this->field_0xdc + (long)p_Var40) == 1) &&
                (*(int *)(&this->field_0xe0 + (long)p_Var40) == 1)) &&
               ((*(int *)(&this->field_0xe4 + (long)p_Var40) == 1 &&
                (*(int *)(&this->field_0xe8 + (long)p_Var40) == 1)))) {
              uVar44 = top_blob->w;
              iVar33 = top_blob->h;
              lVar56 = *(long *)(&this->field_0x1b0 + (long)p_Var40);
              uVar72 = 0;
              uVar66 = (ulong)uVar44;
              if ((int)uVar44 < 1) {
                uVar66 = uVar72;
              }
              uVar50 = (ulong)(uint)local_218.c;
              if (local_218.c < 1) {
                uVar50 = uVar72;
              }
              lVar58 = (long)(local_218.w * 4 + 0x10) * 4;
              lVar51 = (long)(int)(uVar44 * 4) * 4;
              for (; uVar72 != uVar50; uVar72 = uVar72 + 1) {
                if (lVar56 == 0) {
                  auVar90 = ZEXT816(0) << 0x40;
                }
                else {
                  auVar90 = *(undefined1 (*) [16])(lVar56 + uVar72 * 0x10);
                }
                pvVar63 = (void *)(top_blob->cstep * uVar72 * top_blob->elemsize +
                                  (long)top_blob->data);
                pvVar14 = (this->weight_data_tm).data;
                lVar71 = (long)(this->weight_data_tm).w * uVar72 * (this->weight_data_tm).elemsize;
                pvVar69 = (void *)((long)top_blob->w * top_blob->elemsize + (long)pvVar63);
                ppp_Var42 = (_func_int ***)
                            ((long)(_func_int ***)local_218.data +
                            local_218.cstep * uVar72 * local_218.elemsize);
                lVar55 = (long)local_218.w * local_218.elemsize;
                ppp_Var43 = (_func_int ***)((long)ppp_Var42 + lVar55);
                pvVar67 = (void *)((long)ppp_Var42 + lVar55 * 2);
                pvVar64 = (void *)((long)ppp_Var42 + lVar55 * 3);
                piVar46 = (pointer)((long)ppp_Var42 + lVar55 * 4);
                pvVar38 = (void *)((long)ppp_Var42 + lVar55 * 5);
                for (uVar44 = 0; (int)(uVar44 | 1) < iVar33; uVar44 = uVar44 + 2) {
                  lVar55 = 0;
                  uVar70 = uVar66;
                  while (iVar45 = (int)uVar70, uVar70 = (ulong)(iVar45 - 1), iVar45 != 0) {
                    auVar81 = *(undefined1 (*) [16])((long)pvVar14 + lVar71 + 0x10);
                    auVar82 = *(undefined1 (*) [16])((long)pvVar14 + lVar71 + 0x20);
                    auVar83 = *(undefined1 (*) [16])((long)pvVar14 + lVar71 + 0x30);
                    auVar84 = vfmadd213ps_fma(*(undefined1 (*) [16])((long)ppp_Var42 + lVar55),
                                              *(undefined1 (*) [16])((long)pvVar14 + lVar71),auVar90
                                             );
                    auVar84 = vfmadd231ps_fma(auVar84,auVar81,
                                              *(undefined1 (*) [16])((long)(ppp_Var42 + 2) + lVar55)
                                             );
                    auVar84 = vfmadd231ps_fma(auVar84,auVar82,
                                              *(undefined1 (*) [16])((long)(ppp_Var42 + 4) + lVar55)
                                             );
                    auVar85 = vfmadd231ps_fma(auVar84,auVar83,
                                              *(undefined1 (*) [16])((long)(ppp_Var42 + 6) + lVar55)
                                             );
                    auVar84 = *(undefined1 (*) [16])((long)pvVar14 + lVar71 + 0x40);
                    auVar86 = vfmadd231ps_fma(auVar85,auVar84,
                                              *(undefined1 (*) [16])((long)(ppp_Var42 + 8) + lVar55)
                                             );
                    auVar85 = vfmadd213ps_fma(*(undefined1 (*) [16])((long)pvVar14 + lVar71),
                                              *(undefined1 (*) [16])((long)ppp_Var43 + lVar55),
                                              auVar90);
                    auVar81 = vfmadd231ps_fma(auVar85,*(undefined1 (*) [16])
                                                       ((long)(ppp_Var43 + 2) + lVar55),auVar81);
                    auVar81 = vfmadd231ps_fma(auVar81,*(undefined1 (*) [16])
                                                       ((long)(ppp_Var43 + 4) + lVar55),auVar82);
                    auVar81 = vfmadd231ps_fma(auVar81,*(undefined1 (*) [16])
                                                       ((long)(ppp_Var43 + 6) + lVar55),auVar83);
                    auVar76 = vfmadd231ps_fma(auVar81,*(undefined1 (*) [16])
                                                       ((long)(ppp_Var43 + 8) + lVar55),auVar84);
                    auVar81 = *(undefined1 (*) [16])((long)pvVar14 + lVar71 + 0x50);
                    auVar82 = *(undefined1 (*) [16])((long)pvVar14 + lVar71 + 0x60);
                    auVar83 = *(undefined1 (*) [16])((long)pvVar14 + lVar71 + 0x70);
                    auVar84 = *(undefined1 (*) [16])((long)pvVar14 + lVar71 + 0x80);
                    auVar85 = *(undefined1 (*) [16])((long)pvVar14 + lVar71 + 0x90);
                    auVar86 = vfmadd231ps_fma(auVar86,auVar81,
                                              *(undefined1 (*) [16])((long)ppp_Var43 + lVar55));
                    auVar86 = vfmadd231ps_fma(auVar86,auVar82,
                                              *(undefined1 (*) [16])((long)(ppp_Var43 + 2) + lVar55)
                                             );
                    auVar86 = vfmadd231ps_fma(auVar86,auVar83,
                                              *(undefined1 (*) [16])((long)(ppp_Var43 + 4) + lVar55)
                                             );
                    auVar86 = vfmadd231ps_fma(auVar86,auVar84,
                                              *(undefined1 (*) [16])((long)(ppp_Var43 + 6) + lVar55)
                                             );
                    auVar77 = vfmadd231ps_fma(auVar86,auVar85,
                                              *(undefined1 (*) [16])((long)(ppp_Var43 + 8) + lVar55)
                                             );
                    auVar86 = *(undefined1 (*) [16])((long)pvVar67 + lVar55 + 0x10);
                    auVar87 = *(undefined1 (*) [16])((long)pvVar67 + lVar55 + 0x20);
                    auVar88 = *(undefined1 (*) [16])((long)pvVar67 + lVar55 + 0x30);
                    auVar89 = *(undefined1 (*) [16])((long)pvVar67 + lVar55 + 0x40);
                    auVar81 = vfmadd231ps_fma(auVar76,*(undefined1 (*) [16])((long)pvVar67 + lVar55)
                                              ,auVar81);
                    auVar81 = vfmadd231ps_fma(auVar81,auVar86,auVar82);
                    auVar81 = vfmadd231ps_fma(auVar81,auVar87,auVar83);
                    auVar81 = vfmadd231ps_fma(auVar81,auVar88,auVar84);
                    auVar76 = vfmadd231ps_fma(auVar81,auVar89,auVar85);
                    auVar81 = *(undefined1 (*) [16])((long)pvVar14 + lVar71 + 0xa0);
                    auVar82 = *(undefined1 (*) [16])((long)pvVar14 + lVar71 + 0xb0);
                    auVar83 = *(undefined1 (*) [16])((long)pvVar14 + lVar71 + 0xc0);
                    auVar84 = *(undefined1 (*) [16])((long)pvVar14 + lVar71 + 0xd0);
                    auVar85 = *(undefined1 (*) [16])((long)pvVar14 + lVar71 + 0xe0);
                    auVar77 = vfmadd231ps_fma(auVar77,auVar81,
                                              *(undefined1 (*) [16])((long)pvVar67 + lVar55));
                    auVar86 = vfmadd231ps_fma(auVar77,auVar82,auVar86);
                    auVar86 = vfmadd231ps_fma(auVar86,auVar83,auVar87);
                    auVar86 = vfmadd231ps_fma(auVar86,auVar84,auVar88);
                    auVar77 = vfmadd231ps_fma(auVar86,auVar85,auVar89);
                    auVar86 = *(undefined1 (*) [16])((long)pvVar64 + lVar55 + 0x10);
                    auVar87 = *(undefined1 (*) [16])((long)pvVar64 + lVar55 + 0x20);
                    auVar88 = *(undefined1 (*) [16])((long)pvVar64 + lVar55 + 0x30);
                    auVar89 = *(undefined1 (*) [16])((long)pvVar64 + lVar55 + 0x40);
                    auVar81 = vfmadd231ps_fma(auVar76,*(undefined1 (*) [16])((long)pvVar64 + lVar55)
                                              ,auVar81);
                    auVar81 = vfmadd231ps_fma(auVar81,auVar86,auVar82);
                    auVar81 = vfmadd231ps_fma(auVar81,auVar87,auVar83);
                    auVar81 = vfmadd231ps_fma(auVar81,auVar88,auVar84);
                    auVar76 = vfmadd231ps_fma(auVar81,auVar89,auVar85);
                    auVar81 = *(undefined1 (*) [16])((long)pvVar14 + lVar71 + 0xf0);
                    auVar82 = *(undefined1 (*) [16])((long)pvVar14 + lVar71 + 0x100);
                    auVar83 = *(undefined1 (*) [16])((long)pvVar14 + lVar71 + 0x110);
                    auVar84 = *(undefined1 (*) [16])((long)pvVar14 + lVar71 + 0x120);
                    auVar85 = *(undefined1 (*) [16])((long)pvVar14 + lVar71 + 0x130);
                    auVar77 = vfmadd231ps_fma(auVar77,auVar81,
                                              *(undefined1 (*) [16])((long)pvVar64 + lVar55));
                    auVar86 = vfmadd231ps_fma(auVar77,auVar82,auVar86);
                    auVar86 = vfmadd231ps_fma(auVar86,auVar83,auVar87);
                    auVar86 = vfmadd231ps_fma(auVar86,auVar84,auVar88);
                    auVar77 = vfmadd231ps_fma(auVar86,auVar85,auVar89);
                    auVar86 = *(undefined1 (*) [16])((long)piVar46 + lVar55 + 0x10);
                    auVar87 = *(undefined1 (*) [16])((long)piVar46 + lVar55 + 0x20);
                    auVar88 = *(undefined1 (*) [16])((long)piVar46 + lVar55 + 0x30);
                    auVar89 = *(undefined1 (*) [16])((long)piVar46 + lVar55 + 0x40);
                    auVar81 = vfmadd231ps_fma(auVar76,*(undefined1 (*) [16])((long)piVar46 + lVar55)
                                              ,auVar81);
                    auVar81 = vfmadd231ps_fma(auVar81,auVar86,auVar82);
                    auVar81 = vfmadd231ps_fma(auVar81,auVar87,auVar83);
                    auVar81 = vfmadd231ps_fma(auVar81,auVar88,auVar84);
                    auVar76 = vfmadd231ps_fma(auVar81,auVar89,auVar85);
                    auVar81 = *(undefined1 (*) [16])((long)pvVar14 + lVar71 + 0x140);
                    auVar82 = *(undefined1 (*) [16])((long)pvVar14 + lVar71 + 0x150);
                    auVar83 = *(undefined1 (*) [16])((long)pvVar14 + lVar71 + 0x160);
                    auVar84 = *(undefined1 (*) [16])((long)pvVar14 + lVar71 + 0x170);
                    auVar85 = *(undefined1 (*) [16])((long)pvVar14 + lVar71 + 0x180);
                    auVar77 = vfmadd231ps_fma(auVar77,auVar81,
                                              *(undefined1 (*) [16])((long)piVar46 + lVar55));
                    auVar86 = vfmadd231ps_fma(auVar77,auVar82,auVar86);
                    auVar86 = vfmadd231ps_fma(auVar86,auVar83,auVar87);
                    auVar86 = vfmadd231ps_fma(auVar86,auVar84,auVar88);
                    auVar81 = vfmadd231ps_fma(auVar76,auVar81,
                                              *(undefined1 (*) [16])((long)pvVar38 + lVar55));
                    auVar81 = vfmadd231ps_fma(auVar81,auVar82,
                                              *(undefined1 (*) [16])((long)pvVar38 + lVar55 + 0x10))
                    ;
                    auVar81 = vfmadd231ps_fma(auVar81,auVar83,
                                              *(undefined1 (*) [16])((long)pvVar38 + lVar55 + 0x20))
                    ;
                    auVar81 = vfmadd231ps_fma(auVar81,auVar84,
                                              *(undefined1 (*) [16])((long)pvVar38 + lVar55 + 0x30))
                    ;
                    auVar81 = vfmadd231ps_fma(auVar81,auVar85,
                                              *(undefined1 (*) [16])((long)pvVar38 + lVar55 + 0x40))
                    ;
                    auVar82 = vfmadd231ps_fma(auVar86,auVar85,auVar89);
                    *(undefined1 (*) [16])((long)pvVar63 + lVar55) = auVar82;
                    *(undefined1 (*) [16])((long)pvVar69 + lVar55) = auVar81;
                    lVar55 = lVar55 + 0x10;
                  }
                  ppp_Var42 = (_func_int ***)((long)ppp_Var42 + lVar55 + lVar58);
                  ppp_Var43 = (_func_int ***)((long)ppp_Var43 + lVar55 + lVar58);
                  pvVar67 = (void *)((long)pvVar67 + lVar55 + lVar58);
                  pvVar64 = (void *)((long)pvVar64 + lVar55 + lVar58);
                  piVar46 = (pointer)((long)piVar46 + lVar55 + lVar58);
                  pvVar38 = (void *)((long)pvVar38 + lVar55 + lVar58);
                  pvVar63 = (void *)((long)pvVar63 + lVar55 + lVar51);
                  pvVar69 = (void *)((long)pvVar69 + lVar55 + lVar51);
                }
                for (; (int)uVar44 < iVar33; uVar44 = uVar44 + 1) {
                  lVar55 = 0;
                  uVar70 = uVar66;
                  while (iVar45 = (int)uVar70, uVar70 = (ulong)(iVar45 - 1), iVar45 != 0) {
                    auVar81 = vfmadd132ps_fma(*(undefined1 (*) [16])((long)pvVar14 + lVar71),auVar90
                                              ,*(undefined1 (*) [16])((long)ppp_Var42 + lVar55));
                    auVar81 = vfmadd231ps_fma(auVar81,*(undefined1 (*) [16])
                                                       ((long)pvVar14 + lVar71 + 0x10),
                                              *(undefined1 (*) [16])((long)(ppp_Var42 + 2) + lVar55)
                                             );
                    auVar81 = vfmadd231ps_fma(auVar81,*(undefined1 (*) [16])
                                                       ((long)pvVar14 + lVar71 + 0x20),
                                              *(undefined1 (*) [16])((long)(ppp_Var42 + 4) + lVar55)
                                             );
                    auVar81 = vfmadd231ps_fma(auVar81,*(undefined1 (*) [16])
                                                       ((long)pvVar14 + lVar71 + 0x30),
                                              *(undefined1 (*) [16])((long)(ppp_Var42 + 6) + lVar55)
                                             );
                    auVar81 = vfmadd231ps_fma(auVar81,*(undefined1 (*) [16])
                                                       ((long)pvVar14 + lVar71 + 0x40),
                                              *(undefined1 (*) [16])((long)(ppp_Var42 + 8) + lVar55)
                                             );
                    auVar81 = vfmadd132ps_fma(*(undefined1 (*) [16])((long)pvVar14 + lVar71 + 0x50),
                                              auVar81,*(undefined1 (*) [16])
                                                       ((long)ppp_Var43 + lVar55));
                    auVar81 = vfmadd231ps_fma(auVar81,*(undefined1 (*) [16])
                                                       ((long)pvVar14 + lVar71 + 0x60),
                                              *(undefined1 (*) [16])((long)(ppp_Var43 + 2) + lVar55)
                                             );
                    auVar81 = vfmadd231ps_fma(auVar81,*(undefined1 (*) [16])
                                                       ((long)pvVar14 + lVar71 + 0x70),
                                              *(undefined1 (*) [16])((long)(ppp_Var43 + 4) + lVar55)
                                             );
                    auVar81 = vfmadd231ps_fma(auVar81,*(undefined1 (*) [16])
                                                       ((long)pvVar14 + lVar71 + 0x80),
                                              *(undefined1 (*) [16])((long)(ppp_Var43 + 6) + lVar55)
                                             );
                    auVar81 = vfmadd231ps_fma(auVar81,*(undefined1 (*) [16])
                                                       ((long)pvVar14 + lVar71 + 0x90),
                                              *(undefined1 (*) [16])((long)(ppp_Var43 + 8) + lVar55)
                                             );
                    auVar81 = vfmadd132ps_fma(*(undefined1 (*) [16])((long)pvVar14 + lVar71 + 0xa0),
                                              auVar81,*(undefined1 (*) [16])((long)pvVar67 + lVar55)
                                             );
                    auVar81 = vfmadd231ps_fma(auVar81,*(undefined1 (*) [16])
                                                       ((long)pvVar14 + lVar71 + 0xb0),
                                              *(undefined1 (*) [16])((long)pvVar67 + lVar55 + 0x10))
                    ;
                    auVar81 = vfmadd231ps_fma(auVar81,*(undefined1 (*) [16])
                                                       ((long)pvVar14 + lVar71 + 0xc0),
                                              *(undefined1 (*) [16])((long)pvVar67 + lVar55 + 0x20))
                    ;
                    auVar81 = vfmadd231ps_fma(auVar81,*(undefined1 (*) [16])
                                                       ((long)pvVar14 + lVar71 + 0xd0),
                                              *(undefined1 (*) [16])((long)pvVar67 + lVar55 + 0x30))
                    ;
                    auVar81 = vfmadd231ps_fma(auVar81,*(undefined1 (*) [16])
                                                       ((long)pvVar14 + lVar71 + 0xe0),
                                              *(undefined1 (*) [16])((long)pvVar67 + lVar55 + 0x40))
                    ;
                    auVar81 = vfmadd132ps_fma(*(undefined1 (*) [16])((long)pvVar14 + lVar71 + 0xf0),
                                              auVar81,*(undefined1 (*) [16])((long)pvVar64 + lVar55)
                                             );
                    auVar81 = vfmadd231ps_fma(auVar81,*(undefined1 (*) [16])
                                                       ((long)pvVar14 + lVar71 + 0x100),
                                              *(undefined1 (*) [16])((long)pvVar64 + lVar55 + 0x10))
                    ;
                    auVar81 = vfmadd231ps_fma(auVar81,*(undefined1 (*) [16])
                                                       ((long)pvVar14 + lVar71 + 0x110),
                                              *(undefined1 (*) [16])((long)pvVar64 + lVar55 + 0x20))
                    ;
                    auVar81 = vfmadd231ps_fma(auVar81,*(undefined1 (*) [16])
                                                       ((long)pvVar14 + lVar71 + 0x120),
                                              *(undefined1 (*) [16])((long)pvVar64 + lVar55 + 0x30))
                    ;
                    auVar81 = vfmadd231ps_fma(auVar81,*(undefined1 (*) [16])
                                                       ((long)pvVar14 + lVar71 + 0x130),
                                              *(undefined1 (*) [16])((long)pvVar64 + lVar55 + 0x40))
                    ;
                    auVar81 = vfmadd132ps_fma(*(undefined1 (*) [16])((long)pvVar14 + lVar71 + 0x140)
                                              ,auVar81,*(undefined1 (*) [16])
                                                        ((long)piVar46 + lVar55));
                    auVar81 = vfmadd231ps_fma(auVar81,*(undefined1 (*) [16])
                                                       ((long)pvVar14 + lVar71 + 0x150),
                                              *(undefined1 (*) [16])((long)piVar46 + lVar55 + 0x10))
                    ;
                    auVar81 = vfmadd231ps_fma(auVar81,*(undefined1 (*) [16])
                                                       ((long)pvVar14 + lVar71 + 0x160),
                                              *(undefined1 (*) [16])((long)piVar46 + lVar55 + 0x20))
                    ;
                    auVar81 = vfmadd231ps_fma(auVar81,*(undefined1 (*) [16])
                                                       ((long)pvVar14 + lVar71 + 0x170),
                                              *(undefined1 (*) [16])((long)piVar46 + lVar55 + 0x30))
                    ;
                    auVar81 = vfmadd231ps_fma(auVar81,*(undefined1 (*) [16])
                                                       ((long)pvVar14 + lVar71 + 0x180),
                                              *(undefined1 (*) [16])((long)piVar46 + lVar55 + 0x40))
                    ;
                    *(undefined1 (*) [16])((long)pvVar63 + lVar55) = auVar81;
                    lVar55 = lVar55 + 0x10;
                  }
                  ppp_Var42 = (_func_int ***)((long)(ppp_Var42 + 8) + lVar55);
                  ppp_Var43 = (_func_int ***)((long)(ppp_Var43 + 8) + lVar55);
                  pvVar67 = (void *)((long)pvVar67 + lVar55 + 0x40);
                  pvVar64 = (void *)((long)pvVar64 + lVar55 + 0x40);
                  piVar46 = (pointer)((long)piVar46 + lVar55 + 0x40);
                  pvVar63 = (void *)((long)pvVar63 + lVar55);
                }
              }
            }
            else {
              iVar37 = 5;
              if ((((*(int *)(&this->field_0xdc + (long)p_Var40) != 1) ||
                   (*(int *)(&this->field_0xe0 + (long)p_Var40) != 1)) ||
                  (*(int *)(&this->field_0xe4 + (long)p_Var40) != 2)) ||
                 (*(int *)(&this->field_0xe8 + (long)p_Var40) != 2)) goto LAB_003dbef2;
              iVar33 = top_blob->w;
              iVar45 = local_218.w - iVar33;
              lVar56 = *(long *)(&this->field_0x1b0 + (long)p_Var40);
              uVar66 = 0;
              if (iVar33 < 1) {
                iVar33 = 0;
              }
              uVar72 = (ulong)(uint)top_blob->h;
              if (top_blob->h < 1) {
                uVar72 = uVar66;
              }
              uVar50 = (ulong)(uint)local_218.c;
              if (local_218.c < 1) {
                uVar50 = uVar66;
              }
              lVar51 = (long)(iVar45 * 8) * 4;
              for (; uVar66 != uVar50; uVar66 = uVar66 + 1) {
                if (lVar56 == 0) {
                  auVar90 = ZEXT816(0) << 0x40;
                }
                else {
                  auVar90 = *(undefined1 (*) [16])(lVar56 + uVar66 * 0x10);
                }
                pauVar60 = (undefined1 (*) [16])
                           (top_blob->cstep * uVar66 * top_blob->elemsize + (long)top_blob->data);
                pvVar14 = (this->weight_data_tm).data;
                lVar55 = (long)(this->weight_data_tm).w * uVar66 * (this->weight_data_tm).elemsize;
                ppp_Var42 = (_func_int ***)
                            ((long)(_func_int ***)local_218.data +
                            local_218.cstep * uVar66 * local_218.elemsize);
                lVar58 = (long)local_218.w * local_218.elemsize;
                ppp_Var43 = (_func_int ***)((long)ppp_Var42 + lVar58);
                pvVar67 = (void *)((long)ppp_Var42 + lVar58 * 2);
                pvVar38 = (void *)((long)ppp_Var42 + lVar58 * 3);
                piVar46 = (pointer)((long)ppp_Var42 + lVar58 * 4);
                for (iVar45 = 0; iVar45 != (int)uVar72; iVar45 = iVar45 + 1) {
                  lVar58 = 0;
                  iVar53 = iVar33;
                  while (bVar74 = iVar53 != 0, iVar53 = iVar53 + -1, bVar74) {
                    auVar81 = vfmadd132ps_fma(*(undefined1 (*) [16])((long)pvVar14 + lVar55),auVar90
                                              ,*(undefined1 (*) [16])((long)ppp_Var42 + lVar58));
                    auVar81 = vfmadd231ps_fma(auVar81,*(undefined1 (*) [16])
                                                       ((long)pvVar14 + lVar55 + 0x10),
                                              *(undefined1 (*) [16])((long)(ppp_Var42 + 2) + lVar58)
                                             );
                    auVar81 = vfmadd231ps_fma(auVar81,*(undefined1 (*) [16])
                                                       ((long)pvVar14 + lVar55 + 0x20),
                                              *(undefined1 (*) [16])((long)(ppp_Var42 + 4) + lVar58)
                                             );
                    auVar81 = vfmadd231ps_fma(auVar81,*(undefined1 (*) [16])
                                                       ((long)pvVar14 + lVar55 + 0x30),
                                              *(undefined1 (*) [16])((long)(ppp_Var42 + 6) + lVar58)
                                             );
                    auVar81 = vfmadd231ps_fma(auVar81,*(undefined1 (*) [16])
                                                       ((long)pvVar14 + lVar55 + 0x40),
                                              *(undefined1 (*) [16])((long)(ppp_Var42 + 8) + lVar58)
                                             );
                    auVar81 = vfmadd132ps_fma(*(undefined1 (*) [16])((long)pvVar14 + lVar55 + 0x50),
                                              auVar81,*(undefined1 (*) [16])
                                                       ((long)ppp_Var43 + lVar58));
                    auVar81 = vfmadd231ps_fma(auVar81,*(undefined1 (*) [16])
                                                       ((long)pvVar14 + lVar55 + 0x60),
                                              *(undefined1 (*) [16])((long)(ppp_Var43 + 2) + lVar58)
                                             );
                    auVar81 = vfmadd231ps_fma(auVar81,*(undefined1 (*) [16])
                                                       ((long)pvVar14 + lVar55 + 0x70),
                                              *(undefined1 (*) [16])((long)(ppp_Var43 + 4) + lVar58)
                                             );
                    auVar81 = vfmadd231ps_fma(auVar81,*(undefined1 (*) [16])
                                                       ((long)pvVar14 + lVar55 + 0x80),
                                              *(undefined1 (*) [16])((long)(ppp_Var43 + 6) + lVar58)
                                             );
                    auVar81 = vfmadd231ps_fma(auVar81,*(undefined1 (*) [16])
                                                       ((long)pvVar14 + lVar55 + 0x90),
                                              *(undefined1 (*) [16])((long)(ppp_Var43 + 8) + lVar58)
                                             );
                    auVar81 = vfmadd132ps_fma(*(undefined1 (*) [16])((long)pvVar14 + lVar55 + 0xa0),
                                              auVar81,*(undefined1 (*) [16])((long)pvVar67 + lVar58)
                                             );
                    auVar81 = vfmadd231ps_fma(auVar81,*(undefined1 (*) [16])
                                                       ((long)pvVar14 + lVar55 + 0xb0),
                                              *(undefined1 (*) [16])((long)pvVar67 + lVar58 + 0x10))
                    ;
                    auVar81 = vfmadd231ps_fma(auVar81,*(undefined1 (*) [16])
                                                       ((long)pvVar14 + lVar55 + 0xc0),
                                              *(undefined1 (*) [16])((long)pvVar67 + lVar58 + 0x20))
                    ;
                    auVar81 = vfmadd231ps_fma(auVar81,*(undefined1 (*) [16])
                                                       ((long)pvVar14 + lVar55 + 0xd0),
                                              *(undefined1 (*) [16])((long)pvVar67 + lVar58 + 0x30))
                    ;
                    auVar81 = vfmadd231ps_fma(auVar81,*(undefined1 (*) [16])
                                                       ((long)pvVar14 + lVar55 + 0xe0),
                                              *(undefined1 (*) [16])((long)pvVar67 + lVar58 + 0x40))
                    ;
                    auVar81 = vfmadd132ps_fma(*(undefined1 (*) [16])((long)pvVar14 + lVar55 + 0xf0),
                                              auVar81,*(undefined1 (*) [16])((long)pvVar38 + lVar58)
                                             );
                    auVar81 = vfmadd231ps_fma(auVar81,*(undefined1 (*) [16])
                                                       ((long)pvVar14 + lVar55 + 0x100),
                                              *(undefined1 (*) [16])((long)pvVar38 + lVar58 + 0x10))
                    ;
                    auVar81 = vfmadd231ps_fma(auVar81,*(undefined1 (*) [16])
                                                       ((long)pvVar14 + lVar55 + 0x110),
                                              *(undefined1 (*) [16])((long)pvVar38 + lVar58 + 0x20))
                    ;
                    auVar81 = vfmadd231ps_fma(auVar81,*(undefined1 (*) [16])
                                                       ((long)pvVar14 + lVar55 + 0x120),
                                              *(undefined1 (*) [16])((long)pvVar38 + lVar58 + 0x30))
                    ;
                    auVar81 = vfmadd231ps_fma(auVar81,*(undefined1 (*) [16])
                                                       ((long)pvVar14 + lVar55 + 0x130),
                                              *(undefined1 (*) [16])((long)pvVar38 + lVar58 + 0x40))
                    ;
                    auVar81 = vfmadd132ps_fma(*(undefined1 (*) [16])((long)pvVar14 + lVar55 + 0x140)
                                              ,auVar81,*(undefined1 (*) [16])
                                                        ((long)piVar46 + lVar58));
                    auVar81 = vfmadd231ps_fma(auVar81,*(undefined1 (*) [16])
                                                       ((long)pvVar14 + lVar55 + 0x150),
                                              *(undefined1 (*) [16])((long)piVar46 + lVar58 + 0x10))
                    ;
                    auVar81 = vfmadd231ps_fma(auVar81,*(undefined1 (*) [16])
                                                       ((long)pvVar14 + lVar55 + 0x160),
                                              *(undefined1 (*) [16])((long)piVar46 + lVar58 + 0x20))
                    ;
                    auVar81 = vfmadd231ps_fma(auVar81,*(undefined1 (*) [16])
                                                       ((long)pvVar14 + lVar55 + 0x170),
                                              *(undefined1 (*) [16])((long)piVar46 + lVar58 + 0x30))
                    ;
                    auVar81 = vfmadd231ps_fma(auVar81,*(undefined1 (*) [16])
                                                       ((long)pvVar14 + lVar55 + 0x180),
                                              *(undefined1 (*) [16])((long)piVar46 + lVar58 + 0x40))
                    ;
                    *pauVar60 = auVar81;
                    pauVar60 = pauVar60 + 1;
                    lVar58 = lVar58 + 0x20;
                  }
                  ppp_Var42 = (_func_int ***)((long)ppp_Var42 + lVar58 + lVar51);
                  ppp_Var43 = (_func_int ***)((long)ppp_Var43 + lVar58 + lVar51);
                  pvVar67 = (void *)((long)pvVar67 + lVar58 + lVar51);
                  pvVar38 = (void *)((long)pvVar38 + lVar58 + lVar51);
                  piVar46 = (pointer)((long)piVar46 + lVar58 + lVar51);
                }
              }
            }
            goto LAB_003dd74c;
          }
        }
        else if ((iVar33 == 3) && (iVar37 == 3)) {
          if (((*(int *)(&this->field_0xdc + (long)p_Var40) == 1) &&
              ((*(int *)(&this->field_0xe0 + (long)p_Var40) == 1 &&
               (*(int *)(&this->field_0xe4 + (long)p_Var40) == 1)))) &&
             (*(int *)(&this->field_0xe8 + (long)p_Var40) == 1)) {
            iVar33 = top_blob->w;
            lVar56 = *(long *)(&this->field_0x1b0 + (long)p_Var40);
            uVar72 = 0;
            uVar66 = (ulong)(uint)top_blob->h;
            if (top_blob->h < 1) {
              uVar66 = uVar72;
            }
            uVar50 = (ulong)(uint)local_218.c;
            if (local_218.c < 1) {
              uVar50 = uVar72;
            }
            for (; uVar72 != uVar50; uVar72 = uVar72 + 1) {
              if (lVar56 == 0) {
                auVar90 = ZEXT816(0) << 0x40;
              }
              else {
                auVar90 = *(undefined1 (*) [16])(lVar56 + uVar72 * 0x10);
              }
              pauVar59 = (undefined1 (*) [16])
                         (top_blob->cstep * uVar72 * top_blob->elemsize + (long)top_blob->data);
              pvVar67 = (this->weight_data_tm).data;
              lVar51 = (long)(this->weight_data_tm).w * uVar72 * (this->weight_data_tm).elemsize;
              ppp_Var42 = (_func_int ***)
                          ((long)(_func_int ***)local_218.data +
                          local_218.cstep * uVar72 * local_218.elemsize);
              pauVar60 = (undefined1 (*) [16])
                         ((long)ppp_Var42 + (long)local_218.w * local_218.elemsize * 2);
              auVar81 = *(undefined1 (*) [16])((long)pvVar67 + lVar51);
              auVar82 = *(undefined1 (*) [16])((long)pvVar67 + lVar51 + 0x10);
              auVar83 = *(undefined1 (*) [16])((long)pvVar67 + lVar51 + 0x20);
              auVar84 = *(undefined1 (*) [16])((long)pvVar67 + lVar51 + 0x30);
              auVar85 = *(undefined1 (*) [16])((long)pvVar67 + lVar51 + 0x40);
              auVar86 = *(undefined1 (*) [16])((long)pvVar67 + lVar51 + 0x50);
              auVar87 = *(undefined1 (*) [16])((long)pvVar67 + lVar51 + 0x60);
              auVar88 = *(undefined1 (*) [16])((long)pvVar67 + lVar51 + 0x70);
              auVar89 = *(undefined1 (*) [16])((long)pvVar67 + lVar51 + 0x80);
              ppp_Var43 = (_func_int ***)((long)ppp_Var42 + (long)local_218.w * local_218.elemsize);
              for (iVar45 = 0; iVar45 != (int)uVar66; iVar45 = iVar45 + 1) {
                pauVar73 = pauVar60 + 2;
                ppp_Var39 = ppp_Var43 + 4;
                ppp_Var65 = ppp_Var42 + 4;
                lVar51 = 0;
                for (iVar53 = 0; iVar53 + 7 < iVar33; iVar53 = iVar53 + 8) {
                  auVar91 = vfmadd213ps_fma(*(undefined1 (*) [16])((long)ppp_Var42 + lVar51),auVar81
                                            ,auVar90);
                  auVar76 = *(undefined1 (*) [16])(*(undefined1 (*) [16])(ppp_Var42 + 2) + lVar51);
                  auVar77 = *(undefined1 (*) [16])(*(undefined1 (*) [16])(ppp_Var42 + 4) + lVar51);
                  auVar78 = *(undefined1 (*) [16])(*(undefined1 (*) [16])(ppp_Var42 + 6) + lVar51);
                  auVar91 = vfmadd231ps_fma(auVar91,auVar82,auVar76);
                  auVar91 = vfmadd231ps_fma(auVar91,auVar83,auVar77);
                  auVar135 = vfmadd231ps_fma(auVar91,auVar84,
                                             *(undefined1 (*) [16])((long)ppp_Var43 + lVar51));
                  auVar91 = *(undefined1 (*) [16])(*(undefined1 (*) [16])(ppp_Var43 + 2) + lVar51);
                  auVar79 = *(undefined1 (*) [16])(*(undefined1 (*) [16])(ppp_Var43 + 4) + lVar51);
                  auVar135 = vfmadd231ps_fma(auVar135,auVar85,auVar91);
                  auVar135 = vfmadd231ps_fma(auVar135,auVar86,auVar79);
                  auVar75 = vfmadd231ps_fma(auVar135,auVar87,
                                            *(undefined1 (*) [16])(*pauVar60 + lVar51));
                  auVar135 = *(undefined1 (*) [16])(*(undefined1 (*) [16])(ppp_Var43 + 6) + lVar51);
                  auVar80 = *(undefined1 (*) [16])(pauVar60[1] + lVar51);
                  auVar138 = *(undefined1 (*) [16])(pauVar60[2] + lVar51);
                  auVar139 = *(undefined1 (*) [16])(pauVar60[3] + lVar51);
                  auVar75 = vfmadd231ps_avx512vl(auVar75,auVar88,auVar80);
                  auVar75 = vfmadd231ps_avx512vl(auVar75,auVar89,auVar138);
                  *(undefined1 (*) [16])(*pauVar59 + lVar51) = auVar75;
                  auVar76 = vfmadd213ps_fma(auVar76,auVar81,auVar90);
                  auVar76 = vfmadd231ps_fma(auVar76,auVar82,auVar77);
                  auVar76 = vfmadd231ps_fma(auVar76,auVar83,auVar78);
                  auVar76 = vfmadd231ps_fma(auVar76,auVar84,auVar91);
                  auVar76 = vfmadd231ps_fma(auVar76,auVar85,auVar79);
                  auVar76 = vfmadd231ps_avx512vl(auVar76,auVar86,auVar135);
                  auVar76 = vfmadd231ps_avx512vl(auVar76,auVar87,auVar80);
                  auVar76 = vfmadd231ps_avx512vl(auVar76,auVar88,auVar138);
                  auVar75 = vfmadd231ps_avx512vl(auVar76,auVar89,auVar139);
                  auVar76 = *(undefined1 (*) [16])(*(undefined1 (*) [16])(ppp_Var42 + 8) + lVar51);
                  auVar91 = *(undefined1 (*) [16])(*(undefined1 (*) [16])(ppp_Var43 + 8) + lVar51);
                  auVar80 = *(undefined1 (*) [16])(pauVar60[4] + lVar51);
                  *(undefined1 (*) [16])(pauVar59[1] + lVar51) = auVar75;
                  auVar77 = vfmadd213ps_fma(auVar77,auVar81,auVar90);
                  auVar77 = vfmadd231ps_fma(auVar77,auVar82,auVar78);
                  auVar77 = vfmadd231ps_fma(auVar77,auVar83,auVar76);
                  auVar77 = vfmadd231ps_fma(auVar77,auVar84,auVar79);
                  auVar77 = vfmadd231ps_avx512vl(auVar77,auVar85,auVar135);
                  auVar77 = vfmadd231ps_fma(auVar77,auVar86,auVar91);
                  auVar77 = vfmadd231ps_avx512vl(auVar77,auVar87,auVar138);
                  auVar77 = vfmadd231ps_avx512vl(auVar77,auVar88,auVar139);
                  auVar75 = vfmadd231ps_avx512vl(auVar77,auVar89,auVar80);
                  auVar77 = *(undefined1 (*) [16])(*(undefined1 (*) [16])(ppp_Var42 + 10) + lVar51);
                  auVar79 = *(undefined1 (*) [16])(*(undefined1 (*) [16])(ppp_Var43 + 10) + lVar51);
                  auVar138 = *(undefined1 (*) [16])(pauVar60[5] + lVar51);
                  *(undefined1 (*) [16])(pauVar59[2] + lVar51) = auVar75;
                  auVar78 = vfmadd213ps_fma(auVar78,auVar81,auVar90);
                  auVar78 = vfmadd231ps_fma(auVar78,auVar82,auVar76);
                  auVar78 = vfmadd231ps_fma(auVar78,auVar83,auVar77);
                  auVar78 = vfmadd231ps_avx512vl(auVar78,auVar84,auVar135);
                  auVar78 = vfmadd231ps_fma(auVar78,auVar85,auVar91);
                  auVar78 = vfmadd231ps_fma(auVar78,auVar86,auVar79);
                  auVar78 = vfmadd231ps_avx512vl(auVar78,auVar87,auVar139);
                  auVar78 = vfmadd231ps_avx512vl(auVar78,auVar88,auVar80);
                  auVar75 = vfmadd231ps_avx512vl(auVar78,auVar89,auVar138);
                  auVar78 = *(undefined1 (*) [16])(*(undefined1 (*) [16])(ppp_Var42 + 0xc) + lVar51)
                  ;
                  auVar135 = *(undefined1 (*) [16])
                              (*(undefined1 (*) [16])(ppp_Var43 + 0xc) + lVar51);
                  auVar139 = *(undefined1 (*) [16])(pauVar60[6] + lVar51);
                  *(undefined1 (*) [16])(pauVar59[3] + lVar51) = auVar75;
                  auVar76 = vfmadd213ps_fma(auVar76,auVar81,auVar90);
                  auVar76 = vfmadd231ps_fma(auVar76,auVar82,auVar77);
                  auVar76 = vfmadd231ps_fma(auVar76,auVar83,auVar78);
                  auVar76 = vfmadd231ps_fma(auVar76,auVar84,auVar91);
                  auVar76 = vfmadd231ps_fma(auVar76,auVar85,auVar79);
                  auVar76 = vfmadd231ps_avx512vl(auVar76,auVar86,auVar135);
                  auVar76 = vfmadd231ps_avx512vl(auVar76,auVar87,auVar80);
                  auVar76 = vfmadd231ps_avx512vl(auVar76,auVar88,auVar138);
                  auVar75 = vfmadd231ps_avx512vl(auVar76,auVar89,auVar139);
                  auVar76 = *(undefined1 (*) [16])(*(undefined1 (*) [16])(ppp_Var42 + 0xe) + lVar51)
                  ;
                  auVar91 = *(undefined1 (*) [16])(*(undefined1 (*) [16])(ppp_Var43 + 0xe) + lVar51)
                  ;
                  auVar80 = *(undefined1 (*) [16])(pauVar60[7] + lVar51);
                  *(undefined1 (*) [16])(pauVar59[4] + lVar51) = auVar75;
                  auVar77 = vfmadd213ps_fma(auVar77,auVar81,auVar90);
                  auVar77 = vfmadd231ps_fma(auVar77,auVar82,auVar78);
                  auVar77 = vfmadd231ps_fma(auVar77,auVar83,auVar76);
                  auVar77 = vfmadd231ps_fma(auVar77,auVar84,auVar79);
                  auVar77 = vfmadd231ps_avx512vl(auVar77,auVar85,auVar135);
                  auVar77 = vfmadd231ps_fma(auVar77,auVar86,auVar91);
                  auVar77 = vfmadd231ps_avx512vl(auVar77,auVar87,auVar138);
                  auVar77 = vfmadd231ps_avx512vl(auVar77,auVar88,auVar139);
                  auVar75 = vfmadd231ps_avx512vl(auVar77,auVar89,auVar80);
                  auVar77 = *(undefined1 (*) [16])
                             (*(undefined1 (*) [16])(ppp_Var42 + 0x10) + lVar51);
                  auVar79 = *(undefined1 (*) [16])
                             (*(undefined1 (*) [16])(ppp_Var43 + 0x10) + lVar51);
                  auVar138 = *(undefined1 (*) [16])(pauVar60[8] + lVar51);
                  *(undefined1 (*) [16])(pauVar59[5] + lVar51) = auVar75;
                  auVar78 = vfmadd213ps_fma(auVar78,auVar81,auVar90);
                  auVar78 = vfmadd231ps_fma(auVar78,auVar82,auVar76);
                  auVar78 = vfmadd231ps_fma(auVar78,auVar83,auVar77);
                  auVar78 = vfmadd231ps_avx512vl(auVar78,auVar84,auVar135);
                  auVar78 = vfmadd231ps_fma(auVar78,auVar85,auVar91);
                  auVar78 = vfmadd231ps_fma(auVar78,auVar86,auVar79);
                  auVar78 = vfmadd231ps_avx512vl(auVar78,auVar87,auVar139);
                  auVar78 = vfmadd231ps_avx512vl(auVar78,auVar88,auVar80);
                  auVar76 = vfmadd213ps_fma(auVar76,auVar81,auVar90);
                  auVar76 = vfmadd231ps_fma(auVar76,auVar82,auVar77);
                  auVar76 = vfmadd231ps_fma(auVar76,auVar83,
                                            *(undefined1 (*) [16])
                                             (*(undefined1 (*) [16])(ppp_Var42 + 0x12) + lVar51));
                  auVar76 = vfmadd231ps_fma(auVar76,auVar84,auVar91);
                  auVar76 = vfmadd231ps_fma(auVar76,auVar85,auVar79);
                  auVar76 = vfmadd231ps_fma(auVar76,auVar86,
                                            *(undefined1 (*) [16])
                                             (*(undefined1 (*) [16])(ppp_Var43 + 0x12) + lVar51));
                  auVar76 = vfmadd231ps_avx512vl(auVar76,auVar87,auVar80);
                  auVar76 = vfmadd231ps_avx512vl(auVar76,auVar88,auVar138);
                  auVar76 = vfmadd231ps_fma(auVar76,auVar89,
                                            *(undefined1 (*) [16])(pauVar60[9] + lVar51));
                  auVar77 = vfmadd231ps_avx512vl(auVar78,auVar89,auVar138);
                  *(undefined1 (*) [16])(pauVar59[6] + lVar51) = auVar77;
                  *(undefined1 (*) [16])(pauVar59[7] + lVar51) = auVar76;
                  lVar51 = lVar51 + 0x80;
                  pauVar73 = pauVar73 + 8;
                  ppp_Var39 = ppp_Var39 + 0x10;
                  ppp_Var65 = ppp_Var65 + 0x10;
                }
                for (; iVar53 + 3 < iVar33; iVar53 = iVar53 + 4) {
                  auVar91 = vfmadd213ps_fma(*(undefined1 (*) [16])((long)ppp_Var42 + lVar51),auVar81
                                            ,auVar90);
                  auVar76 = *(undefined1 (*) [16])(*(undefined1 (*) [16])(ppp_Var42 + 2) + lVar51);
                  auVar77 = *(undefined1 (*) [16])(*(undefined1 (*) [16])(ppp_Var42 + 4) + lVar51);
                  auVar78 = *(undefined1 (*) [16])(*(undefined1 (*) [16])(ppp_Var42 + 6) + lVar51);
                  auVar91 = vfmadd231ps_fma(auVar91,auVar82,auVar76);
                  auVar91 = vfmadd231ps_fma(auVar91,auVar83,auVar77);
                  auVar135 = vfmadd231ps_fma(auVar91,auVar84,
                                             *(undefined1 (*) [16])((long)ppp_Var43 + lVar51));
                  auVar91 = *(undefined1 (*) [16])(*(undefined1 (*) [16])(ppp_Var43 + 2) + lVar51);
                  auVar79 = *(undefined1 (*) [16])(*(undefined1 (*) [16])(ppp_Var43 + 4) + lVar51);
                  auVar135 = vfmadd231ps_fma(auVar135,auVar85,auVar91);
                  auVar135 = vfmadd231ps_fma(auVar135,auVar86,auVar79);
                  auVar75 = vfmadd231ps_fma(auVar135,auVar87,
                                            *(undefined1 (*) [16])(*pauVar60 + lVar51));
                  auVar135 = *(undefined1 (*) [16])(*(undefined1 (*) [16])(ppp_Var43 + 6) + lVar51);
                  auVar80 = *(undefined1 (*) [16])(pauVar60[1] + lVar51);
                  auVar138 = *(undefined1 (*) [16])(pauVar60[2] + lVar51);
                  auVar139 = *(undefined1 (*) [16])(pauVar60[3] + lVar51);
                  auVar75 = vfmadd231ps_avx512vl(auVar75,auVar88,auVar80);
                  auVar75 = vfmadd231ps_avx512vl(auVar75,auVar89,auVar138);
                  *(undefined1 (*) [16])(*pauVar59 + lVar51) = auVar75;
                  auVar76 = vfmadd213ps_fma(auVar76,auVar81,auVar90);
                  auVar76 = vfmadd231ps_fma(auVar76,auVar82,auVar77);
                  auVar76 = vfmadd231ps_fma(auVar76,auVar83,auVar78);
                  auVar76 = vfmadd231ps_fma(auVar76,auVar84,auVar91);
                  auVar76 = vfmadd231ps_fma(auVar76,auVar85,auVar79);
                  auVar76 = vfmadd231ps_avx512vl(auVar76,auVar86,auVar135);
                  auVar76 = vfmadd231ps_avx512vl(auVar76,auVar87,auVar80);
                  auVar76 = vfmadd231ps_avx512vl(auVar76,auVar88,auVar138);
                  auVar75 = vfmadd231ps_avx512vl(auVar76,auVar89,auVar139);
                  auVar76 = *(undefined1 (*) [16])(*(undefined1 (*) [16])(ppp_Var42 + 8) + lVar51);
                  auVar91 = *(undefined1 (*) [16])(*(undefined1 (*) [16])(ppp_Var43 + 8) + lVar51);
                  auVar80 = *(undefined1 (*) [16])(pauVar60[4] + lVar51);
                  *(undefined1 (*) [16])(pauVar59[1] + lVar51) = auVar75;
                  auVar77 = vfmadd213ps_fma(auVar77,auVar81,auVar90);
                  auVar77 = vfmadd231ps_fma(auVar77,auVar82,auVar78);
                  auVar77 = vfmadd231ps_fma(auVar77,auVar83,auVar76);
                  auVar77 = vfmadd231ps_fma(auVar77,auVar84,auVar79);
                  auVar77 = vfmadd231ps_avx512vl(auVar77,auVar85,auVar135);
                  auVar77 = vfmadd231ps_fma(auVar77,auVar86,auVar91);
                  auVar77 = vfmadd231ps_avx512vl(auVar77,auVar87,auVar138);
                  auVar79 = vfmadd231ps_avx512vl(auVar77,auVar88,auVar139);
                  auVar77 = vfmadd213ps_fma(auVar78,auVar81,auVar90);
                  auVar76 = vfmadd231ps_fma(auVar77,auVar82,auVar76);
                  auVar76 = vfmadd231ps_fma(auVar76,auVar83,
                                            *(undefined1 (*) [16])
                                             (*(undefined1 (*) [16])(ppp_Var42 + 10) + lVar51));
                  auVar76 = vfmadd231ps_avx512vl(auVar76,auVar84,auVar135);
                  auVar76 = vfmadd231ps_fma(auVar76,auVar85,auVar91);
                  auVar76 = vfmadd231ps_fma(auVar76,auVar86,
                                            *(undefined1 (*) [16])
                                             (*(undefined1 (*) [16])(ppp_Var43 + 10) + lVar51));
                  auVar76 = vfmadd231ps_avx512vl(auVar76,auVar87,auVar139);
                  auVar76 = vfmadd231ps_avx512vl(auVar76,auVar88,auVar80);
                  auVar76 = vfmadd231ps_fma(auVar76,auVar89,
                                            *(undefined1 (*) [16])(pauVar60[5] + lVar51));
                  auVar77 = vfmadd231ps_avx512vl(auVar79,auVar89,auVar80);
                  *(undefined1 (*) [16])(pauVar59[2] + lVar51) = auVar77;
                  *(undefined1 (*) [16])(pauVar59[3] + lVar51) = auVar76;
                  lVar51 = lVar51 + 0x40;
                  pauVar73 = pauVar73 + 4;
                  ppp_Var39 = ppp_Var39 + 8;
                  ppp_Var65 = ppp_Var65 + 8;
                }
                for (; iVar53 + 1 < iVar33; iVar53 = iVar53 + 2) {
                  auVar76 = vfmadd213ps_avx512vl
                                      (*(undefined1 (*) [16])((long)ppp_Var42 + lVar51),auVar81,
                                       auVar90);
                  auVar76 = vfmadd231ps_avx512vl
                                      (auVar76,auVar82,
                                       *(undefined1 (*) [16])
                                        (*(undefined1 (*) [16])(ppp_Var42 + 2) + lVar51));
                  auVar76 = vfmadd231ps_avx512vl
                                      (auVar76,auVar83,
                                       *(undefined1 (*) [16])
                                        (*(undefined1 (*) [16])(ppp_Var42 + 4) + lVar51));
                  auVar76 = vfmadd231ps_avx512vl
                                      (auVar76,auVar84,
                                       *(undefined1 (*) [16])((long)ppp_Var43 + lVar51));
                  auVar76 = vfmadd231ps_avx512vl
                                      (auVar76,auVar85,
                                       *(undefined1 (*) [16])
                                        (*(undefined1 (*) [16])(ppp_Var43 + 2) + lVar51));
                  auVar76 = vfmadd231ps_avx512vl
                                      (auVar76,auVar86,
                                       *(undefined1 (*) [16])
                                        (*(undefined1 (*) [16])(ppp_Var43 + 4) + lVar51));
                  auVar76 = vfmadd231ps_avx512vl
                                      (auVar76,auVar87,*(undefined1 (*) [16])(*pauVar60 + lVar51));
                  auVar77 = vfmadd231ps_avx512vl
                                      (auVar76,auVar88,*(undefined1 (*) [16])(pauVar60[1] + lVar51))
                  ;
                  auVar76 = vfmadd213ps_fma(*(undefined1 (*) [16])
                                             (*(undefined1 (*) [16])(ppp_Var42 + 2) + lVar51),
                                            auVar81,auVar90);
                  auVar76 = vfmadd231ps_fma(auVar76,auVar82,
                                            *(undefined1 (*) [16])
                                             (*(undefined1 (*) [16])(ppp_Var42 + 4) + lVar51));
                  auVar76 = vfmadd231ps_fma(auVar76,auVar83,
                                            *(undefined1 (*) [16])
                                             (*(undefined1 (*) [16])(ppp_Var42 + 6) + lVar51));
                  auVar76 = vfmadd231ps_fma(auVar76,auVar84,
                                            *(undefined1 (*) [16])
                                             (*(undefined1 (*) [16])(ppp_Var43 + 2) + lVar51));
                  auVar76 = vfmadd231ps_fma(auVar76,auVar85,
                                            *(undefined1 (*) [16])
                                             (*(undefined1 (*) [16])(ppp_Var43 + 4) + lVar51));
                  auVar76 = vfmadd231ps_fma(auVar76,auVar86,
                                            *(undefined1 (*) [16])
                                             (*(undefined1 (*) [16])(ppp_Var43 + 6) + lVar51));
                  auVar76 = vfmadd231ps_fma(auVar76,auVar87,
                                            *(undefined1 (*) [16])(pauVar60[1] + lVar51));
                  auVar76 = vfmadd231ps_fma(auVar76,auVar88,
                                            *(undefined1 (*) [16])(pauVar60[2] + lVar51));
                  auVar76 = vfmadd231ps_fma(auVar76,auVar89,
                                            *(undefined1 (*) [16])(pauVar60[3] + lVar51));
                  auVar77 = vfmadd231ps_avx512vl
                                      (auVar77,auVar89,*(undefined1 (*) [16])(pauVar60[2] + lVar51))
                  ;
                  *(undefined1 (*) [16])(*pauVar59 + lVar51) = auVar77;
                  *(undefined1 (*) [16])(pauVar59[1] + lVar51) = auVar76;
                  lVar51 = lVar51 + 0x20;
                  pauVar73 = pauVar73 + 2;
                  ppp_Var39 = ppp_Var39 + 4;
                  ppp_Var65 = ppp_Var65 + 4;
                }
                pauVar59 = (undefined1 (*) [16])(*pauVar59 + lVar51);
                pauVar60 = pauVar73;
                for (; iVar53 < iVar33; iVar53 = iVar53 + 1) {
                  auVar76 = vfmadd213ps_fma(*(undefined1 (*) [16])(ppp_Var65 + -4),auVar81,auVar90);
                  auVar76 = vfmadd231ps_fma(auVar76,auVar82,*(undefined1 (*) [16])(ppp_Var65 + -2));
                  auVar76 = vfmadd231ps_fma(auVar76,auVar83,*(undefined1 (*) [16])ppp_Var65);
                  auVar76 = vfmadd231ps_fma(auVar76,auVar84,*(undefined1 (*) [16])(ppp_Var39 + -4));
                  auVar76 = vfmadd231ps_fma(auVar76,auVar85,*(undefined1 (*) [16])(ppp_Var39 + -2));
                  auVar76 = vfmadd231ps_fma(auVar76,auVar86,*(undefined1 (*) [16])ppp_Var39);
                  auVar76 = vfmadd231ps_fma(auVar76,auVar87,pauVar60[-2]);
                  auVar76 = vfmadd231ps_fma(auVar76,auVar88,pauVar60[-1]);
                  auVar76 = vfmadd231ps_fma(auVar76,auVar89,*pauVar60);
                  *pauVar59 = auVar76;
                  pauVar59 = pauVar59 + 1;
                  pauVar60 = pauVar60 + 1;
                  ppp_Var39 = ppp_Var39 + 2;
                  ppp_Var65 = ppp_Var65 + 2;
                }
                ppp_Var43 = ppp_Var39;
                ppp_Var42 = ppp_Var65;
              }
            }
          }
          else {
            iVar37 = 3;
            if ((((*(int *)(&this->field_0xdc + (long)p_Var40) != 1) ||
                 (*(int *)(&this->field_0xe0 + (long)p_Var40) != 1)) ||
                (*(int *)(&this->field_0xe4 + (long)p_Var40) != 2)) ||
               (*(int *)(&this->field_0xe8 + (long)p_Var40) != 2)) goto LAB_003dbef2;
            iVar33 = top_blob->w;
            lVar56 = *(long *)(&this->field_0x1b0 + (long)p_Var40);
            uVar72 = 0;
            uVar66 = (ulong)(uint)top_blob->h;
            if (top_blob->h < 1) {
              uVar66 = uVar72;
            }
            uVar44 = local_218.c;
            if (local_218.c < 1) {
              uVar44 = 0;
            }
            lVar51 = (long)((local_218.w - iVar33) * 8) * 4;
            for (; uVar72 != uVar44; uVar72 = uVar72 + 1) {
              if (lVar56 == 0) {
                auVar90 = ZEXT816(0) << 0x40;
              }
              else {
                auVar90 = *(undefined1 (*) [16])(lVar56 + uVar72 * 0x10);
              }
              pauVar60 = (undefined1 (*) [16])
                         (top_blob->cstep * uVar72 * top_blob->elemsize + (long)top_blob->data);
              pvVar14 = (this->weight_data_tm).data;
              lVar58 = (long)(this->weight_data_tm).w * uVar72 * (this->weight_data_tm).elemsize;
              ppp_Var42 = (_func_int ***)
                          ((long)(_func_int ***)local_218.data +
                          local_218.cstep * uVar72 * local_218.elemsize);
              ppp_Var43 = (_func_int ***)((long)ppp_Var42 + (long)local_218.w * local_218.elemsize);
              pvVar67 = (void *)((long)ppp_Var42 + (long)local_218.w * local_218.elemsize * 2);
              auVar81 = *(undefined1 (*) [16])((long)pvVar14 + lVar58);
              auVar82 = *(undefined1 (*) [16])((long)pvVar14 + lVar58 + 0x10);
              auVar83 = *(undefined1 (*) [16])((long)pvVar14 + lVar58 + 0x20);
              auVar84 = *(undefined1 (*) [16])((long)pvVar14 + lVar58 + 0x30);
              auVar85 = *(undefined1 (*) [16])((long)pvVar14 + lVar58 + 0x40);
              auVar86 = *(undefined1 (*) [16])((long)pvVar14 + lVar58 + 0x50);
              auVar87 = *(undefined1 (*) [16])((long)pvVar14 + lVar58 + 0x60);
              auVar88 = *(undefined1 (*) [16])((long)pvVar14 + lVar58 + 0x70);
              auVar89 = *(undefined1 (*) [16])((long)pvVar14 + lVar58 + 0x80);
              for (iVar45 = 0; iVar45 != (int)uVar66; iVar45 = iVar45 + 1) {
                lVar58 = 0;
                for (iVar53 = 0; iVar53 + 3 < iVar33; iVar53 = iVar53 + 4) {
                  auVar76 = vfmadd213ps_fma(*(undefined1 (*) [16])((long)ppp_Var42 + lVar58),auVar81
                                            ,auVar90);
                  auVar76 = vfmadd231ps_fma(auVar76,auVar82,
                                            *(undefined1 (*) [16])((long)(ppp_Var42 + 2) + lVar58));
                  auVar76 = vfmadd231ps_fma(auVar76,auVar83,
                                            *(undefined1 (*) [16])((long)(ppp_Var42 + 4) + lVar58));
                  auVar77 = vfmadd231ps_fma(auVar76,auVar84,
                                            *(undefined1 (*) [16])((long)ppp_Var43 + lVar58));
                  auVar76 = *(undefined1 (*) [16])((long)(ppp_Var42 + 8) + lVar58);
                  auVar78 = vfmadd231ps_fma(auVar77,auVar85,
                                            *(undefined1 (*) [16])((long)(ppp_Var43 + 2) + lVar58));
                  auVar77 = *(undefined1 (*) [16])((long)(ppp_Var43 + 8) + lVar58);
                  auVar78 = vfmadd231ps_fma(auVar78,auVar86,
                                            *(undefined1 (*) [16])((long)(ppp_Var43 + 4) + lVar58));
                  auVar78 = vfmadd231ps_fma(auVar78,auVar87,
                                            *(undefined1 (*) [16])((long)pvVar67 + lVar58));
                  auVar79 = vfmadd231ps_fma(auVar78,auVar88,
                                            *(undefined1 (*) [16])((long)pvVar67 + lVar58 + 0x10));
                  auVar78 = *(undefined1 (*) [16])((long)pvVar67 + lVar58 + 0x20);
                  auVar91 = *(undefined1 (*) [16])((long)pvVar67 + lVar58 + 0x40);
                  auVar135 = vfmadd231ps_fma(auVar79,auVar89,auVar78);
                  auVar79 = vfmadd213ps_fma(*(undefined1 (*) [16])((long)(ppp_Var42 + 4) + lVar58),
                                            auVar81,auVar90);
                  auVar79 = vfmadd231ps_fma(auVar79,auVar82,
                                            *(undefined1 (*) [16])((long)(ppp_Var42 + 6) + lVar58));
                  auVar79 = vfmadd231ps_fma(auVar79,auVar83,auVar76);
                  auVar79 = vfmadd231ps_fma(auVar79,auVar84,
                                            *(undefined1 (*) [16])((long)(ppp_Var43 + 4) + lVar58));
                  auVar79 = vfmadd231ps_fma(auVar79,auVar85,
                                            *(undefined1 (*) [16])((long)(ppp_Var43 + 6) + lVar58));
                  auVar79 = vfmadd231ps_fma(auVar79,auVar86,auVar77);
                  auVar78 = vfmadd231ps_fma(auVar79,auVar87,auVar78);
                  auVar78 = vfmadd231ps_fma(auVar78,auVar88,
                                            *(undefined1 (*) [16])((long)pvVar67 + lVar58 + 0x30));
                  *pauVar60 = auVar135;
                  auVar80 = vfmadd231ps_avx512vl(auVar78,auVar89,auVar91);
                  auVar78 = *(undefined1 (*) [16])((long)(ppp_Var42 + 0xc) + lVar58);
                  auVar79 = *(undefined1 (*) [16])((long)(ppp_Var43 + 0xc) + lVar58);
                  auVar135 = *(undefined1 (*) [16])((long)pvVar67 + lVar58 + 0x60);
                  auVar76 = vfmadd213ps_fma(auVar76,auVar81,auVar90);
                  auVar76 = vfmadd231ps_fma(auVar76,auVar82,
                                            *(undefined1 (*) [16])((long)(ppp_Var42 + 10) + lVar58))
                  ;
                  auVar76 = vfmadd231ps_fma(auVar76,auVar83,auVar78);
                  auVar76 = vfmadd231ps_fma(auVar76,auVar84,auVar77);
                  auVar76 = vfmadd231ps_fma(auVar76,auVar85,
                                            *(undefined1 (*) [16])((long)(ppp_Var43 + 10) + lVar58))
                  ;
                  auVar76 = vfmadd231ps_fma(auVar76,auVar86,auVar79);
                  auVar76 = vfmadd231ps_avx512vl(auVar76,auVar87,auVar91);
                  auVar77 = vfmadd231ps_fma(auVar76,auVar88,
                                            *(undefined1 (*) [16])((long)pvVar67 + lVar58 + 0x50));
                  pauVar60[1] = auVar80;
                  auVar76 = vfmadd213ps_fma(auVar78,auVar81,auVar90);
                  auVar76 = vfmadd231ps_fma(auVar76,auVar82,
                                            *(undefined1 (*) [16])((long)(ppp_Var42 + 0xe) + lVar58)
                                           );
                  auVar76 = vfmadd231ps_fma(auVar76,auVar83,
                                            *(undefined1 (*) [16])
                                             ((long)(ppp_Var42 + 0x10) + lVar58));
                  auVar76 = vfmadd231ps_fma(auVar76,auVar84,auVar79);
                  auVar76 = vfmadd231ps_fma(auVar76,auVar85,
                                            *(undefined1 (*) [16])((long)(ppp_Var43 + 0xe) + lVar58)
                                           );
                  auVar76 = vfmadd231ps_fma(auVar76,auVar86,
                                            *(undefined1 (*) [16])
                                             ((long)(ppp_Var43 + 0x10) + lVar58));
                  auVar76 = vfmadd231ps_fma(auVar76,auVar87,auVar135);
                  auVar76 = vfmadd231ps_fma(auVar76,auVar88,
                                            *(undefined1 (*) [16])((long)pvVar67 + lVar58 + 0x70));
                  auVar77 = vfmadd231ps_fma(auVar77,auVar89,auVar135);
                  auVar76 = vfmadd231ps_fma(auVar76,auVar89,
                                            *(undefined1 (*) [16])((long)pvVar67 + lVar58 + 0x80));
                  pauVar60[2] = auVar77;
                  pauVar60[3] = auVar76;
                  pauVar60 = pauVar60 + 4;
                  lVar58 = lVar58 + 0x80;
                }
                for (; iVar53 + 1 < iVar33; iVar53 = iVar53 + 2) {
                  auVar76 = vfmadd213ps_fma(*(undefined1 (*) [16])((long)ppp_Var42 + lVar58),auVar81
                                            ,auVar90);
                  auVar76 = vfmadd231ps_fma(auVar76,auVar82,
                                            *(undefined1 (*) [16])((long)(ppp_Var42 + 2) + lVar58));
                  auVar76 = vfmadd231ps_fma(auVar76,auVar83,
                                            *(undefined1 (*) [16])((long)(ppp_Var42 + 4) + lVar58));
                  auVar76 = vfmadd231ps_fma(auVar76,auVar84,
                                            *(undefined1 (*) [16])((long)ppp_Var43 + lVar58));
                  auVar76 = vfmadd231ps_fma(auVar76,auVar85,
                                            *(undefined1 (*) [16])((long)(ppp_Var43 + 2) + lVar58));
                  auVar76 = vfmadd231ps_fma(auVar76,auVar86,
                                            *(undefined1 (*) [16])((long)(ppp_Var43 + 4) + lVar58));
                  auVar76 = vfmadd231ps_fma(auVar76,auVar87,
                                            *(undefined1 (*) [16])((long)pvVar67 + lVar58));
                  auVar77 = vfmadd231ps_fma(auVar76,auVar88,
                                            *(undefined1 (*) [16])((long)pvVar67 + lVar58 + 0x10));
                  auVar76 = vfmadd213ps_fma(*(undefined1 (*) [16])((long)(ppp_Var42 + 4) + lVar58),
                                            auVar81,auVar90);
                  auVar76 = vfmadd231ps_fma(auVar76,auVar82,
                                            *(undefined1 (*) [16])((long)(ppp_Var42 + 6) + lVar58));
                  auVar76 = vfmadd231ps_fma(auVar76,auVar83,
                                            *(undefined1 (*) [16])((long)(ppp_Var42 + 8) + lVar58));
                  auVar76 = vfmadd231ps_fma(auVar76,auVar84,
                                            *(undefined1 (*) [16])((long)(ppp_Var43 + 4) + lVar58));
                  auVar76 = vfmadd231ps_fma(auVar76,auVar85,
                                            *(undefined1 (*) [16])((long)(ppp_Var43 + 6) + lVar58));
                  auVar78 = vfmadd231ps_fma(auVar76,auVar86,
                                            *(undefined1 (*) [16])((long)(ppp_Var43 + 8) + lVar58));
                  auVar76 = *(undefined1 (*) [16])((long)pvVar67 + lVar58 + 0x20);
                  auVar78 = vfmadd231ps_fma(auVar78,auVar87,auVar76);
                  auVar78 = vfmadd231ps_fma(auVar78,auVar88,
                                            *(undefined1 (*) [16])((long)pvVar67 + lVar58 + 0x30));
                  auVar76 = vfmadd231ps_fma(auVar77,auVar89,auVar76);
                  auVar77 = vfmadd231ps_fma(auVar78,auVar89,
                                            *(undefined1 (*) [16])((long)pvVar67 + lVar58 + 0x40));
                  *pauVar60 = auVar76;
                  pauVar60[1] = auVar77;
                  pauVar60 = pauVar60 + 2;
                  lVar58 = lVar58 + 0x40;
                }
                for (; iVar53 < iVar33; iVar53 = iVar53 + 1) {
                  auVar76 = vfmadd213ps_fma(*(undefined1 (*) [16])((long)ppp_Var42 + lVar58),auVar81
                                            ,auVar90);
                  auVar76 = vfmadd231ps_fma(auVar76,auVar82,
                                            *(undefined1 (*) [16])((long)(ppp_Var42 + 2) + lVar58));
                  auVar76 = vfmadd231ps_fma(auVar76,auVar83,
                                            *(undefined1 (*) [16])((long)(ppp_Var42 + 4) + lVar58));
                  auVar76 = vfmadd231ps_fma(auVar76,auVar84,
                                            *(undefined1 (*) [16])((long)ppp_Var43 + lVar58));
                  auVar76 = vfmadd231ps_fma(auVar76,auVar85,
                                            *(undefined1 (*) [16])((long)(ppp_Var43 + 2) + lVar58));
                  auVar76 = vfmadd231ps_fma(auVar76,auVar86,
                                            *(undefined1 (*) [16])((long)(ppp_Var43 + 4) + lVar58));
                  auVar76 = vfmadd231ps_fma(auVar76,auVar87,
                                            *(undefined1 (*) [16])((long)pvVar67 + lVar58));
                  auVar76 = vfmadd231ps_fma(auVar76,auVar88,
                                            *(undefined1 (*) [16])((long)pvVar67 + lVar58 + 0x10));
                  auVar76 = vfmadd231ps_fma(auVar76,auVar89,
                                            *(undefined1 (*) [16])((long)pvVar67 + lVar58 + 0x20));
                  *pauVar60 = auVar76;
                  pauVar60 = pauVar60 + 1;
                  lVar58 = lVar58 + 0x20;
                }
                ppp_Var42 = (_func_int ***)((long)ppp_Var42 + lVar58 + lVar51);
                ppp_Var43 = (_func_int ***)((long)ppp_Var43 + lVar58 + lVar51);
                pvVar67 = (void *)((long)pvVar67 + lVar58 + lVar51);
              }
            }
          }
          goto LAB_003dd74c;
        }
LAB_003dbef2:
        uVar41 = iVar37 * iVar33;
        std::vector<int,_std::allocator<int>_>::vector
                  (&_space_ofs,(long)(int)uVar41,(allocator_type *)&opt_p);
        pp_Var17 = this->_vptr_ConvolutionDepthWise_x86_avx512;
        p_Var40 = pp_Var17[-3];
        iVar33 = *(int *)(&this->field_0xe0 + (long)p_Var40);
        iVar37 = *(int *)(&this->field_0xdc + (long)p_Var40);
        iVar11 = *(int *)(&this->field_0xd4 + (long)p_Var40);
        lVar56 = 0;
        iVar49 = 0;
        for (iVar54 = 0; iVar54 < *(int *)(&this->field_0xd8 + (long)p_Var40); iVar54 = iVar54 + 1)
        {
          for (lVar51 = 0; (int)lVar51 < *(int *)(&this->field_0xd4 + (long)p_Var40);
              lVar51 = lVar51 + 1) {
            _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
            ._M_start[(int)lVar56 + lVar51] = iVar49;
            p_Var40 = pp_Var17[-3];
            iVar49 = iVar49 + *(int *)(&this->field_0xdc + (long)p_Var40);
          }
          iVar49 = iVar49 + (iVar31 * iVar33 - iVar37 * iVar11);
          lVar56 = (int)lVar56 + lVar51;
        }
        local_1d0 = CONCAT44(local_1d0._4_4_,uVar41 * 4);
        uVar50 = 0;
        uVar66 = (ulong)uVar41;
        if ((int)uVar41 < 1) {
          uVar66 = uVar50;
        }
        if ((int)uVar44 < 1) {
          uVar72 = uVar50;
        }
        auVar79._8_4_ = 0x42b0c0a5;
        auVar79._0_8_ = 0x42b0c0a542b0c0a5;
        auVar79._12_4_ = 0x42b0c0a5;
        auVar135._8_4_ = 0xc2b0c0a5;
        auVar135._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar135._12_4_ = 0xc2b0c0a5;
        auVar80._8_4_ = 0x3f000000;
        auVar80._0_8_ = 0x3f0000003f000000;
        auVar80._12_4_ = 0x3f000000;
        auVar138._8_4_ = 0x3fb8aa3b;
        auVar138._0_8_ = 0x3fb8aa3b3fb8aa3b;
        auVar138._12_4_ = 0x3fb8aa3b;
        auVar139._8_4_ = 0x3f800000;
        auVar139._0_8_ = 0x3f8000003f800000;
        auVar139._12_4_ = 0x3f800000;
        auVar75._8_4_ = 0x3f318000;
        auVar75._0_8_ = 0x3f3180003f318000;
        auVar75._12_4_ = 0x3f318000;
        auVar81 = vbroadcastss_avx512vl(ZEXT416(0x39506967));
        auVar146._8_4_ = 0x3ab743ce;
        auVar146._0_8_ = 0x3ab743ce3ab743ce;
        auVar146._12_4_ = 0x3ab743ce;
        auVar147._8_4_ = 0x3c088908;
        auVar147._0_8_ = 0x3c0889083c088908;
        auVar147._12_4_ = 0x3c088908;
        auVar148._8_4_ = 0x3d2aa9c1;
        auVar148._0_8_ = 0x3d2aa9c13d2aa9c1;
        auVar148._12_4_ = 0x3d2aa9c1;
        auVar149._8_4_ = 0x3e2aaaaa;
        auVar149._0_8_ = 0x3e2aaaaa3e2aaaaa;
        auVar149._12_4_ = 0x3e2aaaaa;
        auVar150._8_4_ = 0x3f800000;
        auVar150._0_8_ = 0x3f8000003f800000;
        auVar150._12_4_ = 0x3f800000;
        auVar151._8_4_ = 0xb95e8083;
        auVar151._0_8_ = 0xb95e8083b95e8083;
        auVar151._12_4_ = 0xb95e8083;
        auVar82 = vbroadcastss_avx512vl(ZEXT416(0x3f3504f3));
        auVar83 = vbroadcastss_avx512vl(ZEXT416(0xbf800000));
        auVar84 = vbroadcastss_avx512vl(ZEXT416(0x3d9021bb));
        auVar85 = vbroadcastss_avx512vl(ZEXT416(0xbdebd1b8));
        auVar86 = vbroadcastss_avx512vl(ZEXT416(0x3def251a));
        auVar87 = vbroadcastss_avx512vl(ZEXT416(0xbdfe5d4f));
        auVar88 = vbroadcastss_avx512vl(ZEXT416(0x3e11e9bf));
        auVar89 = vbroadcastss_avx512vl(ZEXT416(0xbe2aae50));
        auVar76 = vbroadcastss_avx512vl(ZEXT416(0x3e4cceac));
        auVar77 = vbroadcastss_avx512vl(ZEXT416(0xbe7ffffc));
        auVar78 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaaa));
        auVar90 = vxorps_avx512vl(auVar90,auVar90);
        auVar91 = vbroadcastss_avx512vl(ZEXT416(0x40000000));
        for (uVar70 = 0; uVar70 != uVar72; uVar70 = uVar70 + 1) {
          pvVar67 = (void *)(top_blob->cstep * uVar70 * top_blob->elemsize + (long)top_blob->data);
          pvVar14 = (this->weight_data_tm).data;
          for (iVar33 = 0; iVar33 <= iVar53; iVar33 = iVar33 + 1) {
            pp_Var17 = this->_vptr_ConvolutionDepthWise_x86_avx512;
            for (lVar56 = 0; lVar56 <= iVar45; lVar56 = lVar56 + 1) {
              p_Var40 = pp_Var17[-3];
              if (*(int *)(&this->field_0x100 + (long)p_Var40) == 0) {
                auVar100 = ZEXT816(0) << 0x40;
              }
              else {
                auVar100 = *(undefined1 (*) [16])
                            (*(long *)(&this->field_0x1b0 + (long)p_Var40) + uVar70 * 0x10);
              }
              for (lVar51 = 0; uVar66 * 4 != lVar51; lVar51 = lVar51 + 4) {
                auVar100 = vfmadd231ps_fma(auVar100,*(undefined1 (*) [16])
                                                     ((long)pvVar14 +
                                                     lVar51 * 4 + (long)(int)uVar50 * 4),
                                           *(undefined1 (*) [16])
                                            ((long)&((Allocator *)
                                                    ((long)local_218.data +
                                                    (long)*(int *)((long)_space_ofs.
                                                                                                                                                  
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start + lVar51)
                                                  * 2 * 8))->_vptr_Allocator +
                                            (long)(*(int *)(&this->field_0xe4 + (long)p_Var40) *
                                                   (int)lVar56 * 4) * 4 +
                                            (long)iVar33 *
                                            (long)*(int *)(&this->field_0xe8 + (long)p_Var40) *
                                            (long)local_218.w * local_218.elemsize +
                                            local_218.cstep * uVar70 * local_218.elemsize));
              }
              auVar92 = auVar100;
              if (*(int *)(&this->field_0x110 + (long)p_Var40) - 1U < 6) {
                auVar92 = vmaxps_avx512vl(auVar100,auVar90);
                switch(*(int *)(&this->field_0x110 + (long)p_Var40)) {
                case 2:
                  auVar100 = vminps_avx512vl(auVar100,auVar90);
                  uVar2 = **(undefined4 **)(&this->field_0x118 + (long)p_Var40);
                  auVar27._4_4_ = uVar2;
                  auVar27._0_4_ = uVar2;
                  auVar27._8_4_ = uVar2;
                  auVar27._12_4_ = uVar2;
                  auVar92 = vfmadd231ps_avx512vl(auVar92,auVar100,auVar27);
                  break;
                case 3:
                  uVar2 = **(undefined4 **)(&this->field_0x118 + (long)p_Var40);
                  auVar25._4_4_ = uVar2;
                  auVar25._0_4_ = uVar2;
                  auVar25._8_4_ = uVar2;
                  auVar25._12_4_ = uVar2;
                  auVar100 = vmaxps_avx512vl(auVar100,auVar25);
                  uVar2 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var40))[1];
                  auVar26._4_4_ = uVar2;
                  auVar26._0_4_ = uVar2;
                  auVar26._8_4_ = uVar2;
                  auVar26._12_4_ = uVar2;
                  auVar92 = vminps_avx512vl(auVar100,auVar26);
                  break;
                case 4:
                  auVar23._8_4_ = 0x80000000;
                  auVar23._0_8_ = 0x8000000080000000;
                  auVar23._12_4_ = 0x80000000;
                  auVar100 = vxorps_avx512vl(auVar100,auVar23);
                  auVar100 = vminps_avx(auVar100,auVar79);
                  auVar92 = vmaxps_avx(auVar100,auVar135);
                  auVar95 = vfmadd231ps_fma(auVar80,auVar92,auVar138);
                  auVar156._0_4_ = (int)auVar95._0_4_;
                  auVar156._4_4_ = (int)auVar95._4_4_;
                  auVar156._8_4_ = (int)auVar95._8_4_;
                  auVar156._12_4_ = (int)auVar95._12_4_;
                  auVar100 = vcvtdq2ps_avx(auVar156);
                  uVar35 = vcmpps_avx512vl(auVar95,auVar100,1);
                  auVar95 = vsubps_avx512vl(auVar100,auVar139);
                  bVar74 = (bool)((byte)uVar35 & 1);
                  auVar101._0_4_ =
                       (float)((uint)bVar74 * auVar95._0_4_ | (uint)!bVar74 * auVar100._0_4_);
                  bVar74 = (bool)((byte)(uVar35 >> 1) & 1);
                  auVar101._4_4_ =
                       (float)((uint)bVar74 * auVar95._4_4_ | (uint)!bVar74 * auVar100._4_4_);
                  bVar74 = (bool)((byte)(uVar35 >> 2) & 1);
                  auVar101._8_4_ =
                       (float)((uint)bVar74 * auVar95._8_4_ | (uint)!bVar74 * auVar100._8_4_);
                  bVar74 = (bool)((byte)(uVar35 >> 3) & 1);
                  auVar101._12_4_ =
                       (float)((uint)bVar74 * auVar95._12_4_ | (uint)!bVar74 * auVar100._12_4_);
                  auVar100 = vfmsub231ps_fma(auVar92,auVar101,auVar75);
                  auVar24._8_4_ = 0x395e8083;
                  auVar24._0_8_ = 0x395e8083395e8083;
                  auVar24._12_4_ = 0x395e8083;
                  auVar92 = vfmsub231ps_avx512vl(auVar100,auVar101,auVar24);
                  auVar142._0_4_ = auVar92._0_4_ * auVar92._0_4_;
                  auVar142._4_4_ = auVar92._4_4_ * auVar92._4_4_;
                  auVar142._8_4_ = auVar92._8_4_ * auVar92._8_4_;
                  auVar142._12_4_ = auVar92._12_4_ * auVar92._12_4_;
                  auVar100 = vfmadd213ps_fma(auVar81,auVar92,auVar146);
                  auVar100 = vfmadd213ps_fma(auVar100,auVar92,auVar147);
                  auVar100 = vfmadd213ps_fma(auVar100,auVar92,auVar148);
                  auVar100 = vfmadd213ps_fma(auVar100,auVar92,auVar149);
                  auVar100 = vfmadd213ps_fma(auVar100,auVar92,auVar80);
                  auVar100 = vfmadd213ps_fma(auVar100,auVar142,auVar92);
                  auVar132._0_4_ = auVar100._0_4_ + 1.0;
                  auVar132._4_4_ = auVar100._4_4_ + 1.0;
                  auVar132._8_4_ = auVar100._8_4_ + 1.0;
                  auVar132._12_4_ = auVar100._12_4_ + 1.0;
                  auVar100._0_4_ = (int)auVar101._0_4_;
                  auVar100._4_4_ = (int)auVar101._4_4_;
                  auVar100._8_4_ = (int)auVar101._8_4_;
                  auVar100._12_4_ = (int)auVar101._12_4_;
                  auVar100 = vpslld_avx(auVar100,0x17);
                  auVar100 = vpaddd_avx(auVar150,auVar100);
                  auVar92 = vfmadd213ps_fma(auVar100,auVar132,auVar139);
                  auVar100 = vrcpps_avx(auVar92);
                  auVar92 = vfmsub213ps_fma(auVar92,auVar100,auVar139);
                  auVar92 = vfnmadd132ps_fma(auVar92,auVar100,auVar100);
                  break;
                case 5:
                  auVar92 = vminps_avx(auVar100,auVar79);
                  auVar95 = vmaxps_avx(auVar92,auVar135);
                  auVar93 = vfmadd213ps_fma(auVar138,auVar95,auVar80);
                  auVar152._0_4_ = (int)auVar93._0_4_;
                  auVar152._4_4_ = (int)auVar93._4_4_;
                  auVar152._8_4_ = (int)auVar93._8_4_;
                  auVar152._12_4_ = (int)auVar93._12_4_;
                  auVar92 = vcvtdq2ps_avx(auVar152);
                  uVar35 = vcmpps_avx512vl(auVar93,auVar92,1);
                  auVar93 = vsubps_avx512vl(auVar92,auVar139);
                  bVar74 = (bool)((byte)uVar35 & 1);
                  auVar94._0_4_ =
                       (float)((uint)bVar74 * auVar93._0_4_ | (uint)!bVar74 * auVar92._0_4_);
                  bVar74 = (bool)((byte)(uVar35 >> 1) & 1);
                  auVar94._4_4_ =
                       (float)((uint)bVar74 * auVar93._4_4_ | (uint)!bVar74 * auVar92._4_4_);
                  bVar74 = (bool)((byte)(uVar35 >> 2) & 1);
                  auVar94._8_4_ =
                       (float)((uint)bVar74 * auVar93._8_4_ | (uint)!bVar74 * auVar92._8_4_);
                  bVar74 = (bool)((byte)(uVar35 >> 3) & 1);
                  auVar94._12_4_ =
                       (float)((uint)bVar74 * auVar93._12_4_ | (uint)!bVar74 * auVar92._12_4_);
                  auVar92 = vfmsub231ps_fma(auVar95,auVar94,auVar75);
                  auVar92 = vfnmsub231ps_fma(auVar92,auVar94,auVar151);
                  auVar143._0_4_ = auVar92._0_4_ * auVar92._0_4_;
                  auVar143._4_4_ = auVar92._4_4_ * auVar92._4_4_;
                  auVar143._8_4_ = auVar92._8_4_ * auVar92._8_4_;
                  auVar143._12_4_ = auVar92._12_4_ * auVar92._12_4_;
                  auVar95 = vfmadd213ps_avx512vl(auVar81,auVar92,auVar146);
                  auVar95 = vfmadd213ps_avx512vl(auVar95,auVar92,auVar147);
                  auVar95 = vfmadd213ps_avx512vl(auVar95,auVar92,auVar148);
                  auVar95 = vfmadd213ps_avx512vl(auVar95,auVar92,auVar149);
                  auVar95 = vfmadd213ps_avx512vl(auVar95,auVar92,auVar80);
                  auVar92 = vfmadd213ps_avx512vl(auVar95,auVar143,auVar92);
                  auVar95 = vaddps_avx512vl(auVar92,auVar139);
                  auVar144._0_4_ = (int)auVar94._0_4_;
                  auVar144._4_4_ = (int)auVar94._4_4_;
                  auVar144._8_4_ = (int)auVar94._8_4_;
                  auVar144._12_4_ = (int)auVar94._12_4_;
                  auVar92 = vpslld_avx(auVar144,0x17);
                  auVar92 = vpaddd_avx(auVar92,auVar150);
                  auVar92 = vfmadd213ps_fma(auVar92,auVar95,auVar139);
                  uVar35 = vcmpps_avx512vl(auVar92,auVar90,2);
                  auVar20._8_4_ = 0x800000;
                  auVar20._0_8_ = 0x80000000800000;
                  auVar20._12_4_ = 0x800000;
                  auVar92 = vmaxps_avx512vl(auVar92,auVar20);
                  auVar93 = vpsrld_avx(auVar92,0x17);
                  auVar153._8_4_ = 0x807fffff;
                  auVar153._0_8_ = 0x807fffff807fffff;
                  auVar153._12_4_ = 0x807fffff;
                  auVar21._8_4_ = 0x3f000000;
                  auVar21._0_8_ = 0x3f0000003f000000;
                  auVar21._12_4_ = 0x3f000000;
                  auVar92 = vpternlogd_avx512vl(auVar92,auVar153,auVar21,0xea);
                  uVar19 = vcmpps_avx512vl(auVar92,auVar82,1);
                  auVar95 = vaddps_avx512vl(auVar92,auVar83);
                  auVar92 = vaddps_avx512vl(auVar95,auVar92);
                  bVar74 = (bool)((byte)uVar19 & 1);
                  auVar96._0_4_ =
                       (float)((uint)bVar74 * auVar92._0_4_ | (uint)!bVar74 * auVar95._0_4_);
                  bVar74 = (bool)((byte)(uVar19 >> 1) & 1);
                  auVar96._4_4_ =
                       (float)((uint)bVar74 * auVar92._4_4_ | (uint)!bVar74 * auVar95._4_4_);
                  bVar74 = (bool)((byte)(uVar19 >> 2) & 1);
                  auVar96._8_4_ =
                       (float)((uint)bVar74 * auVar92._8_4_ | (uint)!bVar74 * auVar95._8_4_);
                  bVar74 = (bool)((byte)(uVar19 >> 3) & 1);
                  auVar96._12_4_ =
                       (float)((uint)bVar74 * auVar92._12_4_ | (uint)!bVar74 * auVar95._12_4_);
                  auVar140._0_4_ = auVar96._0_4_ * auVar96._0_4_;
                  auVar140._4_4_ = auVar96._4_4_ * auVar96._4_4_;
                  auVar140._8_4_ = auVar96._8_4_ * auVar96._8_4_;
                  auVar140._12_4_ = auVar96._12_4_ * auVar96._12_4_;
                  auVar92 = vfmadd213ps_avx512vl(auVar84,auVar96,auVar85);
                  auVar92 = vfmadd213ps_avx512vl(auVar92,auVar96,auVar86);
                  auVar92 = vfmadd213ps_avx512vl(auVar92,auVar96,auVar87);
                  auVar92 = vfmadd213ps_avx512vl(auVar92,auVar96,auVar88);
                  auVar92 = vfmadd213ps_avx512vl(auVar92,auVar96,auVar89);
                  auVar92 = vfmadd213ps_avx512vl(auVar92,auVar96,auVar76);
                  auVar92 = vfmadd213ps_avx512vl(auVar92,auVar96,auVar77);
                  auVar92 = vfmadd213ps_avx512vl(auVar92,auVar96,auVar78);
                  auVar95 = vmulps_avx512vl(auVar140,auVar96);
                  auVar95 = vmulps_avx512vl(auVar95,auVar92);
                  auVar22._8_4_ = 0xffffff82;
                  auVar22._0_8_ = 0xffffff82ffffff82;
                  auVar22._12_4_ = 0xffffff82;
                  auVar92 = vpaddd_avx512vl(auVar93,auVar22);
                  auVar92 = vcvtdq2ps_avx(auVar92);
                  auVar93 = vsubps_avx512vl(auVar92,auVar139);
                  bVar74 = (bool)((byte)uVar19 & 1);
                  auVar97._0_4_ = (uint)bVar74 * auVar93._0_4_ | (uint)!bVar74 * auVar92._0_4_;
                  bVar74 = (bool)((byte)(uVar19 >> 1) & 1);
                  auVar97._4_4_ = (uint)bVar74 * auVar93._4_4_ | (uint)!bVar74 * auVar92._4_4_;
                  bVar74 = (bool)((byte)(uVar19 >> 2) & 1);
                  auVar97._8_4_ = (uint)bVar74 * auVar93._8_4_ | (uint)!bVar74 * auVar92._8_4_;
                  bVar74 = (bool)((byte)(uVar19 >> 3) & 1);
                  auVar97._12_4_ = (uint)bVar74 * auVar93._12_4_ | (uint)!bVar74 * auVar92._12_4_;
                  auVar92 = vfmadd231ps_avx512vl(auVar95,auVar97,auVar151);
                  auVar92 = vfmsub231ps_avx512vl(auVar92,auVar80,auVar140);
                  auVar92 = vsubps_avx512vl(auVar92,auVar96);
                  auVar92 = vfnmadd231ps_fma(auVar92,auVar75,auVar97);
                  auVar95 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                  bVar74 = (bool)((byte)uVar35 & 1);
                  auVar98._0_4_ =
                       (uint)bVar74 * auVar95._0_4_ |
                       (uint)!bVar74 * (int)(auVar92._0_4_ + auVar92._0_4_);
                  bVar74 = (bool)((byte)(uVar35 >> 1) & 1);
                  auVar98._4_4_ =
                       (uint)bVar74 * auVar95._4_4_ |
                       (uint)!bVar74 * (int)(auVar92._4_4_ + auVar92._4_4_);
                  bVar74 = (bool)((byte)(uVar35 >> 2) & 1);
                  auVar98._8_4_ =
                       (uint)bVar74 * auVar95._8_4_ |
                       (uint)!bVar74 * (int)(auVar92._8_4_ + auVar92._8_4_);
                  bVar74 = (bool)((byte)(uVar35 >> 3) & 1);
                  auVar98._12_4_ =
                       (uint)bVar74 * auVar95._12_4_ |
                       (uint)!bVar74 * (int)(auVar92._12_4_ + auVar92._12_4_);
                  auVar92 = vminps_avx(auVar98,auVar79);
                  auVar95 = vmaxps_avx(auVar92,auVar135);
                  auVar93 = vfmadd213ps_fma(auVar138,auVar95,auVar80);
                  auVar154._0_4_ = (int)auVar93._0_4_;
                  auVar154._4_4_ = (int)auVar93._4_4_;
                  auVar154._8_4_ = (int)auVar93._8_4_;
                  auVar154._12_4_ = (int)auVar93._12_4_;
                  auVar92 = vcvtdq2ps_avx(auVar154);
                  uVar35 = vcmpps_avx512vl(auVar93,auVar92,1);
                  auVar93 = vsubps_avx512vl(auVar92,auVar139);
                  bVar74 = (bool)((byte)uVar35 & 1);
                  auVar99._0_4_ =
                       (float)((uint)bVar74 * auVar93._0_4_ | (uint)!bVar74 * auVar92._0_4_);
                  bVar74 = (bool)((byte)(uVar35 >> 1) & 1);
                  auVar99._4_4_ =
                       (float)((uint)bVar74 * auVar93._4_4_ | (uint)!bVar74 * auVar92._4_4_);
                  bVar74 = (bool)((byte)(uVar35 >> 2) & 1);
                  auVar99._8_4_ =
                       (float)((uint)bVar74 * auVar93._8_4_ | (uint)!bVar74 * auVar92._8_4_);
                  bVar74 = (bool)((byte)(uVar35 >> 3) & 1);
                  auVar99._12_4_ =
                       (float)((uint)bVar74 * auVar93._12_4_ | (uint)!bVar74 * auVar92._12_4_);
                  auVar92 = vfmsub231ps_fma(auVar95,auVar99,auVar75);
                  auVar92 = vfnmsub231ps_fma(auVar92,auVar99,auVar151);
                  auVar145._0_4_ = auVar92._0_4_ * auVar92._0_4_;
                  auVar145._4_4_ = auVar92._4_4_ * auVar92._4_4_;
                  auVar145._8_4_ = auVar92._8_4_ * auVar92._8_4_;
                  auVar145._12_4_ = auVar92._12_4_ * auVar92._12_4_;
                  auVar95 = vfmadd213ps_avx512vl(auVar81,auVar92,auVar146);
                  auVar95 = vfmadd213ps_avx512vl(auVar95,auVar92,auVar147);
                  auVar95 = vfmadd213ps_avx512vl(auVar95,auVar92,auVar148);
                  auVar95 = vfmadd213ps_avx512vl(auVar95,auVar92,auVar149);
                  auVar95 = vfmadd213ps_avx512vl(auVar95,auVar92,auVar80);
                  auVar92 = vfmadd213ps_avx512vl(auVar95,auVar145,auVar92);
                  auVar95 = vaddps_avx512vl(auVar92,auVar139);
                  auVar141._0_4_ = (int)auVar99._0_4_;
                  auVar141._4_4_ = (int)auVar99._4_4_;
                  auVar141._8_4_ = (int)auVar99._8_4_;
                  auVar141._12_4_ = (int)auVar99._12_4_;
                  auVar92 = vpslld_avx(auVar141,0x17);
                  auVar92 = vpaddd_avx(auVar150,auVar92);
                  auVar95 = vfmadd213ps_fma(auVar92,auVar95,auVar139);
                  auVar92 = vrcpps_avx(auVar95);
                  auVar155._0_4_ = auVar92._0_4_ + auVar92._0_4_;
                  auVar155._4_4_ = auVar92._4_4_ + auVar92._4_4_;
                  auVar155._8_4_ = auVar92._8_4_ + auVar92._8_4_;
                  auVar155._12_4_ = auVar92._12_4_ + auVar92._12_4_;
                  auVar95 = vfmsub213ps_avx512vl(auVar95,auVar155,auVar91);
                  auVar92 = vfnmadd213ps_fma(auVar95,auVar92,auVar155);
                  auVar92 = vfmsub213ps_fma(auVar92,auVar100,auVar100);
                  break;
                case 6:
                  uVar2 = **(undefined4 **)(&this->field_0x118 + (long)p_Var40);
                  auVar93._4_4_ = uVar2;
                  auVar93._0_4_ = uVar2;
                  auVar93._8_4_ = uVar2;
                  auVar93._12_4_ = uVar2;
                  uVar2 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var40))[1];
                  auVar95._4_4_ = uVar2;
                  auVar95._0_4_ = uVar2;
                  auVar95._8_4_ = uVar2;
                  auVar95._12_4_ = uVar2;
                  auVar92 = vfmadd213ps_avx512vl(auVar93,auVar100,auVar95);
                  auVar92 = vmaxps_avx512vl(auVar92,auVar90);
                  auVar95 = vminps_avx(auVar92,auVar139);
                  auVar92._0_4_ = auVar95._0_4_ * auVar100._0_4_;
                  auVar92._4_4_ = auVar95._4_4_ * auVar100._4_4_;
                  auVar92._8_4_ = auVar95._8_4_ * auVar100._8_4_;
                  auVar92._12_4_ = auVar95._12_4_ * auVar100._12_4_;
                }
              }
              *(undefined1 (*) [16])((long)pvVar67 + lVar56 * 0x10) = auVar92;
            }
            pvVar67 = (void *)((long)pvVar67 + (long)(iVar48 * 4) * 4);
          }
          uVar50 = (ulong)((int)uVar50 + uVar41 * 4);
        }
      }
      else if (iVar33 == 8) {
        iVar33 = *(int *)(&this->field_0xd4 + (long)p_Var40);
        iVar37 = *(int *)(&this->field_0xd8 + (long)p_Var40);
        if (iVar33 == 5) {
          if (iVar37 == 5) {
            if (((*(int *)(&this->field_0xdc + (long)p_Var40) == 1) &&
                (*(int *)(&this->field_0xe0 + (long)p_Var40) == 1)) &&
               ((*(int *)(&this->field_0xe4 + (long)p_Var40) == 1 &&
                (*(int *)(&this->field_0xe8 + (long)p_Var40) == 1)))) {
              uVar72 = 0;
              uVar66 = (ulong)(uint)top_blob->w;
              if (top_blob->w < 1) {
                uVar66 = uVar72;
              }
              lVar56 = *(long *)(&this->field_0x1b0 + (long)p_Var40);
              uVar50 = (ulong)(uint)top_blob->h;
              if (top_blob->h < 1) {
                uVar50 = uVar72;
              }
              uVar70 = (ulong)(uint)local_218.c;
              if (local_218.c < 1) {
                uVar70 = uVar72;
              }
              for (; uVar72 != uVar70; uVar72 = uVar72 + 1) {
                if (lVar56 == 0) {
                  auVar134 = ZEXT1632(ZEXT816(0) << 0x40);
                }
                else {
                  auVar134 = *(undefined1 (*) [32])(lVar56 + uVar72 * 0x20);
                }
                pvVar38 = (void *)(top_blob->cstep * uVar72 * top_blob->elemsize +
                                  (long)top_blob->data);
                pvVar14 = (this->weight_data_tm).data;
                lVar58 = (long)(this->weight_data_tm).w * uVar72 * (this->weight_data_tm).elemsize;
                ppp_Var42 = (_func_int ***)
                            ((long)(_func_int ***)local_218.data +
                            local_218.cstep * uVar72 * local_218.elemsize);
                lVar51 = (long)local_218.w * local_218.elemsize;
                ppp_Var43 = (_func_int ***)((long)ppp_Var42 + lVar51);
                pvVar67 = (void *)((long)ppp_Var42 + lVar51 * 2);
                pvVar64 = (void *)((long)ppp_Var42 + lVar51 * 3);
                piVar46 = (pointer)((long)ppp_Var42 + lVar51 * 4);
                for (iVar33 = 0; iVar33 != (int)uVar50; iVar33 = iVar33 + 1) {
                  lVar51 = 0;
                  uVar35 = uVar66;
                  while (iVar45 = (int)uVar35, uVar35 = (ulong)(iVar45 - 1), iVar45 != 0) {
                    auVar90 = vfmadd132ps_fma(*(undefined1 (*) [32])((long)pvVar14 + lVar58),
                                              auVar134,*(undefined1 (*) [32])
                                                        ((long)ppp_Var42 + lVar51));
                    auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),
                                              *(undefined1 (*) [32])((long)pvVar14 + lVar58 + 0x20),
                                              *(undefined1 (*) [32])((long)(ppp_Var42 + 4) + lVar51)
                                             );
                    auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),
                                              *(undefined1 (*) [32])((long)pvVar14 + lVar58 + 0x40),
                                              *(undefined1 (*) [32])((long)(ppp_Var42 + 8) + lVar51)
                                             );
                    auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),
                                              *(undefined1 (*) [32])((long)pvVar14 + lVar58 + 0x60),
                                              *(undefined1 (*) [32])
                                               ((long)(ppp_Var42 + 0xc) + lVar51));
                    auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),
                                              *(undefined1 (*) [32])((long)pvVar14 + lVar58 + 0x80),
                                              *(undefined1 (*) [32])
                                               ((long)(ppp_Var42 + 0x10) + lVar51));
                    auVar90 = vfmadd132ps_fma(*(undefined1 (*) [32])((long)pvVar14 + lVar58 + 0xa0),
                                              ZEXT1632(auVar90),
                                              *(undefined1 (*) [32])((long)ppp_Var43 + lVar51));
                    auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),
                                              *(undefined1 (*) [32])((long)pvVar14 + lVar58 + 0xc0),
                                              *(undefined1 (*) [32])((long)(ppp_Var43 + 4) + lVar51)
                                             );
                    auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),
                                              *(undefined1 (*) [32])((long)pvVar14 + lVar58 + 0xe0),
                                              *(undefined1 (*) [32])((long)(ppp_Var43 + 8) + lVar51)
                                             );
                    auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),
                                              *(undefined1 (*) [32])((long)pvVar14 + lVar58 + 0x100)
                                              ,*(undefined1 (*) [32])
                                                ((long)(ppp_Var43 + 0xc) + lVar51));
                    auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),
                                              *(undefined1 (*) [32])((long)pvVar14 + lVar58 + 0x120)
                                              ,*(undefined1 (*) [32])
                                                ((long)(ppp_Var43 + 0x10) + lVar51));
                    auVar90 = vfmadd132ps_fma(*(undefined1 (*) [32])((long)pvVar14 + lVar58 + 0x140)
                                              ,ZEXT1632(auVar90),
                                              *(undefined1 (*) [32])((long)pvVar67 + lVar51));
                    auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),
                                              *(undefined1 (*) [32])((long)pvVar14 + lVar58 + 0x160)
                                              ,*(undefined1 (*) [32])((long)pvVar67 + lVar51 + 0x20)
                                             );
                    auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),
                                              *(undefined1 (*) [32])((long)pvVar14 + lVar58 + 0x180)
                                              ,*(undefined1 (*) [32])((long)pvVar67 + lVar51 + 0x40)
                                             );
                    auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),
                                              *(undefined1 (*) [32])((long)pvVar14 + lVar58 + 0x1a0)
                                              ,*(undefined1 (*) [32])((long)pvVar67 + lVar51 + 0x60)
                                             );
                    auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),
                                              *(undefined1 (*) [32])((long)pvVar14 + lVar58 + 0x1c0)
                                              ,*(undefined1 (*) [32])((long)pvVar67 + lVar51 + 0x80)
                                             );
                    auVar90 = vfmadd132ps_fma(*(undefined1 (*) [32])((long)pvVar14 + lVar58 + 0x1e0)
                                              ,ZEXT1632(auVar90),
                                              *(undefined1 (*) [32])((long)pvVar64 + lVar51));
                    auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),
                                              *(undefined1 (*) [32])((long)pvVar14 + lVar58 + 0x200)
                                              ,*(undefined1 (*) [32])((long)pvVar64 + lVar51 + 0x20)
                                             );
                    auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),
                                              *(undefined1 (*) [32])((long)pvVar14 + lVar58 + 0x220)
                                              ,*(undefined1 (*) [32])((long)pvVar64 + lVar51 + 0x40)
                                             );
                    auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),
                                              *(undefined1 (*) [32])((long)pvVar14 + lVar58 + 0x240)
                                              ,*(undefined1 (*) [32])((long)pvVar64 + lVar51 + 0x60)
                                             );
                    auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),
                                              *(undefined1 (*) [32])((long)pvVar14 + lVar58 + 0x260)
                                              ,*(undefined1 (*) [32])((long)pvVar64 + lVar51 + 0x80)
                                             );
                    auVar90 = vfmadd132ps_fma(*(undefined1 (*) [32])((long)pvVar14 + lVar58 + 0x280)
                                              ,ZEXT1632(auVar90),
                                              *(undefined1 (*) [32])((long)piVar46 + lVar51));
                    auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),
                                              *(undefined1 (*) [32])((long)pvVar14 + lVar58 + 0x2a0)
                                              ,*(undefined1 (*) [32])((long)piVar46 + lVar51 + 0x20)
                                             );
                    auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),
                                              *(undefined1 (*) [32])((long)pvVar14 + lVar58 + 0x2c0)
                                              ,*(undefined1 (*) [32])((long)piVar46 + lVar51 + 0x40)
                                             );
                    auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),
                                              *(undefined1 (*) [32])((long)pvVar14 + lVar58 + 0x2e0)
                                              ,*(undefined1 (*) [32])((long)piVar46 + lVar51 + 0x60)
                                             );
                    auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),
                                              *(undefined1 (*) [32])((long)pvVar14 + lVar58 + 0x300)
                                              ,*(undefined1 (*) [32])((long)piVar46 + lVar51 + 0x80)
                                             );
                    *(undefined1 (*) [32])((long)pvVar38 + lVar51) = ZEXT1632(auVar90);
                    lVar51 = lVar51 + 0x20;
                  }
                  ppp_Var42 = (_func_int ***)((long)(ppp_Var42 + 0x10) + lVar51);
                  ppp_Var43 = (_func_int ***)((long)(ppp_Var43 + 0x10) + lVar51);
                  pvVar67 = (void *)((long)pvVar67 + lVar51 + 0x80);
                  pvVar64 = (void *)((long)pvVar64 + lVar51 + 0x80);
                  piVar46 = (pointer)((long)piVar46 + lVar51 + 0x80);
                  pvVar38 = (void *)((long)pvVar38 + lVar51);
                }
              }
            }
            else {
              iVar37 = 5;
              if (((*(int *)(&this->field_0xdc + (long)p_Var40) != 1) ||
                  (*(int *)(&this->field_0xe0 + (long)p_Var40) != 1)) ||
                 ((*(int *)(&this->field_0xe4 + (long)p_Var40) != 2 ||
                  (*(int *)(&this->field_0xe8 + (long)p_Var40) != 2)))) goto LAB_003dd4db;
              iVar33 = top_blob->w;
              iVar45 = local_218.w - iVar33;
              lVar56 = *(long *)(&this->field_0x1b0 + (long)p_Var40);
              uVar66 = 0;
              if (iVar33 < 1) {
                iVar33 = 0;
              }
              uVar72 = (ulong)(uint)top_blob->h;
              if (top_blob->h < 1) {
                uVar72 = uVar66;
              }
              uVar50 = (ulong)(uint)local_218.c;
              if (local_218.c < 1) {
                uVar50 = uVar66;
              }
              lVar51 = (long)(iVar45 * 0x10) * 4;
              for (; uVar66 != uVar50; uVar66 = uVar66 + 1) {
                if (lVar56 == 0) {
                  auVar134 = ZEXT1632(ZEXT816(0) << 0x40);
                }
                else {
                  auVar134 = *(undefined1 (*) [32])(lVar56 + uVar66 * 0x20);
                }
                pauVar62 = (undefined1 (*) [32])
                           (top_blob->cstep * uVar66 * top_blob->elemsize + (long)top_blob->data);
                pvVar14 = (this->weight_data_tm).data;
                lVar55 = (long)(this->weight_data_tm).w * uVar66 * (this->weight_data_tm).elemsize;
                ppp_Var42 = (_func_int ***)
                            ((long)(_func_int ***)local_218.data +
                            local_218.cstep * uVar66 * local_218.elemsize);
                lVar58 = (long)local_218.w * local_218.elemsize;
                ppp_Var43 = (_func_int ***)((long)ppp_Var42 + lVar58);
                pvVar67 = (void *)((long)ppp_Var42 + lVar58 * 2);
                pvVar38 = (void *)((long)ppp_Var42 + lVar58 * 3);
                piVar46 = (pointer)((long)ppp_Var42 + lVar58 * 4);
                for (iVar45 = 0; iVar45 != (int)uVar72; iVar45 = iVar45 + 1) {
                  lVar58 = 0;
                  iVar53 = iVar33;
                  while (bVar74 = iVar53 != 0, iVar53 = iVar53 + -1, bVar74) {
                    auVar90 = vfmadd132ps_fma(*(undefined1 (*) [32])((long)pvVar14 + lVar55),
                                              auVar134,*(undefined1 (*) [32])
                                                        ((long)ppp_Var42 + lVar58));
                    auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),
                                              *(undefined1 (*) [32])((long)pvVar14 + lVar55 + 0x20),
                                              *(undefined1 (*) [32])((long)(ppp_Var42 + 4) + lVar58)
                                             );
                    auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),
                                              *(undefined1 (*) [32])((long)pvVar14 + lVar55 + 0x40),
                                              *(undefined1 (*) [32])((long)(ppp_Var42 + 8) + lVar58)
                                             );
                    auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),
                                              *(undefined1 (*) [32])((long)pvVar14 + lVar55 + 0x60),
                                              *(undefined1 (*) [32])
                                               ((long)(ppp_Var42 + 0xc) + lVar58));
                    auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),
                                              *(undefined1 (*) [32])((long)pvVar14 + lVar55 + 0x80),
                                              *(undefined1 (*) [32])
                                               ((long)(ppp_Var42 + 0x10) + lVar58));
                    auVar90 = vfmadd132ps_fma(*(undefined1 (*) [32])((long)pvVar14 + lVar55 + 0xa0),
                                              ZEXT1632(auVar90),
                                              *(undefined1 (*) [32])((long)ppp_Var43 + lVar58));
                    auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),
                                              *(undefined1 (*) [32])((long)pvVar14 + lVar55 + 0xc0),
                                              *(undefined1 (*) [32])((long)(ppp_Var43 + 4) + lVar58)
                                             );
                    auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),
                                              *(undefined1 (*) [32])((long)pvVar14 + lVar55 + 0xe0),
                                              *(undefined1 (*) [32])((long)(ppp_Var43 + 8) + lVar58)
                                             );
                    auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),
                                              *(undefined1 (*) [32])((long)pvVar14 + lVar55 + 0x100)
                                              ,*(undefined1 (*) [32])
                                                ((long)(ppp_Var43 + 0xc) + lVar58));
                    auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),
                                              *(undefined1 (*) [32])((long)pvVar14 + lVar55 + 0x120)
                                              ,*(undefined1 (*) [32])
                                                ((long)(ppp_Var43 + 0x10) + lVar58));
                    auVar90 = vfmadd132ps_fma(*(undefined1 (*) [32])((long)pvVar14 + lVar55 + 0x140)
                                              ,ZEXT1632(auVar90),
                                              *(undefined1 (*) [32])((long)pvVar67 + lVar58));
                    auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),
                                              *(undefined1 (*) [32])((long)pvVar14 + lVar55 + 0x160)
                                              ,*(undefined1 (*) [32])((long)pvVar67 + lVar58 + 0x20)
                                             );
                    auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),
                                              *(undefined1 (*) [32])((long)pvVar14 + lVar55 + 0x180)
                                              ,*(undefined1 (*) [32])((long)pvVar67 + lVar58 + 0x40)
                                             );
                    auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),
                                              *(undefined1 (*) [32])((long)pvVar14 + lVar55 + 0x1a0)
                                              ,*(undefined1 (*) [32])((long)pvVar67 + lVar58 + 0x60)
                                             );
                    auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),
                                              *(undefined1 (*) [32])((long)pvVar14 + lVar55 + 0x1c0)
                                              ,*(undefined1 (*) [32])((long)pvVar67 + lVar58 + 0x80)
                                             );
                    auVar90 = vfmadd132ps_fma(*(undefined1 (*) [32])((long)pvVar14 + lVar55 + 0x1e0)
                                              ,ZEXT1632(auVar90),
                                              *(undefined1 (*) [32])((long)pvVar38 + lVar58));
                    auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),
                                              *(undefined1 (*) [32])((long)pvVar14 + lVar55 + 0x200)
                                              ,*(undefined1 (*) [32])((long)pvVar38 + lVar58 + 0x20)
                                             );
                    auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),
                                              *(undefined1 (*) [32])((long)pvVar14 + lVar55 + 0x220)
                                              ,*(undefined1 (*) [32])((long)pvVar38 + lVar58 + 0x40)
                                             );
                    auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),
                                              *(undefined1 (*) [32])((long)pvVar14 + lVar55 + 0x240)
                                              ,*(undefined1 (*) [32])((long)pvVar38 + lVar58 + 0x60)
                                             );
                    auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),
                                              *(undefined1 (*) [32])((long)pvVar14 + lVar55 + 0x260)
                                              ,*(undefined1 (*) [32])((long)pvVar38 + lVar58 + 0x80)
                                             );
                    auVar90 = vfmadd132ps_fma(*(undefined1 (*) [32])((long)pvVar14 + lVar55 + 0x280)
                                              ,ZEXT1632(auVar90),
                                              *(undefined1 (*) [32])((long)piVar46 + lVar58));
                    auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),
                                              *(undefined1 (*) [32])((long)pvVar14 + lVar55 + 0x2a0)
                                              ,*(undefined1 (*) [32])((long)piVar46 + lVar58 + 0x20)
                                             );
                    auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),
                                              *(undefined1 (*) [32])((long)pvVar14 + lVar55 + 0x2c0)
                                              ,*(undefined1 (*) [32])((long)piVar46 + lVar58 + 0x40)
                                             );
                    auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),
                                              *(undefined1 (*) [32])((long)pvVar14 + lVar55 + 0x2e0)
                                              ,*(undefined1 (*) [32])((long)piVar46 + lVar58 + 0x60)
                                             );
                    auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),
                                              *(undefined1 (*) [32])((long)pvVar14 + lVar55 + 0x300)
                                              ,*(undefined1 (*) [32])((long)piVar46 + lVar58 + 0x80)
                                             );
                    *pauVar62 = ZEXT1632(auVar90);
                    pauVar62 = pauVar62 + 1;
                    lVar58 = lVar58 + 0x40;
                  }
                  ppp_Var42 = (_func_int ***)((long)ppp_Var42 + lVar58 + lVar51);
                  ppp_Var43 = (_func_int ***)((long)ppp_Var43 + lVar58 + lVar51);
                  pvVar67 = (void *)((long)pvVar67 + lVar58 + lVar51);
                  pvVar38 = (void *)((long)pvVar38 + lVar58 + lVar51);
                  piVar46 = (pointer)((long)piVar46 + lVar58 + lVar51);
                }
              }
            }
            goto LAB_003dd74c;
          }
        }
        else if ((iVar33 == 3) && (iVar37 == 3)) {
          if ((*(int *)(&this->field_0xdc + (long)p_Var40) == 1) &&
             (((*(int *)(&this->field_0xe0 + (long)p_Var40) == 1 &&
               (*(int *)(&this->field_0xe4 + (long)p_Var40) == 1)) &&
              (*(int *)(&this->field_0xe8 + (long)p_Var40) == 1)))) {
            iVar33 = top_blob->w;
            iVar45 = top_blob->h;
            lVar56 = *(long *)(&this->field_0x1b0 + (long)p_Var40);
            uVar72 = 0;
            uVar66 = (ulong)(uint)local_218.c;
            if (local_218.c < 1) {
              uVar66 = uVar72;
            }
            lVar58 = (long)(local_218.w * 8 + 0x10) * 4;
            lVar51 = (long)(iVar33 * 8) * 4;
            for (; uVar72 != uVar66; uVar72 = uVar72 + 1) {
              if (lVar56 == 0) {
                auVar134 = ZEXT1632(ZEXT816(0) << 0x40);
              }
              else {
                auVar134 = *(undefined1 (*) [32])(lVar56 + uVar72 * 0x20);
              }
              pvVar69 = (void *)(top_blob->cstep * uVar72 * top_blob->elemsize +
                                (long)top_blob->data);
              lVar71 = (long)(this->weight_data_tm).w * uVar72 * (this->weight_data_tm).elemsize;
              pvVar14 = (this->weight_data_tm).data;
              pvVar38 = (void *)((long)top_blob->w * top_blob->elemsize + (long)pvVar69);
              ppp_Var42 = (_func_int ***)
                          ((long)(_func_int ***)local_218.data +
                          local_218.cstep * uVar72 * local_218.elemsize);
              lVar55 = (long)local_218.w * local_218.elemsize;
              ppp_Var43 = (_func_int ***)((long)ppp_Var42 + lVar55);
              pvVar67 = (void *)((long)ppp_Var42 + lVar55 * 2);
              pvVar64 = (void *)((long)ppp_Var42 + lVar55 * 3);
              for (uVar44 = 0; (int)(uVar44 | 1) < iVar45; uVar44 = uVar44 + 2) {
                lVar55 = 0;
                for (iVar53 = 0; iVar53 + 3 < iVar33; iVar53 = iVar53 + 4) {
                  auVar111 = *(undefined1 (*) [32])((long)(ppp_Var42 + 8) + lVar55);
                  auVar136 = *(undefined1 (*) [32])((long)(ppp_Var42 + 0xc) + lVar55);
                  auVar102 = *(undefined1 (*) [32])((long)pvVar14 + lVar71);
                  auVar103 = *(undefined1 (*) [32])((long)pvVar14 + lVar71 + 0x20);
                  auVar137 = *(undefined1 (*) [32])((long)pvVar14 + lVar71 + 0x40);
                  auVar107 = *(undefined1 (*) [32])((long)pvVar14 + lVar71 + 0x60);
                  auVar90 = vfmadd213ps_fma(*(undefined1 (*) [32])((long)ppp_Var42 + lVar55),
                                            auVar102,auVar134);
                  auVar81 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar103,
                                            *(undefined1 (*) [32])((long)(ppp_Var42 + 4) + lVar55));
                  auVar90 = vfmadd213ps_fma(*(undefined1 (*) [32])((long)(ppp_Var42 + 4) + lVar55),
                                            auVar102,auVar134);
                  auVar82 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar103,auVar111);
                  auVar81 = vfmadd231ps_fma(ZEXT1632(auVar81),auVar137,auVar111);
                  auVar90 = vfmadd213ps_fma(auVar111,auVar102,auVar134);
                  auVar83 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar103,auVar136);
                  auVar82 = vfmadd231ps_fma(ZEXT1632(auVar82),auVar137,auVar136);
                  auVar90 = vfmadd213ps_fma(auVar136,auVar102,auVar134);
                  auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar103,
                                            *(undefined1 (*) [32])
                                             ((long)(ppp_Var42 + 0x10) + lVar55));
                  auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),auVar137,
                                            *(undefined1 (*) [32])
                                             ((long)(ppp_Var42 + 0x10) + lVar55));
                  auVar84 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar137,
                                            *(undefined1 (*) [32])
                                             ((long)(ppp_Var42 + 0x14) + lVar55));
                  auVar111 = *(undefined1 (*) [32])((long)pvVar14 + lVar71 + 0x80);
                  auVar136 = *(undefined1 (*) [32])((long)pvVar14 + lVar71 + 0xa0);
                  auVar112 = *(undefined1 (*) [32])((long)(ppp_Var43 + 4) + lVar55);
                  auVar113 = *(undefined1 (*) [32])((long)(ppp_Var43 + 8) + lVar55);
                  auVar114 = *(undefined1 (*) [32])((long)(ppp_Var43 + 0xc) + lVar55);
                  auVar115 = *(undefined1 (*) [32])((long)(ppp_Var43 + 0x10) + lVar55);
                  auVar81 = vfmadd231ps_fma(ZEXT1632(auVar81),auVar107,
                                            *(undefined1 (*) [32])((long)ppp_Var43 + lVar55));
                  auVar90 = vfmadd213ps_fma(*(undefined1 (*) [32])((long)ppp_Var43 + lVar55),
                                            auVar102,auVar134);
                  auVar82 = vfmadd231ps_fma(ZEXT1632(auVar82),auVar107,auVar112);
                  auVar85 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar103,auVar112);
                  auVar81 = vfmadd231ps_fma(ZEXT1632(auVar81),auVar111,auVar112);
                  auVar90 = vfmadd213ps_fma(auVar112,auVar102,auVar134);
                  auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),auVar107,auVar113);
                  auVar86 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar103,auVar113);
                  auVar82 = vfmadd231ps_fma(ZEXT1632(auVar82),auVar111,auVar113);
                  auVar85 = vfmadd231ps_fma(ZEXT1632(auVar85),auVar137,auVar113);
                  auVar87 = vfmadd231ps_fma(ZEXT1632(auVar81),auVar136,auVar113);
                  auVar90 = vfmadd213ps_fma(auVar113,auVar102,auVar134);
                  auVar81 = vfmadd213ps_fma(auVar102,auVar114,auVar134);
                  auVar84 = vfmadd231ps_fma(ZEXT1632(auVar84),auVar107,auVar114);
                  auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar103,auVar114);
                  auVar102 = vfmadd231ps_avx512vl(ZEXT1632(auVar81),auVar115,auVar103);
                  auVar81 = vfmadd231ps_fma(ZEXT1632(auVar83),auVar111,auVar114);
                  auVar103 = vfmadd231ps_avx512vl(ZEXT1632(auVar84),auVar111,auVar115);
                  auVar83 = vfmadd231ps_fma(ZEXT1632(auVar86),auVar137,auVar114);
                  auVar104 = vfmadd231ps_avx512vl(ZEXT1632(auVar90),auVar137,auVar115);
                  auVar90 = vfmadd231ps_fma(auVar102,*(undefined1 (*) [32])
                                                      ((long)(ppp_Var43 + 0x14) + lVar55),auVar137);
                  auVar82 = vfmadd231ps_fma(ZEXT1632(auVar82),auVar136,auVar114);
                  auVar105 = vfmadd231ps_avx512vl(ZEXT1632(auVar81),auVar136,auVar115);
                  auVar81 = vfmadd231ps_fma(auVar103,auVar136,
                                            *(undefined1 (*) [32])
                                             ((long)(ppp_Var43 + 0x14) + lVar55));
                  auVar102 = *(undefined1 (*) [32])((long)pvVar14 + lVar71 + 0xc0);
                  auVar103 = *(undefined1 (*) [32])((long)pvVar14 + lVar71 + 0xe0);
                  auVar137 = *(undefined1 (*) [32])((long)pvVar14 + lVar71 + 0x100);
                  auVar112 = *(undefined1 (*) [32])((long)pvVar67 + lVar55 + 0x20);
                  auVar113 = *(undefined1 (*) [32])((long)pvVar67 + lVar55 + 0x40);
                  auVar114 = *(undefined1 (*) [32])((long)pvVar67 + lVar55 + 0x60);
                  auVar115 = *(undefined1 (*) [32])((long)pvVar67 + lVar55 + 0x80);
                  auVar116 = *(undefined1 (*) [32])((long)pvVar67 + lVar55 + 0xa0);
                  auVar84 = vfmadd231ps_fma(ZEXT1632(auVar85),auVar107,
                                            *(undefined1 (*) [32])((long)pvVar67 + lVar55));
                  auVar106 = vfmadd231ps_avx512vl(ZEXT1632(auVar83),auVar107,auVar112);
                  auVar104 = vfmadd231ps_avx512vl(auVar104,auVar107,auVar113);
                  auVar107 = vfmadd231ps_avx512vl(ZEXT1632(auVar90),auVar114,auVar107);
                  auVar90 = vfmadd231ps_fma(ZEXT1632(auVar87),auVar102,
                                            *(undefined1 (*) [32])((long)pvVar67 + lVar55));
                  auVar108 = vfmadd231ps_avx512vl(ZEXT1632(auVar82),auVar102,auVar112);
                  auVar105 = vfmadd231ps_avx512vl(auVar105,auVar102,auVar113);
                  auVar109 = vfmadd231ps_avx512vl(ZEXT1632(auVar81),auVar102,auVar114);
                  auVar110 = vfmadd231ps_avx512vl(ZEXT1632(auVar84),auVar111,auVar112);
                  auVar106 = vfmadd231ps_avx512vl(auVar106,auVar111,auVar113);
                  auVar104 = vfmadd231ps_avx512vl(auVar104,auVar111,auVar114);
                  auVar111 = vfmadd231ps_avx512vl(auVar107,auVar115,auVar111);
                  auVar107 = vfmadd231ps_avx512vl(ZEXT1632(auVar90),auVar103,auVar112);
                  auVar112 = vfmadd231ps_avx512vl(auVar108,auVar103,auVar113);
                  auVar105 = vfmadd231ps_avx512vl(auVar105,auVar103,auVar114);
                  auVar108 = vfmadd231ps_avx512vl(auVar109,auVar103,auVar115);
                  auVar109 = vfmadd231ps_avx512vl(auVar110,auVar136,auVar113);
                  auVar106 = vfmadd231ps_avx512vl(auVar106,auVar136,auVar114);
                  auVar104 = vfmadd231ps_avx512vl(auVar104,auVar136,auVar115);
                  auVar110 = vfmadd231ps_avx512vl(auVar111,auVar116,auVar136);
                  auVar113 = vfmadd231ps_avx512vl(auVar107,auVar137,auVar113);
                  auVar114 = vfmadd231ps_avx512vl(auVar112,auVar137,auVar114);
                  auVar115 = vfmadd231ps_avx512vl(auVar105,auVar137,auVar115);
                  auVar116 = vfmadd231ps_avx512vl(auVar108,auVar137,auVar116);
                  auVar111 = *(undefined1 (*) [32])((long)pvVar64 + lVar55 + 0x20);
                  auVar136 = *(undefined1 (*) [32])((long)pvVar64 + lVar55 + 0x40);
                  auVar107 = *(undefined1 (*) [32])((long)pvVar64 + lVar55 + 0x60);
                  auVar112 = *(undefined1 (*) [32])((long)pvVar64 + lVar55 + 0x80);
                  auVar90 = vfmadd231ps_fma(auVar109,auVar102,
                                            *(undefined1 (*) [32])((long)pvVar64 + lVar55));
                  auVar81 = vfmadd231ps_fma(auVar106,auVar102,auVar111);
                  auVar82 = vfmadd231ps_fma(auVar104,auVar102,auVar136);
                  auVar83 = vfmadd231ps_fma(auVar110,auVar107,auVar102);
                  auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar103,auVar111);
                  auVar81 = vfmadd231ps_fma(ZEXT1632(auVar81),auVar103,auVar136);
                  auVar82 = vfmadd231ps_fma(ZEXT1632(auVar82),auVar103,auVar107);
                  auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),auVar112,auVar103);
                  auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar137,auVar136);
                  auVar81 = vfmadd231ps_fma(ZEXT1632(auVar81),auVar137,auVar107);
                  auVar82 = vfmadd231ps_fma(ZEXT1632(auVar82),auVar137,auVar112);
                  auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),auVar137,
                                            *(undefined1 (*) [32])((long)pvVar64 + lVar55 + 0xa0));
                  *(undefined1 (*) [32])((long)pvVar69 + lVar55) = auVar113;
                  *(undefined1 (*) [32])((long)pvVar69 + lVar55 + 0x20) = auVar114;
                  *(undefined1 (*) [32])((long)pvVar69 + lVar55 + 0x40) = auVar115;
                  *(undefined1 (*) [32])((long)pvVar69 + lVar55 + 0x60) = auVar116;
                  *(undefined1 (*) [32])((long)pvVar38 + lVar55) = ZEXT1632(auVar90);
                  *(undefined1 (*) [32])((long)pvVar38 + lVar55 + 0x20) = ZEXT1632(auVar81);
                  *(undefined1 (*) [32])((long)pvVar38 + lVar55 + 0x40) = ZEXT1632(auVar82);
                  *(undefined1 (*) [32])((long)pvVar38 + lVar55 + 0x60) = ZEXT1632(auVar83);
                  lVar55 = lVar55 + 0x80;
                }
                for (; iVar53 + 1 < iVar33; iVar53 = iVar53 + 2) {
                  auVar111 = *(undefined1 (*) [32])((long)pvVar14 + lVar71);
                  auVar136 = *(undefined1 (*) [32])((long)pvVar14 + lVar71 + 0x20);
                  auVar102 = *(undefined1 (*) [32])((long)pvVar14 + lVar71 + 0x40);
                  auVar103 = *(undefined1 (*) [32])((long)pvVar14 + lVar71 + 0x60);
                  auVar90 = vfmadd213ps_fma(*(undefined1 (*) [32])((long)ppp_Var42 + lVar55),
                                            auVar111,auVar134);
                  auVar81 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar136,
                                            *(undefined1 (*) [32])((long)(ppp_Var42 + 4) + lVar55));
                  auVar90 = vfmadd213ps_fma(*(undefined1 (*) [32])((long)(ppp_Var42 + 4) + lVar55),
                                            auVar111,auVar134);
                  auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar136,
                                            *(undefined1 (*) [32])((long)(ppp_Var42 + 8) + lVar55));
                  auVar81 = vfmadd231ps_fma(ZEXT1632(auVar81),auVar102,
                                            *(undefined1 (*) [32])((long)(ppp_Var42 + 8) + lVar55));
                  auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar102,
                                            *(undefined1 (*) [32])((long)(ppp_Var42 + 0xc) + lVar55)
                                           );
                  auVar137 = *(undefined1 (*) [32])((long)pvVar14 + lVar71 + 0x80);
                  auVar107 = *(undefined1 (*) [32])((long)pvVar14 + lVar71 + 0xa0);
                  auVar112 = *(undefined1 (*) [32])((long)(ppp_Var43 + 4) + lVar55);
                  auVar113 = *(undefined1 (*) [32])((long)(ppp_Var43 + 8) + lVar55);
                  auVar82 = vfmadd231ps_fma(ZEXT1632(auVar81),auVar103,
                                            *(undefined1 (*) [32])((long)ppp_Var43 + lVar55));
                  auVar83 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar103,auVar112);
                  auVar90 = vfmadd213ps_fma(*(undefined1 (*) [32])((long)ppp_Var43 + lVar55),
                                            auVar111,auVar134);
                  auVar81 = vfmadd213ps_fma(auVar111,auVar112,auVar134);
                  auVar82 = vfmadd231ps_fma(ZEXT1632(auVar82),auVar137,auVar112);
                  auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),auVar137,auVar113);
                  auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar136,auVar112);
                  auVar81 = vfmadd231ps_fma(ZEXT1632(auVar81),auVar113,auVar136);
                  auVar82 = vfmadd231ps_fma(ZEXT1632(auVar82),auVar107,auVar113);
                  auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),auVar107,
                                            *(undefined1 (*) [32])((long)(ppp_Var43 + 0xc) + lVar55)
                                           );
                  auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar102,auVar113);
                  auVar81 = vfmadd231ps_fma(ZEXT1632(auVar81),auVar102,
                                            *(undefined1 (*) [32])((long)(ppp_Var43 + 0xc) + lVar55)
                                           );
                  auVar111 = *(undefined1 (*) [32])((long)pvVar14 + lVar71 + 0xc0);
                  auVar136 = *(undefined1 (*) [32])((long)pvVar14 + lVar71 + 0xe0);
                  auVar102 = *(undefined1 (*) [32])((long)pvVar14 + lVar71 + 0x100);
                  auVar112 = *(undefined1 (*) [32])((long)pvVar67 + lVar55 + 0x20);
                  auVar113 = *(undefined1 (*) [32])((long)pvVar67 + lVar55 + 0x40);
                  auVar114 = *(undefined1 (*) [32])((long)pvVar67 + lVar55 + 0x60);
                  auVar82 = vfmadd231ps_fma(ZEXT1632(auVar82),auVar111,
                                            *(undefined1 (*) [32])((long)pvVar67 + lVar55));
                  auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),auVar111,auVar112);
                  auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar103,
                                            *(undefined1 (*) [32])((long)pvVar67 + lVar55));
                  auVar81 = vfmadd231ps_fma(ZEXT1632(auVar81),auVar112,auVar103);
                  auVar82 = vfmadd231ps_fma(ZEXT1632(auVar82),auVar136,auVar112);
                  auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),auVar136,auVar113);
                  auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar137,auVar112);
                  auVar81 = vfmadd231ps_fma(ZEXT1632(auVar81),auVar113,auVar137);
                  auVar82 = vfmadd231ps_fma(ZEXT1632(auVar82),auVar102,auVar113);
                  auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),auVar102,auVar114);
                  auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar107,auVar113);
                  auVar81 = vfmadd231ps_fma(ZEXT1632(auVar81),auVar107,auVar114);
                  auVar103 = *(undefined1 (*) [32])((long)pvVar64 + lVar55 + 0x20);
                  auVar137 = *(undefined1 (*) [32])((long)pvVar64 + lVar55 + 0x40);
                  auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar111,
                                            *(undefined1 (*) [32])((long)pvVar64 + lVar55));
                  auVar81 = vfmadd231ps_fma(ZEXT1632(auVar81),auVar103,auVar111);
                  auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar136,auVar103);
                  auVar81 = vfmadd231ps_fma(ZEXT1632(auVar81),auVar137,auVar136);
                  auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar102,auVar137);
                  auVar81 = vfmadd231ps_fma(ZEXT1632(auVar81),auVar102,
                                            *(undefined1 (*) [32])((long)pvVar64 + lVar55 + 0x60));
                  *(undefined1 (*) [32])((long)pvVar69 + lVar55) = ZEXT1632(auVar82);
                  *(undefined1 (*) [32])((long)pvVar69 + lVar55 + 0x20) = ZEXT1632(auVar83);
                  *(undefined1 (*) [32])((long)pvVar38 + lVar55) = ZEXT1632(auVar90);
                  *(undefined1 (*) [32])((long)pvVar38 + lVar55 + 0x20) = ZEXT1632(auVar81);
                  lVar55 = lVar55 + 0x40;
                }
                for (; iVar53 < iVar33; iVar53 = iVar53 + 1) {
                  auVar111 = *(undefined1 (*) [32])((long)pvVar14 + lVar71 + 0x20);
                  auVar136 = *(undefined1 (*) [32])((long)pvVar14 + lVar71 + 0x40);
                  auVar90 = vfmadd213ps_fma(*(undefined1 (*) [32])((long)ppp_Var42 + lVar55),
                                            *(undefined1 (*) [32])((long)pvVar14 + lVar71),auVar134)
                  ;
                  auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar111,
                                            *(undefined1 (*) [32])((long)(ppp_Var42 + 4) + lVar55));
                  auVar102 = *(undefined1 (*) [32])((long)pvVar14 + lVar71 + 0x60);
                  auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar136,
                                            *(undefined1 (*) [32])((long)(ppp_Var42 + 8) + lVar55));
                  auVar103 = *(undefined1 (*) [32])((long)pvVar14 + lVar71 + 0x80);
                  auVar137 = *(undefined1 (*) [32])((long)pvVar14 + lVar71 + 0xa0);
                  auVar81 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar102,
                                            *(undefined1 (*) [32])((long)ppp_Var43 + lVar55));
                  auVar90 = vfmadd213ps_fma(*(undefined1 (*) [32])((long)ppp_Var43 + lVar55),
                                            *(undefined1 (*) [32])((long)pvVar14 + lVar71),auVar134)
                  ;
                  auVar81 = vfmadd231ps_fma(ZEXT1632(auVar81),auVar103,
                                            *(undefined1 (*) [32])((long)(ppp_Var43 + 4) + lVar55));
                  auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar111,
                                            *(undefined1 (*) [32])((long)(ppp_Var43 + 4) + lVar55));
                  auVar81 = vfmadd231ps_fma(ZEXT1632(auVar81),auVar137,
                                            *(undefined1 (*) [32])((long)(ppp_Var43 + 8) + lVar55));
                  auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar136,
                                            *(undefined1 (*) [32])((long)(ppp_Var43 + 8) + lVar55));
                  auVar111 = *(undefined1 (*) [32])((long)pvVar14 + lVar71 + 0xc0);
                  auVar136 = *(undefined1 (*) [32])((long)pvVar14 + lVar71 + 0xe0);
                  auVar107 = *(undefined1 (*) [32])((long)pvVar14 + lVar71 + 0x100);
                  auVar112 = *(undefined1 (*) [32])((long)pvVar67 + lVar55 + 0x20);
                  auVar113 = *(undefined1 (*) [32])((long)pvVar67 + lVar55 + 0x40);
                  auVar81 = vfmadd231ps_fma(ZEXT1632(auVar81),auVar111,
                                            *(undefined1 (*) [32])((long)pvVar67 + lVar55));
                  auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar102,
                                            *(undefined1 (*) [32])((long)pvVar67 + lVar55));
                  auVar81 = vfmadd231ps_fma(ZEXT1632(auVar81),auVar136,auVar112);
                  auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar103,auVar112);
                  auVar81 = vfmadd231ps_fma(ZEXT1632(auVar81),auVar107,auVar113);
                  auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar137,auVar113);
                  auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar111,
                                            *(undefined1 (*) [32])((long)pvVar64 + lVar55));
                  auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar136,
                                            *(undefined1 (*) [32])((long)pvVar64 + lVar55 + 0x20));
                  auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar107,
                                            *(undefined1 (*) [32])((long)pvVar64 + lVar55 + 0x40));
                  *(undefined1 (*) [32])((long)pvVar69 + lVar55) = ZEXT1632(auVar81);
                  *(undefined1 (*) [32])((long)pvVar38 + lVar55) = ZEXT1632(auVar90);
                  lVar55 = lVar55 + 0x20;
                }
                ppp_Var42 = (_func_int ***)((long)ppp_Var42 + lVar55 + lVar58);
                ppp_Var43 = (_func_int ***)((long)ppp_Var43 + lVar55 + lVar58);
                pvVar67 = (void *)((long)pvVar67 + lVar55 + lVar58);
                pvVar64 = (void *)((long)pvVar64 + lVar55 + lVar58);
                pvVar69 = (void *)((long)pvVar69 + lVar55 + lVar51);
                pvVar38 = (void *)((long)pvVar38 + lVar55 + lVar51);
              }
              for (; (int)uVar44 < iVar45; uVar44 = uVar44 + 1) {
                lVar55 = 0;
                for (iVar53 = 0; iVar53 + 3 < iVar33; iVar53 = iVar53 + 4) {
                  auVar111 = *(undefined1 (*) [32])((long)(ppp_Var42 + 8) + lVar55);
                  auVar136 = *(undefined1 (*) [32])((long)(ppp_Var42 + 0xc) + lVar55);
                  auVar102 = *(undefined1 (*) [32])((long)pvVar14 + lVar71);
                  auVar103 = *(undefined1 (*) [32])((long)pvVar14 + lVar71 + 0x20);
                  auVar137 = *(undefined1 (*) [32])((long)pvVar14 + lVar71 + 0x40);
                  auVar107 = *(undefined1 (*) [32])((long)pvVar14 + lVar71 + 0x60);
                  auVar90 = vfmadd213ps_fma(*(undefined1 (*) [32])((long)ppp_Var42 + lVar55),
                                            auVar102,auVar134);
                  auVar81 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar103,
                                            *(undefined1 (*) [32])((long)(ppp_Var42 + 4) + lVar55));
                  auVar90 = vfmadd213ps_fma(*(undefined1 (*) [32])((long)(ppp_Var42 + 4) + lVar55),
                                            auVar102,auVar134);
                  auVar82 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar103,auVar111);
                  auVar83 = vfmadd231ps_fma(ZEXT1632(auVar81),auVar137,auVar111);
                  auVar90 = vfmadd213ps_fma(auVar111,auVar102,auVar134);
                  auVar81 = vfmadd213ps_fma(auVar102,auVar136,auVar134);
                  auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar103,auVar136);
                  auVar81 = vfmadd231ps_fma(ZEXT1632(auVar81),
                                            *(undefined1 (*) [32])
                                             ((long)(ppp_Var42 + 0x10) + lVar55),auVar103);
                  auVar82 = vfmadd231ps_fma(ZEXT1632(auVar82),auVar137,auVar136);
                  auVar81 = vfmadd231ps_fma(ZEXT1632(auVar81),auVar137,
                                            *(undefined1 (*) [32])
                                             ((long)(ppp_Var42 + 0x14) + lVar55));
                  auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar137,
                                            *(undefined1 (*) [32])
                                             ((long)(ppp_Var42 + 0x10) + lVar55));
                  auVar111 = *(undefined1 (*) [32])((long)pvVar14 + lVar71 + 0x80);
                  auVar136 = *(undefined1 (*) [32])((long)pvVar14 + lVar71 + 0xa0);
                  auVar102 = *(undefined1 (*) [32])((long)(ppp_Var43 + 8) + lVar55);
                  auVar103 = *(undefined1 (*) [32])((long)(ppp_Var43 + 0xc) + lVar55);
                  auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),auVar107,
                                            *(undefined1 (*) [32])((long)ppp_Var43 + lVar55));
                  auVar82 = vfmadd231ps_fma(ZEXT1632(auVar82),auVar107,
                                            *(undefined1 (*) [32])((long)(ppp_Var43 + 4) + lVar55));
                  auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar107,auVar102);
                  auVar81 = vfmadd231ps_fma(ZEXT1632(auVar81),auVar103,auVar107);
                  auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),auVar111,
                                            *(undefined1 (*) [32])((long)(ppp_Var43 + 4) + lVar55));
                  auVar82 = vfmadd231ps_fma(ZEXT1632(auVar82),auVar111,auVar102);
                  auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar111,auVar103);
                  auVar81 = vfmadd231ps_fma(ZEXT1632(auVar81),
                                            *(undefined1 (*) [32])
                                             ((long)(ppp_Var43 + 0x10) + lVar55),auVar111);
                  auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),auVar136,auVar102);
                  auVar82 = vfmadd231ps_fma(ZEXT1632(auVar82),auVar136,auVar103);
                  auVar81 = vfmadd231ps_fma(ZEXT1632(auVar81),auVar136,
                                            *(undefined1 (*) [32])
                                             ((long)(ppp_Var43 + 0x14) + lVar55));
                  auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar136,
                                            *(undefined1 (*) [32])
                                             ((long)(ppp_Var43 + 0x10) + lVar55));
                  auVar111 = *(undefined1 (*) [32])((long)pvVar14 + lVar71 + 0xc0);
                  auVar136 = *(undefined1 (*) [32])((long)pvVar14 + lVar71 + 0xe0);
                  auVar102 = *(undefined1 (*) [32])((long)pvVar14 + lVar71 + 0x100);
                  auVar103 = *(undefined1 (*) [32])((long)pvVar67 + lVar55 + 0x20);
                  auVar137 = *(undefined1 (*) [32])((long)pvVar67 + lVar55 + 0x40);
                  auVar107 = *(undefined1 (*) [32])((long)pvVar67 + lVar55 + 0x60);
                  auVar112 = *(undefined1 (*) [32])((long)pvVar67 + lVar55 + 0x80);
                  auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),auVar111,
                                            *(undefined1 (*) [32])((long)pvVar67 + lVar55));
                  auVar82 = vfmadd231ps_fma(ZEXT1632(auVar82),auVar111,auVar103);
                  auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar111,auVar137);
                  auVar81 = vfmadd231ps_fma(ZEXT1632(auVar81),auVar107,auVar111);
                  auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),auVar136,auVar103);
                  auVar82 = vfmadd231ps_fma(ZEXT1632(auVar82),auVar136,auVar137);
                  auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar136,auVar107);
                  auVar81 = vfmadd231ps_fma(ZEXT1632(auVar81),auVar112,auVar136);
                  auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),auVar102,auVar137);
                  auVar82 = vfmadd231ps_fma(ZEXT1632(auVar82),auVar102,auVar107);
                  auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar102,auVar112);
                  auVar81 = vfmadd231ps_fma(ZEXT1632(auVar81),auVar102,
                                            *(undefined1 (*) [32])((long)pvVar67 + lVar55 + 0xa0));
                  *(undefined1 (*) [32])((long)pvVar69 + lVar55) = ZEXT1632(auVar83);
                  *(undefined1 (*) [32])((long)pvVar69 + lVar55 + 0x20) = ZEXT1632(auVar82);
                  *(undefined1 (*) [32])((long)pvVar69 + lVar55 + 0x40) = ZEXT1632(auVar90);
                  *(undefined1 (*) [32])((long)pvVar69 + lVar55 + 0x60) = ZEXT1632(auVar81);
                  lVar55 = lVar55 + 0x80;
                }
                for (; iVar53 + 1 < iVar33; iVar53 = iVar53 + 2) {
                  auVar111 = *(undefined1 (*) [32])((long)pvVar14 + lVar71 + 0x20);
                  auVar136 = *(undefined1 (*) [32])((long)pvVar14 + lVar71 + 0x40);
                  auVar102 = *(undefined1 (*) [32])((long)pvVar14 + lVar71 + 0x60);
                  auVar90 = vfmadd213ps_fma(*(undefined1 (*) [32])((long)ppp_Var42 + lVar55),
                                            *(undefined1 (*) [32])((long)pvVar14 + lVar71),auVar134)
                  ;
                  auVar81 = vfmadd213ps_fma(*(undefined1 (*) [32])((long)pvVar14 + lVar71),
                                            *(undefined1 (*) [32])((long)(ppp_Var42 + 4) + lVar55),
                                            auVar134);
                  auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar111,
                                            *(undefined1 (*) [32])((long)(ppp_Var42 + 4) + lVar55));
                  auVar81 = vfmadd231ps_fma(ZEXT1632(auVar81),
                                            *(undefined1 (*) [32])((long)(ppp_Var42 + 8) + lVar55),
                                            auVar111);
                  auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar136,
                                            *(undefined1 (*) [32])((long)(ppp_Var42 + 8) + lVar55));
                  auVar81 = vfmadd231ps_fma(ZEXT1632(auVar81),auVar136,
                                            *(undefined1 (*) [32])((long)(ppp_Var42 + 0xc) + lVar55)
                                           );
                  auVar111 = *(undefined1 (*) [32])((long)pvVar14 + lVar71 + 0x80);
                  auVar136 = *(undefined1 (*) [32])((long)pvVar14 + lVar71 + 0xa0);
                  auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar102,
                                            *(undefined1 (*) [32])((long)ppp_Var43 + lVar55));
                  auVar81 = vfmadd231ps_fma(ZEXT1632(auVar81),
                                            *(undefined1 (*) [32])((long)(ppp_Var43 + 4) + lVar55),
                                            auVar102);
                  auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar111,
                                            *(undefined1 (*) [32])((long)(ppp_Var43 + 4) + lVar55));
                  auVar81 = vfmadd231ps_fma(ZEXT1632(auVar81),
                                            *(undefined1 (*) [32])((long)(ppp_Var43 + 8) + lVar55),
                                            auVar111);
                  auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar136,
                                            *(undefined1 (*) [32])((long)(ppp_Var43 + 8) + lVar55));
                  auVar81 = vfmadd231ps_fma(ZEXT1632(auVar81),auVar136,
                                            *(undefined1 (*) [32])((long)(ppp_Var43 + 0xc) + lVar55)
                                           );
                  auVar111 = *(undefined1 (*) [32])((long)pvVar14 + lVar71 + 0xc0);
                  auVar136 = *(undefined1 (*) [32])((long)pvVar14 + lVar71 + 0xe0);
                  auVar102 = *(undefined1 (*) [32])((long)pvVar14 + lVar71 + 0x100);
                  auVar103 = *(undefined1 (*) [32])((long)pvVar67 + lVar55 + 0x20);
                  auVar137 = *(undefined1 (*) [32])((long)pvVar67 + lVar55 + 0x40);
                  auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar111,
                                            *(undefined1 (*) [32])((long)pvVar67 + lVar55));
                  auVar81 = vfmadd231ps_fma(ZEXT1632(auVar81),auVar103,auVar111);
                  auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar136,auVar103);
                  auVar81 = vfmadd231ps_fma(ZEXT1632(auVar81),auVar137,auVar136);
                  auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar102,auVar137);
                  auVar81 = vfmadd231ps_fma(ZEXT1632(auVar81),auVar102,
                                            *(undefined1 (*) [32])((long)pvVar67 + lVar55 + 0x60));
                  *(undefined1 (*) [32])((long)pvVar69 + lVar55) = ZEXT1632(auVar90);
                  *(undefined1 (*) [32])((long)pvVar69 + lVar55 + 0x20) = ZEXT1632(auVar81);
                  lVar55 = lVar55 + 0x40;
                }
                for (; iVar53 < iVar33; iVar53 = iVar53 + 1) {
                  auVar90 = vfmadd132ps_fma(*(undefined1 (*) [32])((long)pvVar14 + lVar71),auVar134,
                                            *(undefined1 (*) [32])((long)ppp_Var42 + lVar55));
                  auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),
                                            *(undefined1 (*) [32])((long)pvVar14 + lVar71 + 0x20),
                                            *(undefined1 (*) [32])((long)(ppp_Var42 + 4) + lVar55));
                  auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),
                                            *(undefined1 (*) [32])((long)pvVar14 + lVar71 + 0x40),
                                            *(undefined1 (*) [32])((long)(ppp_Var42 + 8) + lVar55));
                  auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),
                                            *(undefined1 (*) [32])((long)pvVar14 + lVar71 + 0x60),
                                            *(undefined1 (*) [32])((long)ppp_Var43 + lVar55));
                  auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),
                                            *(undefined1 (*) [32])((long)pvVar14 + lVar71 + 0x80),
                                            *(undefined1 (*) [32])((long)(ppp_Var43 + 4) + lVar55));
                  auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),
                                            *(undefined1 (*) [32])((long)pvVar14 + lVar71 + 0xa0),
                                            *(undefined1 (*) [32])((long)(ppp_Var43 + 8) + lVar55));
                  auVar90 = vfmadd132ps_fma(*(undefined1 (*) [32])((long)pvVar14 + lVar71 + 0xc0),
                                            ZEXT1632(auVar90),
                                            *(undefined1 (*) [32])((long)pvVar67 + lVar55));
                  auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),
                                            *(undefined1 (*) [32])((long)pvVar14 + lVar71 + 0xe0),
                                            *(undefined1 (*) [32])((long)pvVar67 + lVar55 + 0x20));
                  auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),
                                            *(undefined1 (*) [32])((long)pvVar14 + lVar71 + 0x100),
                                            *(undefined1 (*) [32])((long)pvVar67 + lVar55 + 0x40));
                  *(undefined1 (*) [32])((long)pvVar69 + lVar55) = ZEXT1632(auVar90);
                  lVar55 = lVar55 + 0x20;
                }
                ppp_Var42 = (_func_int ***)((long)(ppp_Var42 + 8) + lVar55);
                ppp_Var43 = (_func_int ***)((long)(ppp_Var43 + 8) + lVar55);
                pvVar67 = (void *)((long)pvVar67 + lVar55 + 0x40);
                pvVar69 = (void *)((long)pvVar69 + lVar55);
              }
            }
          }
          else {
            iVar37 = 3;
            if ((((*(int *)(&this->field_0xdc + (long)p_Var40) != 1) ||
                 (*(int *)(&this->field_0xe0 + (long)p_Var40) != 1)) ||
                (*(int *)(&this->field_0xe4 + (long)p_Var40) != 2)) ||
               (*(int *)(&this->field_0xe8 + (long)p_Var40) != 2)) goto LAB_003dd4db;
            iVar33 = top_blob->w;
            lVar56 = *(long *)(&this->field_0x1b0 + (long)p_Var40);
            uVar72 = 0;
            uVar66 = (ulong)(uint)top_blob->h;
            if (top_blob->h < 1) {
              uVar66 = uVar72;
            }
            uVar44 = local_218.c;
            if (local_218.c < 1) {
              uVar44 = 0;
            }
            lVar51 = (long)((local_218.w - iVar33) * 0x10) * 4;
            for (; uVar72 != uVar44; uVar72 = uVar72 + 1) {
              if (lVar56 == 0) {
                auVar134 = ZEXT1632(ZEXT816(0) << 0x40);
              }
              else {
                auVar134 = *(undefined1 (*) [32])(lVar56 + uVar72 * 0x20);
              }
              pauVar62 = (undefined1 (*) [32])
                         (top_blob->cstep * uVar72 * top_blob->elemsize + (long)top_blob->data);
              pvVar14 = (this->weight_data_tm).data;
              lVar58 = (long)(this->weight_data_tm).w * uVar72 * (this->weight_data_tm).elemsize;
              ppp_Var42 = (_func_int ***)
                          ((long)(_func_int ***)local_218.data +
                          local_218.cstep * uVar72 * local_218.elemsize);
              ppp_Var43 = (_func_int ***)((long)ppp_Var42 + (long)local_218.w * local_218.elemsize);
              pvVar67 = (void *)((long)ppp_Var42 + (long)local_218.w * local_218.elemsize * 2);
              auVar111 = *(undefined1 (*) [32])((long)pvVar14 + lVar58);
              auVar136 = *(undefined1 (*) [32])((long)pvVar14 + lVar58 + 0x20);
              auVar102 = *(undefined1 (*) [32])((long)pvVar14 + lVar58 + 0x40);
              auVar103 = *(undefined1 (*) [32])((long)pvVar14 + lVar58 + 0x60);
              auVar137 = *(undefined1 (*) [32])((long)pvVar14 + lVar58 + 0x80);
              auVar107 = *(undefined1 (*) [32])((long)pvVar14 + lVar58 + 0xa0);
              auVar112 = *(undefined1 (*) [32])((long)pvVar14 + lVar58 + 0xc0);
              auVar113 = *(undefined1 (*) [32])((long)pvVar14 + lVar58 + 0xe0);
              auVar114 = *(undefined1 (*) [32])((long)pvVar14 + lVar58 + 0x100);
              for (iVar45 = 0; iVar45 != (int)uVar66; iVar45 = iVar45 + 1) {
                lVar58 = 0;
                for (iVar53 = 0; iVar53 + 3 < iVar33; iVar53 = iVar53 + 4) {
                  auVar90 = vfmadd213ps_fma(*(undefined1 (*) [32])((long)ppp_Var42 + lVar58),
                                            auVar111,auVar134);
                  auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar136,
                                            *(undefined1 (*) [32])((long)(ppp_Var42 + 4) + lVar58));
                  auVar82 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar102,
                                            *(undefined1 (*) [32])((long)(ppp_Var42 + 8) + lVar58));
                  auVar90 = vfmadd213ps_fma(*(undefined1 (*) [32])((long)(ppp_Var42 + 8) + lVar58),
                                            auVar111,auVar134);
                  auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar136,
                                            *(undefined1 (*) [32])((long)(ppp_Var42 + 0xc) + lVar58)
                                           );
                  auVar83 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar102,
                                            *(undefined1 (*) [32])
                                             ((long)(ppp_Var42 + 0x10) + lVar58));
                  auVar90 = vfmadd213ps_fma(*(undefined1 (*) [32])
                                             ((long)(ppp_Var42 + 0x10) + lVar58),auVar111,auVar134);
                  auVar81 = vfmadd213ps_fma(*(undefined1 (*) [32])
                                             ((long)(ppp_Var42 + 0x18) + lVar58),auVar111,auVar134);
                  auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar136,
                                            *(undefined1 (*) [32])
                                             ((long)(ppp_Var42 + 0x14) + lVar58));
                  auVar81 = vfmadd231ps_fma(ZEXT1632(auVar81),auVar136,
                                            *(undefined1 (*) [32])
                                             ((long)(ppp_Var42 + 0x1c) + lVar58));
                  auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar102,
                                            *(undefined1 (*) [32])
                                             ((long)(ppp_Var42 + 0x18) + lVar58));
                  auVar81 = vfmadd231ps_fma(ZEXT1632(auVar81),auVar102,
                                            *(undefined1 (*) [32])
                                             ((long)(ppp_Var42 + 0x20) + lVar58));
                  auVar82 = vfmadd231ps_fma(ZEXT1632(auVar82),auVar103,
                                            *(undefined1 (*) [32])((long)ppp_Var43 + lVar58));
                  auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),auVar103,
                                            *(undefined1 (*) [32])((long)(ppp_Var43 + 8) + lVar58));
                  auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar103,
                                            *(undefined1 (*) [32])
                                             ((long)(ppp_Var43 + 0x10) + lVar58));
                  auVar82 = vfmadd231ps_fma(ZEXT1632(auVar82),auVar137,
                                            *(undefined1 (*) [32])((long)(ppp_Var43 + 4) + lVar58));
                  auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),auVar137,
                                            *(undefined1 (*) [32])((long)(ppp_Var43 + 0xc) + lVar58)
                                           );
                  auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar137,
                                            *(undefined1 (*) [32])
                                             ((long)(ppp_Var43 + 0x14) + lVar58));
                  auVar115 = vfmadd231ps_avx512vl
                                       (ZEXT1632(auVar81),auVar103,
                                        *(undefined1 (*) [32])((long)(ppp_Var43 + 0x18) + lVar58));
                  auVar81 = vfmadd231ps_fma(auVar115,auVar137,
                                            *(undefined1 (*) [32])
                                             ((long)(ppp_Var43 + 0x1c) + lVar58));
                  auVar82 = vfmadd231ps_fma(ZEXT1632(auVar82),auVar107,
                                            *(undefined1 (*) [32])((long)(ppp_Var43 + 8) + lVar58));
                  auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),auVar107,
                                            *(undefined1 (*) [32])
                                             ((long)(ppp_Var43 + 0x10) + lVar58));
                  auVar105 = vfmadd231ps_avx512vl
                                       (ZEXT1632(auVar90),auVar107,
                                        *(undefined1 (*) [32])((long)(ppp_Var43 + 0x18) + lVar58));
                  auVar90 = vfmadd231ps_fma(ZEXT1632(auVar81),auVar107,
                                            *(undefined1 (*) [32])
                                             ((long)(ppp_Var43 + 0x20) + lVar58));
                  auVar115 = *(undefined1 (*) [32])((long)pvVar67 + lVar58 + 0x40);
                  auVar116 = *(undefined1 (*) [32])((long)pvVar67 + lVar58 + 0x80);
                  auVar81 = vfmadd231ps_fma(ZEXT1632(auVar82),auVar112,
                                            *(undefined1 (*) [32])((long)pvVar67 + lVar58));
                  auVar104 = *(undefined1 (*) [32])((long)pvVar67 + lVar58 + 0xc0);
                  auVar82 = vfmadd231ps_fma(ZEXT1632(auVar83),auVar112,auVar115);
                  auVar83 = vfmadd231ps_fma(auVar105,auVar112,auVar116);
                  auVar105 = vfmadd231ps_avx512vl(ZEXT1632(auVar90),auVar112,auVar104);
                  auVar90 = vfmadd231ps_fma(ZEXT1632(auVar81),auVar113,
                                            *(undefined1 (*) [32])((long)pvVar67 + lVar58 + 0x20));
                  auVar81 = vfmadd231ps_fma(ZEXT1632(auVar82),auVar113,
                                            *(undefined1 (*) [32])((long)pvVar67 + lVar58 + 0x60));
                  auVar82 = vfmadd231ps_fma(ZEXT1632(auVar83),auVar113,
                                            *(undefined1 (*) [32])((long)pvVar67 + lVar58 + 0xa0));
                  auVar83 = vfmadd231ps_fma(auVar105,auVar113,
                                            *(undefined1 (*) [32])((long)pvVar67 + lVar58 + 0xe0));
                  auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar114,auVar115);
                  auVar81 = vfmadd231ps_fma(ZEXT1632(auVar81),auVar114,auVar116);
                  auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),auVar114,
                                            *(undefined1 (*) [32])((long)pvVar67 + lVar58 + 0x100));
                  auVar115 = vfmadd231ps_avx512vl(ZEXT1632(auVar82),auVar114,auVar104);
                  *pauVar62 = ZEXT1632(auVar90);
                  pauVar62[1] = ZEXT1632(auVar81);
                  pauVar62[2] = auVar115;
                  pauVar62[3] = ZEXT1632(auVar83);
                  pauVar62 = pauVar62 + 4;
                  lVar58 = lVar58 + 0x100;
                }
                for (; iVar53 + 1 < iVar33; iVar53 = iVar53 + 2) {
                  auVar90 = vfmadd213ps_fma(*(undefined1 (*) [32])((long)ppp_Var42 + lVar58),
                                            auVar111,auVar134);
                  auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar136,
                                            *(undefined1 (*) [32])((long)(ppp_Var42 + 4) + lVar58));
                  auVar81 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar102,
                                            *(undefined1 (*) [32])((long)(ppp_Var42 + 8) + lVar58));
                  auVar90 = vfmadd213ps_fma(*(undefined1 (*) [32])((long)(ppp_Var42 + 8) + lVar58),
                                            auVar111,auVar134);
                  auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar136,
                                            *(undefined1 (*) [32])((long)(ppp_Var42 + 0xc) + lVar58)
                                           );
                  auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar102,
                                            *(undefined1 (*) [32])
                                             ((long)(ppp_Var42 + 0x10) + lVar58));
                  auVar81 = vfmadd231ps_fma(ZEXT1632(auVar81),auVar103,
                                            *(undefined1 (*) [32])((long)ppp_Var43 + lVar58));
                  auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar103,
                                            *(undefined1 (*) [32])((long)(ppp_Var43 + 8) + lVar58));
                  auVar81 = vfmadd231ps_fma(ZEXT1632(auVar81),auVar137,
                                            *(undefined1 (*) [32])((long)(ppp_Var43 + 4) + lVar58));
                  auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar137,
                                            *(undefined1 (*) [32])((long)(ppp_Var43 + 0xc) + lVar58)
                                           );
                  auVar81 = vfmadd231ps_fma(ZEXT1632(auVar81),auVar107,
                                            *(undefined1 (*) [32])((long)(ppp_Var43 + 8) + lVar58));
                  auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar107,
                                            *(undefined1 (*) [32])
                                             ((long)(ppp_Var43 + 0x10) + lVar58));
                  auVar115 = *(undefined1 (*) [32])((long)pvVar67 + lVar58 + 0x40);
                  auVar81 = vfmadd231ps_fma(ZEXT1632(auVar81),auVar112,
                                            *(undefined1 (*) [32])((long)pvVar67 + lVar58));
                  auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar112,auVar115);
                  auVar81 = vfmadd231ps_fma(ZEXT1632(auVar81),auVar113,
                                            *(undefined1 (*) [32])((long)pvVar67 + lVar58 + 0x20));
                  auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar113,
                                            *(undefined1 (*) [32])((long)pvVar67 + lVar58 + 0x60));
                  auVar81 = vfmadd231ps_fma(ZEXT1632(auVar81),auVar114,auVar115);
                  auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar114,
                                            *(undefined1 (*) [32])((long)pvVar67 + lVar58 + 0x80));
                  *pauVar62 = ZEXT1632(auVar81);
                  pauVar62[1] = ZEXT1632(auVar90);
                  pauVar62 = pauVar62 + 2;
                  lVar58 = lVar58 + 0x80;
                }
                for (; iVar53 < iVar33; iVar53 = iVar53 + 1) {
                  auVar90 = vfmadd213ps_fma(*(undefined1 (*) [32])((long)ppp_Var42 + lVar58),
                                            auVar111,auVar134);
                  auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar136,
                                            *(undefined1 (*) [32])((long)(ppp_Var42 + 4) + lVar58));
                  auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar102,
                                            *(undefined1 (*) [32])((long)(ppp_Var42 + 8) + lVar58));
                  auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar103,
                                            *(undefined1 (*) [32])((long)ppp_Var43 + lVar58));
                  auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar137,
                                            *(undefined1 (*) [32])((long)(ppp_Var43 + 4) + lVar58));
                  auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar107,
                                            *(undefined1 (*) [32])((long)(ppp_Var43 + 8) + lVar58));
                  auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar112,
                                            *(undefined1 (*) [32])((long)pvVar67 + lVar58));
                  auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar113,
                                            *(undefined1 (*) [32])((long)pvVar67 + lVar58 + 0x20));
                  auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar114,
                                            *(undefined1 (*) [32])((long)pvVar67 + lVar58 + 0x40));
                  *pauVar62 = ZEXT1632(auVar90);
                  pauVar62 = pauVar62 + 1;
                  lVar58 = lVar58 + 0x40;
                }
                ppp_Var42 = (_func_int ***)((long)ppp_Var42 + lVar58 + lVar51);
                ppp_Var43 = (_func_int ***)((long)ppp_Var43 + lVar58 + lVar51);
                pvVar67 = (void *)((long)pvVar67 + lVar58 + lVar51);
              }
            }
          }
          goto LAB_003dd74c;
        }
LAB_003dd4db:
        uVar41 = iVar37 * iVar33;
        std::vector<int,_std::allocator<int>_>::vector
                  (&_space_ofs,(long)(int)uVar41,(allocator_type *)&opt_p);
        pp_Var17 = this->_vptr_ConvolutionDepthWise_x86_avx512;
        p_Var40 = pp_Var17[-3];
        iVar33 = *(int *)(&this->field_0xe0 + (long)p_Var40);
        iVar37 = *(int *)(&this->field_0xdc + (long)p_Var40);
        iVar11 = *(int *)(&this->field_0xd4 + (long)p_Var40);
        lVar56 = 0;
        iVar49 = 0;
        for (iVar54 = 0; iVar54 < *(int *)(&this->field_0xd8 + (long)p_Var40); iVar54 = iVar54 + 1)
        {
          for (lVar51 = 0; (int)lVar51 < *(int *)(&this->field_0xd4 + (long)p_Var40);
              lVar51 = lVar51 + 1) {
            _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
            ._M_start[(int)lVar56 + lVar51] = iVar49;
            p_Var40 = pp_Var17[-3];
            iVar49 = iVar49 + *(int *)(&this->field_0xdc + (long)p_Var40);
          }
          iVar49 = iVar49 + (iVar31 * iVar33 - iVar37 * iVar11);
          lVar56 = (int)lVar56 + lVar51;
        }
        local_1d0 = CONCAT44(local_1d0._4_4_,uVar41 * 8);
        uVar50 = 0;
        uVar66 = (ulong)uVar41;
        if ((int)uVar41 < 1) {
          uVar66 = uVar50;
        }
        if ((int)uVar44 < 1) {
          uVar72 = uVar50;
        }
        for (uVar70 = 0; uVar70 != uVar72; uVar70 = uVar70 + 1) {
          pvVar67 = (void *)(top_blob->cstep * uVar70 * top_blob->elemsize + (long)top_blob->data);
          pvVar14 = (this->weight_data_tm).data;
          for (iVar33 = 0; iVar33 <= iVar53; iVar33 = iVar33 + 1) {
            pp_Var17 = this->_vptr_ConvolutionDepthWise_x86_avx512;
            for (lVar56 = 0; lVar56 <= iVar45; lVar56 = lVar56 + 1) {
              p_Var40 = pp_Var17[-3];
              if (*(int *)(&this->field_0x100 + (long)p_Var40) == 0) {
                auVar133 = ZEXT1664(ZEXT816(0) << 0x40);
              }
              else {
                auVar133 = ZEXT3264(*(undefined1 (*) [32])
                                     (*(long *)(&this->field_0x1b0 + (long)p_Var40) + uVar70 * 0x20)
                                   );
              }
              for (lVar51 = 0; uVar66 * 4 != lVar51; lVar51 = lVar51 + 4) {
                auVar90 = vfmadd231ps_fma(auVar133._0_32_,
                                          *(undefined1 (*) [32])
                                           ((long)&((Allocator *)
                                                   ((long)local_218.data +
                                                   (long)*(int *)((long)_space_ofs.
                                                                                                                                                
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start + lVar51)
                                                  * 4 * 8))->_vptr_Allocator +
                                           (long)(*(int *)(&this->field_0xe4 + (long)p_Var40) *
                                                  (int)lVar56 * 8) * 4 +
                                           (long)iVar33 *
                                           (long)*(int *)(&this->field_0xe8 + (long)p_Var40) *
                                           (long)local_218.w * local_218.elemsize +
                                           local_218.cstep * uVar70 * local_218.elemsize),
                                          *(undefined1 (*) [32])
                                           ((long)pvVar14 + lVar51 * 8 + (long)(int)uVar50 * 4));
                auVar133 = ZEXT1664(auVar90);
              }
              *(undefined1 (*) [32])((long)pvVar67 + lVar56 * 0x20) = auVar133._0_32_;
            }
            pvVar67 = (void *)((long)pvVar67 + (long)(iVar48 * 8) * 4);
          }
          uVar50 = (ulong)((int)uVar50 + uVar41 * 8);
        }
        pLVar18 = this->activation;
        if (pLVar18 != (Layer *)0x0) {
          (*pLVar18->_vptr_Layer[9])(pLVar18,top_blob,opt);
        }
      }
      else {
        if (iVar33 != 0x10) goto LAB_003db252;
        iVar33 = *(int *)(&this->field_0xd4 + (long)p_Var40);
        iVar37 = *(int *)(&this->field_0xd8 + (long)p_Var40);
        if (iVar33 == 5) {
          if (iVar37 == 5) {
            if (((*(int *)(&this->field_0xdc + (long)p_Var40) == 1) &&
                (*(int *)(&this->field_0xe0 + (long)p_Var40) == 1)) &&
               ((*(int *)(&this->field_0xe4 + (long)p_Var40) == 1 &&
                (*(int *)(&this->field_0xe8 + (long)p_Var40) == 1)))) {
              uVar72 = 0;
              uVar66 = (ulong)(uint)top_blob->w;
              if (top_blob->w < 1) {
                uVar66 = uVar72;
              }
              lVar56 = *(long *)(&this->field_0x1b0 + (long)p_Var40);
              uVar50 = (ulong)(uint)top_blob->h;
              if (top_blob->h < 1) {
                uVar50 = uVar72;
              }
              uVar70 = (ulong)(uint)local_218.c;
              if (local_218.c < 1) {
                uVar70 = uVar72;
              }
              for (; uVar72 != uVar70; uVar72 = uVar72 + 1) {
                if (lVar56 == 0) {
                  auVar133 = ZEXT1664(ZEXT816(0) << 0x40);
                }
                else {
                  auVar133 = *(undefined1 (*) [64])(lVar56 + uVar72 * 0x40);
                }
                pvVar38 = (void *)(top_blob->cstep * uVar72 * top_blob->elemsize +
                                  (long)top_blob->data);
                pvVar14 = (this->weight_data_tm).data;
                lVar58 = (long)(this->weight_data_tm).w * uVar72 * (this->weight_data_tm).elemsize;
                ppp_Var42 = (_func_int ***)
                            ((long)(_func_int ***)local_218.data +
                            local_218.cstep * uVar72 * local_218.elemsize);
                lVar51 = (long)local_218.w * local_218.elemsize;
                ppp_Var43 = (_func_int ***)((long)ppp_Var42 + lVar51);
                pvVar67 = (void *)((long)ppp_Var42 + lVar51 * 2);
                pvVar64 = (void *)((long)ppp_Var42 + lVar51 * 3);
                piVar46 = (pointer)((long)ppp_Var42 + lVar51 * 4);
                for (iVar33 = 0; iVar33 != (int)uVar50; iVar33 = iVar33 + 1) {
                  lVar51 = 0;
                  uVar35 = uVar66;
                  while (iVar45 = (int)uVar35, uVar35 = (ulong)(iVar45 - 1), iVar45 != 0) {
                    auVar130 = vfmadd132ps_avx512f(*(undefined1 (*) [64])((long)pvVar14 + lVar58),
                                                   auVar133,*(undefined1 (*) [64])
                                                             ((long)ppp_Var42 + lVar51));
                    auVar130 = vfmadd231ps_avx512f(auVar130,*(undefined1 (*) [64])
                                                             ((long)pvVar14 + lVar58 + 0x40),
                                                   *(undefined1 (*) [64])
                                                    ((long)(ppp_Var42 + 8) + lVar51));
                    auVar130 = vfmadd231ps_avx512f(auVar130,*(undefined1 (*) [64])
                                                             ((long)pvVar14 + lVar58 + 0x80),
                                                   *(undefined1 (*) [64])
                                                    ((long)(ppp_Var42 + 0x10) + lVar51));
                    auVar130 = vfmadd231ps_avx512f(auVar130,*(undefined1 (*) [64])
                                                             ((long)pvVar14 + lVar58 + 0xc0),
                                                   *(undefined1 (*) [64])
                                                    ((long)(ppp_Var42 + 0x18) + lVar51));
                    auVar130 = vfmadd231ps_avx512f(auVar130,*(undefined1 (*) [64])
                                                             ((long)pvVar14 + lVar58 + 0x100),
                                                   *(undefined1 (*) [64])
                                                    ((long)(ppp_Var42 + 0x20) + lVar51));
                    auVar130 = vfmadd132ps_avx512f(*(undefined1 (*) [64])
                                                    ((long)pvVar14 + lVar58 + 0x140),auVar130,
                                                   *(undefined1 (*) [64])((long)ppp_Var43 + lVar51))
                    ;
                    auVar130 = vfmadd231ps_avx512f(auVar130,*(undefined1 (*) [64])
                                                             ((long)pvVar14 + lVar58 + 0x180),
                                                   *(undefined1 (*) [64])
                                                    ((long)(ppp_Var43 + 8) + lVar51));
                    auVar130 = vfmadd231ps_avx512f(auVar130,*(undefined1 (*) [64])
                                                             ((long)pvVar14 + lVar58 + 0x1c0),
                                                   *(undefined1 (*) [64])
                                                    ((long)(ppp_Var43 + 0x10) + lVar51));
                    auVar130 = vfmadd231ps_avx512f(auVar130,*(undefined1 (*) [64])
                                                             ((long)pvVar14 + lVar58 + 0x200),
                                                   *(undefined1 (*) [64])
                                                    ((long)(ppp_Var43 + 0x18) + lVar51));
                    auVar130 = vfmadd231ps_avx512f(auVar130,*(undefined1 (*) [64])
                                                             ((long)pvVar14 + lVar58 + 0x240),
                                                   *(undefined1 (*) [64])
                                                    ((long)(ppp_Var43 + 0x20) + lVar51));
                    auVar130 = vfmadd132ps_avx512f(*(undefined1 (*) [64])
                                                    ((long)pvVar14 + lVar58 + 0x280),auVar130,
                                                   *(undefined1 (*) [64])((long)pvVar67 + lVar51));
                    auVar130 = vfmadd231ps_avx512f(auVar130,*(undefined1 (*) [64])
                                                             ((long)pvVar14 + lVar58 + 0x2c0),
                                                   *(undefined1 (*) [64])
                                                    ((long)pvVar67 + lVar51 + 0x40));
                    auVar130 = vfmadd231ps_avx512f(auVar130,*(undefined1 (*) [64])
                                                             ((long)pvVar14 + lVar58 + 0x300),
                                                   *(undefined1 (*) [64])
                                                    ((long)pvVar67 + lVar51 + 0x80));
                    auVar130 = vfmadd231ps_avx512f(auVar130,*(undefined1 (*) [64])
                                                             ((long)pvVar14 + lVar58 + 0x340),
                                                   *(undefined1 (*) [64])
                                                    ((long)pvVar67 + lVar51 + 0xc0));
                    auVar130 = vfmadd231ps_avx512f(auVar130,*(undefined1 (*) [64])
                                                             ((long)pvVar14 + lVar58 + 0x380),
                                                   *(undefined1 (*) [64])
                                                    ((long)pvVar67 + lVar51 + 0x100));
                    auVar130 = vfmadd132ps_avx512f(*(undefined1 (*) [64])
                                                    ((long)pvVar14 + lVar58 + 0x3c0),auVar130,
                                                   *(undefined1 (*) [64])((long)pvVar64 + lVar51));
                    auVar130 = vfmadd231ps_avx512f(auVar130,*(undefined1 (*) [64])
                                                             ((long)pvVar14 + lVar58 + 0x400),
                                                   *(undefined1 (*) [64])
                                                    ((long)pvVar64 + lVar51 + 0x40));
                    auVar130 = vfmadd231ps_avx512f(auVar130,*(undefined1 (*) [64])
                                                             ((long)pvVar14 + lVar58 + 0x440),
                                                   *(undefined1 (*) [64])
                                                    ((long)pvVar64 + lVar51 + 0x80));
                    auVar130 = vfmadd231ps_avx512f(auVar130,*(undefined1 (*) [64])
                                                             ((long)pvVar14 + lVar58 + 0x480),
                                                   *(undefined1 (*) [64])
                                                    ((long)pvVar64 + lVar51 + 0xc0));
                    auVar130 = vfmadd231ps_avx512f(auVar130,*(undefined1 (*) [64])
                                                             ((long)pvVar14 + lVar58 + 0x4c0),
                                                   *(undefined1 (*) [64])
                                                    ((long)pvVar64 + lVar51 + 0x100));
                    auVar130 = vfmadd132ps_avx512f(*(undefined1 (*) [64])
                                                    ((long)pvVar14 + lVar58 + 0x500),auVar130,
                                                   *(undefined1 (*) [64])((long)piVar46 + lVar51));
                    auVar130 = vfmadd231ps_avx512f(auVar130,*(undefined1 (*) [64])
                                                             ((long)pvVar14 + lVar58 + 0x540),
                                                   *(undefined1 (*) [64])
                                                    ((long)piVar46 + lVar51 + 0x40));
                    auVar130 = vfmadd231ps_avx512f(auVar130,*(undefined1 (*) [64])
                                                             ((long)pvVar14 + lVar58 + 0x580),
                                                   *(undefined1 (*) [64])
                                                    ((long)piVar46 + lVar51 + 0x80));
                    auVar130 = vfmadd231ps_avx512f(auVar130,*(undefined1 (*) [64])
                                                             ((long)pvVar14 + lVar58 + 0x5c0),
                                                   *(undefined1 (*) [64])
                                                    ((long)piVar46 + lVar51 + 0xc0));
                    auVar130 = vfmadd231ps_avx512f(auVar130,*(undefined1 (*) [64])
                                                             ((long)pvVar14 + lVar58 + 0x600),
                                                   *(undefined1 (*) [64])
                                                    ((long)piVar46 + lVar51 + 0x100));
                    *(undefined1 (*) [64])((long)pvVar38 + lVar51) = auVar130;
                    lVar51 = lVar51 + 0x40;
                  }
                  ppp_Var42 = (_func_int ***)((long)(ppp_Var42 + 0x20) + lVar51);
                  ppp_Var43 = (_func_int ***)((long)(ppp_Var43 + 0x20) + lVar51);
                  pvVar67 = (void *)((long)pvVar67 + lVar51 + 0x100);
                  pvVar64 = (void *)((long)pvVar64 + lVar51 + 0x100);
                  piVar46 = (pointer)((long)piVar46 + lVar51 + 0x100);
                  pvVar38 = (void *)((long)pvVar38 + lVar51);
                }
              }
            }
            else {
              iVar37 = 5;
              if ((((*(int *)(&this->field_0xdc + (long)p_Var40) != 1) ||
                   (*(int *)(&this->field_0xe0 + (long)p_Var40) != 1)) ||
                  (*(int *)(&this->field_0xe4 + (long)p_Var40) != 2)) ||
                 (*(int *)(&this->field_0xe8 + (long)p_Var40) != 2)) goto LAB_003dcfd8;
              iVar33 = top_blob->w;
              iVar45 = local_218.w - iVar33;
              lVar56 = *(long *)(&this->field_0x1b0 + (long)p_Var40);
              uVar66 = 0;
              if (iVar33 < 1) {
                iVar33 = 0;
              }
              uVar72 = (ulong)(uint)top_blob->h;
              if (top_blob->h < 1) {
                uVar72 = uVar66;
              }
              uVar50 = (ulong)(uint)local_218.c;
              if (local_218.c < 1) {
                uVar50 = uVar66;
              }
              lVar51 = (long)(iVar45 * 0x20) * 4;
              for (; uVar66 != uVar50; uVar66 = uVar66 + 1) {
                if (lVar56 == 0) {
                  auVar133 = ZEXT1664(ZEXT816(0) << 0x40);
                }
                else {
                  auVar133 = *(undefined1 (*) [64])(lVar56 + uVar66 * 0x40);
                }
                pauVar61 = (undefined1 (*) [64])
                           (top_blob->cstep * uVar66 * top_blob->elemsize + (long)top_blob->data);
                pvVar14 = (this->weight_data_tm).data;
                lVar55 = (long)(this->weight_data_tm).w * uVar66 * (this->weight_data_tm).elemsize;
                ppp_Var42 = (_func_int ***)
                            ((long)(_func_int ***)local_218.data +
                            local_218.cstep * uVar66 * local_218.elemsize);
                lVar58 = (long)local_218.w * local_218.elemsize;
                ppp_Var43 = (_func_int ***)((long)ppp_Var42 + lVar58);
                pvVar67 = (void *)((long)ppp_Var42 + lVar58 * 2);
                pvVar38 = (void *)((long)ppp_Var42 + lVar58 * 3);
                piVar46 = (pointer)((long)ppp_Var42 + lVar58 * 4);
                for (iVar45 = 0; iVar45 != (int)uVar72; iVar45 = iVar45 + 1) {
                  lVar58 = 0;
                  iVar53 = iVar33;
                  while (bVar74 = iVar53 != 0, iVar53 = iVar53 + -1, bVar74) {
                    auVar130 = vfmadd132ps_avx512f(*(undefined1 (*) [64])((long)pvVar14 + lVar55),
                                                   auVar133,*(undefined1 (*) [64])
                                                             ((long)ppp_Var42 + lVar58));
                    auVar130 = vfmadd231ps_avx512f(auVar130,*(undefined1 (*) [64])
                                                             ((long)pvVar14 + lVar55 + 0x40),
                                                   *(undefined1 (*) [64])
                                                    ((long)(ppp_Var42 + 8) + lVar58));
                    auVar130 = vfmadd231ps_avx512f(auVar130,*(undefined1 (*) [64])
                                                             ((long)pvVar14 + lVar55 + 0x80),
                                                   *(undefined1 (*) [64])
                                                    ((long)(ppp_Var42 + 0x10) + lVar58));
                    auVar130 = vfmadd231ps_avx512f(auVar130,*(undefined1 (*) [64])
                                                             ((long)pvVar14 + lVar55 + 0xc0),
                                                   *(undefined1 (*) [64])
                                                    ((long)(ppp_Var42 + 0x18) + lVar58));
                    auVar130 = vfmadd231ps_avx512f(auVar130,*(undefined1 (*) [64])
                                                             ((long)pvVar14 + lVar55 + 0x100),
                                                   *(undefined1 (*) [64])
                                                    ((long)(ppp_Var42 + 0x20) + lVar58));
                    auVar130 = vfmadd132ps_avx512f(*(undefined1 (*) [64])
                                                    ((long)pvVar14 + lVar55 + 0x140),auVar130,
                                                   *(undefined1 (*) [64])((long)ppp_Var43 + lVar58))
                    ;
                    auVar130 = vfmadd231ps_avx512f(auVar130,*(undefined1 (*) [64])
                                                             ((long)pvVar14 + lVar55 + 0x180),
                                                   *(undefined1 (*) [64])
                                                    ((long)(ppp_Var43 + 8) + lVar58));
                    auVar130 = vfmadd231ps_avx512f(auVar130,*(undefined1 (*) [64])
                                                             ((long)pvVar14 + lVar55 + 0x1c0),
                                                   *(undefined1 (*) [64])
                                                    ((long)(ppp_Var43 + 0x10) + lVar58));
                    auVar130 = vfmadd231ps_avx512f(auVar130,*(undefined1 (*) [64])
                                                             ((long)pvVar14 + lVar55 + 0x200),
                                                   *(undefined1 (*) [64])
                                                    ((long)(ppp_Var43 + 0x18) + lVar58));
                    auVar130 = vfmadd231ps_avx512f(auVar130,*(undefined1 (*) [64])
                                                             ((long)pvVar14 + lVar55 + 0x240),
                                                   *(undefined1 (*) [64])
                                                    ((long)(ppp_Var43 + 0x20) + lVar58));
                    auVar130 = vfmadd132ps_avx512f(*(undefined1 (*) [64])
                                                    ((long)pvVar14 + lVar55 + 0x280),auVar130,
                                                   *(undefined1 (*) [64])((long)pvVar67 + lVar58));
                    auVar130 = vfmadd231ps_avx512f(auVar130,*(undefined1 (*) [64])
                                                             ((long)pvVar14 + lVar55 + 0x2c0),
                                                   *(undefined1 (*) [64])
                                                    ((long)pvVar67 + lVar58 + 0x40));
                    auVar130 = vfmadd231ps_avx512f(auVar130,*(undefined1 (*) [64])
                                                             ((long)pvVar14 + lVar55 + 0x300),
                                                   *(undefined1 (*) [64])
                                                    ((long)pvVar67 + lVar58 + 0x80));
                    auVar130 = vfmadd231ps_avx512f(auVar130,*(undefined1 (*) [64])
                                                             ((long)pvVar14 + lVar55 + 0x340),
                                                   *(undefined1 (*) [64])
                                                    ((long)pvVar67 + lVar58 + 0xc0));
                    auVar130 = vfmadd231ps_avx512f(auVar130,*(undefined1 (*) [64])
                                                             ((long)pvVar14 + lVar55 + 0x380),
                                                   *(undefined1 (*) [64])
                                                    ((long)pvVar67 + lVar58 + 0x100));
                    auVar130 = vfmadd132ps_avx512f(*(undefined1 (*) [64])
                                                    ((long)pvVar14 + lVar55 + 0x3c0),auVar130,
                                                   *(undefined1 (*) [64])((long)pvVar38 + lVar58));
                    auVar130 = vfmadd231ps_avx512f(auVar130,*(undefined1 (*) [64])
                                                             ((long)pvVar14 + lVar55 + 0x400),
                                                   *(undefined1 (*) [64])
                                                    ((long)pvVar38 + lVar58 + 0x40));
                    auVar130 = vfmadd231ps_avx512f(auVar130,*(undefined1 (*) [64])
                                                             ((long)pvVar14 + lVar55 + 0x440),
                                                   *(undefined1 (*) [64])
                                                    ((long)pvVar38 + lVar58 + 0x80));
                    auVar130 = vfmadd231ps_avx512f(auVar130,*(undefined1 (*) [64])
                                                             ((long)pvVar14 + lVar55 + 0x480),
                                                   *(undefined1 (*) [64])
                                                    ((long)pvVar38 + lVar58 + 0xc0));
                    auVar130 = vfmadd231ps_avx512f(auVar130,*(undefined1 (*) [64])
                                                             ((long)pvVar14 + lVar55 + 0x4c0),
                                                   *(undefined1 (*) [64])
                                                    ((long)pvVar38 + lVar58 + 0x100));
                    auVar130 = vfmadd132ps_avx512f(*(undefined1 (*) [64])
                                                    ((long)pvVar14 + lVar55 + 0x500),auVar130,
                                                   *(undefined1 (*) [64])((long)piVar46 + lVar58));
                    auVar130 = vfmadd231ps_avx512f(auVar130,*(undefined1 (*) [64])
                                                             ((long)pvVar14 + lVar55 + 0x540),
                                                   *(undefined1 (*) [64])
                                                    ((long)piVar46 + lVar58 + 0x40));
                    auVar130 = vfmadd231ps_avx512f(auVar130,*(undefined1 (*) [64])
                                                             ((long)pvVar14 + lVar55 + 0x580),
                                                   *(undefined1 (*) [64])
                                                    ((long)piVar46 + lVar58 + 0x80));
                    auVar130 = vfmadd231ps_avx512f(auVar130,*(undefined1 (*) [64])
                                                             ((long)pvVar14 + lVar55 + 0x5c0),
                                                   *(undefined1 (*) [64])
                                                    ((long)piVar46 + lVar58 + 0xc0));
                    auVar130 = vfmadd231ps_avx512f(auVar130,*(undefined1 (*) [64])
                                                             ((long)pvVar14 + lVar55 + 0x600),
                                                   *(undefined1 (*) [64])
                                                    ((long)piVar46 + lVar58 + 0x100));
                    *pauVar61 = auVar130;
                    pauVar61 = pauVar61 + 1;
                    lVar58 = lVar58 + 0x80;
                  }
                  ppp_Var42 = (_func_int ***)((long)ppp_Var42 + lVar58 + lVar51);
                  ppp_Var43 = (_func_int ***)((long)ppp_Var43 + lVar58 + lVar51);
                  pvVar67 = (void *)((long)pvVar67 + lVar58 + lVar51);
                  pvVar38 = (void *)((long)pvVar38 + lVar58 + lVar51);
                  piVar46 = (pointer)((long)piVar46 + lVar58 + lVar51);
                }
              }
            }
            goto LAB_003dd74c;
          }
        }
        else if ((iVar33 == 3) && (iVar37 == 3)) {
          if (((*(int *)(&this->field_0xdc + (long)p_Var40) == 1) &&
              ((*(int *)(&this->field_0xe0 + (long)p_Var40) == 1 &&
               (*(int *)(&this->field_0xe4 + (long)p_Var40) == 1)))) &&
             (*(int *)(&this->field_0xe8 + (long)p_Var40) == 1)) {
            iVar33 = top_blob->w;
            iVar45 = top_blob->h;
            lVar56 = *(long *)(&this->field_0x1b0 + (long)p_Var40);
            uVar72 = 0;
            uVar66 = (ulong)(uint)local_218.c;
            if (local_218.c < 1) {
              uVar66 = uVar72;
            }
            lVar51 = (long)(local_218.w * 0x10 + 0x20) * 4;
            lVar58 = (long)(iVar33 << 4) * 4;
            for (; uVar72 != uVar66; uVar72 = uVar72 + 1) {
              if (lVar56 == 0) {
                auVar133 = ZEXT1664(ZEXT816(0) << 0x40);
              }
              else {
                auVar133 = *(undefined1 (*) [64])(lVar56 + uVar72 * 0x40);
              }
              pvVar64 = (void *)(top_blob->cstep * uVar72 * top_blob->elemsize +
                                (long)top_blob->data);
              pvVar14 = (this->weight_data_tm).data;
              lVar55 = (long)(this->weight_data_tm).w * uVar72 * (this->weight_data_tm).elemsize;
              pvVar69 = (void *)((long)top_blob->w * top_blob->elemsize + (long)pvVar64);
              ppp_Var42 = (_func_int ***)
                          ((long)(_func_int ***)local_218.data +
                          local_218.cstep * uVar72 * local_218.elemsize);
              lVar71 = (long)local_218.w * local_218.elemsize;
              ppp_Var43 = (_func_int ***)((long)ppp_Var42 + lVar71);
              pvVar67 = (void *)((long)ppp_Var42 + lVar71 * 2);
              pvVar38 = (void *)((long)ppp_Var42 + lVar71 * 3);
              auVar130 = *(undefined1 (*) [64])((long)pvVar14 + lVar55);
              auVar3 = *(undefined1 (*) [64])((long)pvVar14 + lVar55 + 0x40);
              auVar4 = *(undefined1 (*) [64])((long)pvVar14 + lVar55 + 0x80);
              auVar5 = *(undefined1 (*) [64])((long)pvVar14 + lVar55 + 0xc0);
              auVar6 = *(undefined1 (*) [64])((long)pvVar14 + lVar55 + 0x100);
              auVar7 = *(undefined1 (*) [64])((long)pvVar14 + lVar55 + 0x140);
              auVar8 = *(undefined1 (*) [64])((long)pvVar14 + lVar55 + 0x180);
              auVar9 = *(undefined1 (*) [64])((long)pvVar14 + lVar55 + 0x1c0);
              auVar10 = *(undefined1 (*) [64])((long)pvVar14 + lVar55 + 0x200);
              for (uVar44 = 0; (int)(uVar44 | 1) < iVar45; uVar44 = uVar44 + 2) {
                lVar55 = 0;
                for (iVar53 = 0; iVar53 + 3 < iVar33; iVar53 = iVar53 + 4) {
                  auVar120 = *(undefined1 (*) [64])((long)(ppp_Var42 + 0x10) + lVar55);
                  auVar122 = *(undefined1 (*) [64])((long)(ppp_Var42 + 0x18) + lVar55);
                  auVar117 = vfmadd213ps_avx512f(*(undefined1 (*) [64])((long)ppp_Var42 + lVar55),
                                                 auVar130,auVar133);
                  auVar117 = vfmadd231ps_avx512f(auVar117,auVar3,
                                                 *(undefined1 (*) [64])
                                                  ((long)(ppp_Var42 + 8) + lVar55));
                  auVar118 = vfmadd213ps_avx512f(*(undefined1 (*) [64])
                                                  ((long)(ppp_Var42 + 8) + lVar55),auVar130,auVar133
                                                );
                  auVar118 = vfmadd231ps_avx512f(auVar118,auVar3,auVar120);
                  auVar119 = vfmadd231ps_avx512f(auVar117,auVar4,auVar120);
                  auVar120 = vfmadd213ps_avx512f(auVar120,auVar130,auVar133);
                  auVar120 = vfmadd231ps_avx512f(auVar120,auVar3,auVar122);
                  auVar121 = vfmadd231ps_avx512f(auVar118,auVar4,auVar122);
                  auVar122 = vfmadd213ps_avx512f(auVar122,auVar130,auVar133);
                  auVar122 = vfmadd231ps_avx512f(auVar122,auVar3,
                                                 *(undefined1 (*) [64])
                                                  ((long)(ppp_Var42 + 0x20) + lVar55));
                  auVar123 = vfmadd231ps_avx512f(auVar120,auVar4,
                                                 *(undefined1 (*) [64])
                                                  ((long)(ppp_Var42 + 0x20) + lVar55));
                  auVar124 = vfmadd231ps_avx512f(auVar122,auVar4,
                                                 *(undefined1 (*) [64])
                                                  ((long)(ppp_Var42 + 0x28) + lVar55));
                  auVar120 = *(undefined1 (*) [64])((long)(ppp_Var43 + 8) + lVar55);
                  auVar122 = *(undefined1 (*) [64])((long)(ppp_Var43 + 0x10) + lVar55);
                  auVar117 = *(undefined1 (*) [64])((long)(ppp_Var43 + 0x18) + lVar55);
                  auVar118 = *(undefined1 (*) [64])((long)(ppp_Var43 + 0x20) + lVar55);
                  auVar119 = vfmadd231ps_avx512f(auVar119,auVar5,
                                                 *(undefined1 (*) [64])((long)ppp_Var43 + lVar55));
                  auVar125 = vfmadd213ps_avx512f(*(undefined1 (*) [64])((long)ppp_Var43 + lVar55),
                                                 auVar130,auVar133);
                  auVar121 = vfmadd231ps_avx512f(auVar121,auVar5,auVar120);
                  auVar125 = vfmadd231ps_avx512f(auVar125,auVar3,auVar120);
                  auVar119 = vfmadd231ps_avx512f(auVar119,auVar6,auVar120);
                  auVar120 = vfmadd213ps_avx512f(auVar120,auVar130,auVar133);
                  auVar123 = vfmadd231ps_avx512f(auVar123,auVar5,auVar122);
                  auVar120 = vfmadd231ps_avx512f(auVar120,auVar3,auVar122);
                  auVar121 = vfmadd231ps_avx512f(auVar121,auVar6,auVar122);
                  auVar125 = vfmadd231ps_avx512f(auVar125,auVar4,auVar122);
                  auVar126 = vfmadd231ps_avx512f(auVar119,auVar7,auVar122);
                  auVar122 = vfmadd213ps_avx512f(auVar122,auVar130,auVar133);
                  auVar119 = vfmadd231ps_avx512f(auVar124,auVar5,auVar117);
                  auVar122 = vfmadd231ps_avx512f(auVar122,auVar3,auVar117);
                  auVar123 = vfmadd231ps_avx512f(auVar123,auVar6,auVar117);
                  auVar124 = vfmadd231ps_avx512f(auVar120,auVar4,auVar117);
                  auVar121 = vfmadd231ps_avx512f(auVar121,auVar7,auVar117);
                  auVar120 = vfmadd213ps_avx512f(auVar117,auVar130,auVar133);
                  auVar120 = vfmadd231ps_avx512f(auVar120,auVar3,auVar118);
                  auVar117 = vfmadd231ps_avx512f(auVar119,auVar6,auVar118);
                  auVar127 = vfmadd231ps_avx512f(auVar122,auVar4,auVar118);
                  auVar128 = vfmadd231ps_avx512f(auVar120,auVar4,
                                                 *(undefined1 (*) [64])
                                                  ((long)(ppp_Var43 + 0x28) + lVar55));
                  auVar123 = vfmadd231ps_avx512f(auVar123,auVar7,auVar118);
                  auVar129 = vfmadd231ps_avx512f(auVar117,auVar7,
                                                 *(undefined1 (*) [64])
                                                  ((long)(ppp_Var43 + 0x28) + lVar55));
                  auVar120 = *(undefined1 (*) [64])((long)pvVar67 + lVar55 + 0x40);
                  auVar122 = *(undefined1 (*) [64])((long)pvVar67 + lVar55 + 0x80);
                  auVar117 = *(undefined1 (*) [64])((long)pvVar67 + lVar55 + 0xc0);
                  auVar118 = *(undefined1 (*) [64])((long)pvVar67 + lVar55 + 0x100);
                  auVar119 = *(undefined1 (*) [64])((long)pvVar67 + lVar55 + 0x140);
                  auVar125 = vfmadd231ps_avx512f(auVar125,auVar5,
                                                 *(undefined1 (*) [64])((long)pvVar67 + lVar55));
                  auVar124 = vfmadd231ps_avx512f(auVar124,auVar5,auVar120);
                  auVar127 = vfmadd231ps_avx512f(auVar127,auVar5,auVar122);
                  auVar128 = vfmadd231ps_avx512f(auVar128,auVar5,auVar117);
                  auVar126 = vfmadd231ps_avx512f(auVar126,auVar8,
                                                 *(undefined1 (*) [64])((long)pvVar67 + lVar55));
                  auVar121 = vfmadd231ps_avx512f(auVar121,auVar8,auVar120);
                  auVar123 = vfmadd231ps_avx512f(auVar123,auVar8,auVar122);
                  auVar129 = vfmadd231ps_avx512f(auVar129,auVar8,auVar117);
                  auVar125 = vfmadd231ps_avx512f(auVar125,auVar6,auVar120);
                  auVar124 = vfmadd231ps_avx512f(auVar124,auVar6,auVar122);
                  auVar127 = vfmadd231ps_avx512f(auVar127,auVar6,auVar117);
                  auVar128 = vfmadd231ps_avx512f(auVar128,auVar6,auVar118);
                  auVar120 = vfmadd231ps_avx512f(auVar126,auVar9,auVar120);
                  auVar121 = vfmadd231ps_avx512f(auVar121,auVar9,auVar122);
                  auVar123 = vfmadd231ps_avx512f(auVar123,auVar9,auVar117);
                  auVar126 = vfmadd231ps_avx512f(auVar129,auVar9,auVar118);
                  auVar125 = vfmadd231ps_avx512f(auVar125,auVar7,auVar122);
                  auVar124 = vfmadd231ps_avx512f(auVar124,auVar7,auVar117);
                  auVar127 = vfmadd231ps_avx512f(auVar127,auVar7,auVar118);
                  auVar128 = vfmadd231ps_avx512f(auVar128,auVar7,auVar119);
                  auVar129 = vfmadd231ps_avx512f(auVar120,auVar10,auVar122);
                  auVar121 = vfmadd231ps_avx512f(auVar121,auVar10,auVar117);
                  auVar123 = vfmadd231ps_avx512f(auVar123,auVar10,auVar118);
                  auVar119 = vfmadd231ps_avx512f(auVar126,auVar10,auVar119);
                  auVar120 = *(undefined1 (*) [64])((long)pvVar38 + lVar55 + 0x40);
                  auVar122 = *(undefined1 (*) [64])((long)pvVar38 + lVar55 + 0x80);
                  auVar117 = *(undefined1 (*) [64])((long)pvVar38 + lVar55 + 0xc0);
                  auVar118 = *(undefined1 (*) [64])((long)pvVar38 + lVar55 + 0x100);
                  auVar125 = vfmadd231ps_avx512f(auVar125,auVar8,
                                                 *(undefined1 (*) [64])((long)pvVar38 + lVar55));
                  auVar124 = vfmadd231ps_avx512f(auVar124,auVar8,auVar120);
                  auVar126 = vfmadd231ps_avx512f(auVar127,auVar8,auVar122);
                  auVar127 = vfmadd231ps_avx512f(auVar128,auVar8,auVar117);
                  auVar120 = vfmadd231ps_avx512f(auVar125,auVar9,auVar120);
                  auVar124 = vfmadd231ps_avx512f(auVar124,auVar9,auVar122);
                  auVar125 = vfmadd231ps_avx512f(auVar126,auVar9,auVar117);
                  auVar126 = vfmadd231ps_avx512f(auVar127,auVar9,auVar118);
                  auVar120 = vfmadd231ps_avx512f(auVar120,auVar10,auVar122);
                  auVar122 = vfmadd231ps_avx512f(auVar124,auVar10,auVar117);
                  auVar117 = vfmadd231ps_avx512f(auVar125,auVar10,auVar118);
                  auVar118 = vfmadd231ps_avx512f(auVar126,auVar10,
                                                 *(undefined1 (*) [64])
                                                  ((long)pvVar38 + lVar55 + 0x140));
                  *(undefined1 (*) [64])((long)pvVar64 + lVar55) = auVar129;
                  *(undefined1 (*) [64])((long)pvVar64 + lVar55 + 0x40) = auVar121;
                  *(undefined1 (*) [64])((long)pvVar64 + lVar55 + 0x80) = auVar123;
                  *(undefined1 (*) [64])((long)pvVar64 + lVar55 + 0xc0) = auVar119;
                  *(undefined1 (*) [64])((long)pvVar69 + lVar55) = auVar120;
                  *(undefined1 (*) [64])((long)pvVar69 + lVar55 + 0x40) = auVar122;
                  *(undefined1 (*) [64])((long)pvVar69 + lVar55 + 0x80) = auVar117;
                  *(undefined1 (*) [64])((long)pvVar69 + lVar55 + 0xc0) = auVar118;
                  lVar55 = lVar55 + 0x100;
                }
                for (; iVar53 + 1 < iVar33; iVar53 = iVar53 + 2) {
                  auVar120 = vfmadd213ps_avx512f(*(undefined1 (*) [64])((long)ppp_Var42 + lVar55),
                                                 auVar130,auVar133);
                  auVar120 = vfmadd231ps_avx512f(auVar120,auVar3,
                                                 *(undefined1 (*) [64])
                                                  ((long)(ppp_Var42 + 8) + lVar55));
                  auVar122 = vfmadd213ps_avx512f(*(undefined1 (*) [64])
                                                  ((long)(ppp_Var42 + 8) + lVar55),auVar130,auVar133
                                                );
                  auVar122 = vfmadd231ps_avx512f(auVar122,auVar3,
                                                 *(undefined1 (*) [64])
                                                  ((long)(ppp_Var42 + 0x10) + lVar55));
                  auVar117 = vfmadd231ps_avx512f(auVar120,auVar4,
                                                 *(undefined1 (*) [64])
                                                  ((long)(ppp_Var42 + 0x10) + lVar55));
                  auVar118 = vfmadd231ps_avx512f(auVar122,auVar4,
                                                 *(undefined1 (*) [64])
                                                  ((long)(ppp_Var42 + 0x18) + lVar55));
                  auVar120 = *(undefined1 (*) [64])((long)(ppp_Var43 + 8) + lVar55);
                  auVar122 = *(undefined1 (*) [64])((long)(ppp_Var43 + 0x10) + lVar55);
                  auVar117 = vfmadd231ps_avx512f(auVar117,auVar5,
                                                 *(undefined1 (*) [64])((long)ppp_Var43 + lVar55));
                  auVar118 = vfmadd231ps_avx512f(auVar118,auVar5,auVar120);
                  auVar119 = vfmadd213ps_avx512f(*(undefined1 (*) [64])((long)ppp_Var43 + lVar55),
                                                 auVar130,auVar133);
                  auVar117 = vfmadd231ps_avx512f(auVar117,auVar6,auVar120);
                  auVar119 = vfmadd231ps_avx512f(auVar119,auVar3,auVar120);
                  auVar120 = vfmadd213ps_avx512f(auVar120,auVar130,auVar133);
                  auVar118 = vfmadd231ps_avx512f(auVar118,auVar6,auVar122);
                  auVar120 = vfmadd231ps_avx512f(auVar120,auVar3,auVar122);
                  auVar121 = vfmadd231ps_avx512f(auVar117,auVar7,auVar122);
                  auVar118 = vfmadd231ps_avx512f(auVar118,auVar7,
                                                 *(undefined1 (*) [64])
                                                  ((long)(ppp_Var43 + 0x18) + lVar55));
                  auVar119 = vfmadd231ps_avx512f(auVar119,auVar4,auVar122);
                  auVar123 = vfmadd231ps_avx512f(auVar120,auVar4,
                                                 *(undefined1 (*) [64])
                                                  ((long)(ppp_Var43 + 0x18) + lVar55));
                  auVar120 = *(undefined1 (*) [64])((long)pvVar67 + lVar55 + 0x40);
                  auVar122 = *(undefined1 (*) [64])((long)pvVar67 + lVar55 + 0x80);
                  auVar117 = *(undefined1 (*) [64])((long)pvVar67 + lVar55 + 0xc0);
                  auVar121 = vfmadd231ps_avx512f(auVar121,auVar8,
                                                 *(undefined1 (*) [64])((long)pvVar67 + lVar55));
                  auVar118 = vfmadd231ps_avx512f(auVar118,auVar8,auVar120);
                  auVar119 = vfmadd231ps_avx512f(auVar119,auVar5,
                                                 *(undefined1 (*) [64])((long)pvVar67 + lVar55));
                  auVar123 = vfmadd231ps_avx512f(auVar123,auVar5,auVar120);
                  auVar121 = vfmadd231ps_avx512f(auVar121,auVar9,auVar120);
                  auVar118 = vfmadd231ps_avx512f(auVar118,auVar9,auVar122);
                  auVar120 = vfmadd231ps_avx512f(auVar119,auVar6,auVar120);
                  auVar119 = vfmadd231ps_avx512f(auVar123,auVar6,auVar122);
                  auVar121 = vfmadd231ps_avx512f(auVar121,auVar10,auVar122);
                  auVar118 = vfmadd231ps_avx512f(auVar118,auVar10,auVar117);
                  auVar123 = vfmadd231ps_avx512f(auVar120,auVar7,auVar122);
                  auVar117 = vfmadd231ps_avx512f(auVar119,auVar7,auVar117);
                  auVar120 = *(undefined1 (*) [64])((long)pvVar38 + lVar55 + 0x40);
                  auVar122 = *(undefined1 (*) [64])((long)pvVar38 + lVar55 + 0x80);
                  auVar119 = vfmadd231ps_avx512f(auVar123,auVar8,
                                                 *(undefined1 (*) [64])((long)pvVar38 + lVar55));
                  auVar117 = vfmadd231ps_avx512f(auVar117,auVar8,auVar120);
                  auVar120 = vfmadd231ps_avx512f(auVar119,auVar9,auVar120);
                  auVar117 = vfmadd231ps_avx512f(auVar117,auVar9,auVar122);
                  auVar120 = vfmadd231ps_avx512f(auVar120,auVar10,auVar122);
                  auVar122 = vfmadd231ps_avx512f(auVar117,auVar10,
                                                 *(undefined1 (*) [64])
                                                  ((long)pvVar38 + lVar55 + 0xc0));
                  *(undefined1 (*) [64])((long)pvVar64 + lVar55) = auVar121;
                  *(undefined1 (*) [64])((long)pvVar64 + lVar55 + 0x40) = auVar118;
                  *(undefined1 (*) [64])((long)pvVar69 + lVar55) = auVar120;
                  *(undefined1 (*) [64])((long)pvVar69 + lVar55 + 0x40) = auVar122;
                  lVar55 = lVar55 + 0x80;
                }
                for (; iVar53 < iVar33; iVar53 = iVar53 + 1) {
                  auVar120 = vfmadd213ps_avx512f(*(undefined1 (*) [64])((long)ppp_Var42 + lVar55),
                                                 auVar130,auVar133);
                  auVar120 = vfmadd231ps_avx512f(auVar120,auVar3,
                                                 *(undefined1 (*) [64])
                                                  ((long)(ppp_Var42 + 8) + lVar55));
                  auVar120 = vfmadd231ps_avx512f(auVar120,auVar4,
                                                 *(undefined1 (*) [64])
                                                  ((long)(ppp_Var42 + 0x10) + lVar55));
                  auVar120 = vfmadd231ps_avx512f(auVar120,auVar5,
                                                 *(undefined1 (*) [64])((long)ppp_Var43 + lVar55));
                  auVar122 = vfmadd213ps_avx512f(*(undefined1 (*) [64])((long)ppp_Var43 + lVar55),
                                                 auVar130,auVar133);
                  auVar120 = vfmadd231ps_avx512f(auVar120,auVar6,
                                                 *(undefined1 (*) [64])
                                                  ((long)(ppp_Var43 + 8) + lVar55));
                  auVar122 = vfmadd231ps_avx512f(auVar122,auVar3,
                                                 *(undefined1 (*) [64])
                                                  ((long)(ppp_Var43 + 8) + lVar55));
                  auVar117 = vfmadd231ps_avx512f(auVar120,auVar7,
                                                 *(undefined1 (*) [64])
                                                  ((long)(ppp_Var43 + 0x10) + lVar55));
                  auVar118 = vfmadd231ps_avx512f(auVar122,auVar4,
                                                 *(undefined1 (*) [64])
                                                  ((long)(ppp_Var43 + 0x10) + lVar55));
                  auVar120 = *(undefined1 (*) [64])((long)pvVar67 + lVar55 + 0x40);
                  auVar122 = *(undefined1 (*) [64])((long)pvVar67 + lVar55 + 0x80);
                  auVar117 = vfmadd231ps_avx512f(auVar117,auVar8,
                                                 *(undefined1 (*) [64])((long)pvVar67 + lVar55));
                  auVar118 = vfmadd231ps_avx512f(auVar118,auVar5,
                                                 *(undefined1 (*) [64])((long)pvVar67 + lVar55));
                  auVar117 = vfmadd231ps_avx512f(auVar117,auVar9,auVar120);
                  auVar120 = vfmadd231ps_avx512f(auVar118,auVar6,auVar120);
                  auVar117 = vfmadd231ps_avx512f(auVar117,auVar10,auVar122);
                  auVar120 = vfmadd231ps_avx512f(auVar120,auVar7,auVar122);
                  auVar120 = vfmadd231ps_avx512f(auVar120,auVar8,
                                                 *(undefined1 (*) [64])((long)pvVar38 + lVar55));
                  auVar120 = vfmadd231ps_avx512f(auVar120,auVar9,
                                                 *(undefined1 (*) [64])
                                                  ((long)pvVar38 + lVar55 + 0x40));
                  auVar120 = vfmadd231ps_avx512f(auVar120,auVar10,
                                                 *(undefined1 (*) [64])
                                                  ((long)pvVar38 + lVar55 + 0x80));
                  *(undefined1 (*) [64])((long)pvVar64 + lVar55) = auVar117;
                  *(undefined1 (*) [64])((long)pvVar69 + lVar55) = auVar120;
                  lVar55 = lVar55 + 0x40;
                }
                ppp_Var42 = (_func_int ***)((long)ppp_Var42 + lVar55 + lVar51);
                ppp_Var43 = (_func_int ***)((long)ppp_Var43 + lVar55 + lVar51);
                pvVar67 = (void *)((long)pvVar67 + lVar55 + lVar51);
                pvVar38 = (void *)((long)pvVar38 + lVar55 + lVar51);
                pvVar64 = (void *)((long)pvVar64 + lVar55 + lVar58);
                pvVar69 = (void *)((long)pvVar69 + lVar55 + lVar58);
              }
              for (; (int)uVar44 < iVar45; uVar44 = uVar44 + 1) {
                lVar55 = 0;
                for (iVar53 = 0; iVar53 + 3 < iVar33; iVar53 = iVar53 + 4) {
                  auVar120 = *(undefined1 (*) [64])((long)(ppp_Var42 + 0x10) + lVar55);
                  auVar122 = *(undefined1 (*) [64])((long)(ppp_Var42 + 0x18) + lVar55);
                  auVar117 = vfmadd213ps_avx512f(*(undefined1 (*) [64])((long)ppp_Var42 + lVar55),
                                                 auVar130,auVar133);
                  auVar117 = vfmadd231ps_avx512f(auVar117,auVar3,
                                                 *(undefined1 (*) [64])
                                                  ((long)(ppp_Var42 + 8) + lVar55));
                  auVar118 = vfmadd213ps_avx512f(*(undefined1 (*) [64])
                                                  ((long)(ppp_Var42 + 8) + lVar55),auVar130,auVar133
                                                );
                  auVar118 = vfmadd231ps_avx512f(auVar118,auVar3,auVar120);
                  auVar117 = vfmadd231ps_avx512f(auVar117,auVar4,auVar120);
                  auVar120 = vfmadd213ps_avx512f(auVar120,auVar130,auVar133);
                  auVar120 = vfmadd231ps_avx512f(auVar120,auVar3,auVar122);
                  auVar118 = vfmadd231ps_avx512f(auVar118,auVar4,auVar122);
                  auVar122 = vfmadd213ps_avx512f(auVar122,auVar130,auVar133);
                  auVar122 = vfmadd231ps_avx512f(auVar122,auVar3,
                                                 *(undefined1 (*) [64])
                                                  ((long)(ppp_Var42 + 0x20) + lVar55));
                  auVar119 = vfmadd231ps_avx512f(auVar120,auVar4,
                                                 *(undefined1 (*) [64])
                                                  ((long)(ppp_Var42 + 0x20) + lVar55));
                  auVar121 = vfmadd231ps_avx512f(auVar122,auVar4,
                                                 *(undefined1 (*) [64])
                                                  ((long)(ppp_Var42 + 0x28) + lVar55));
                  auVar120 = *(undefined1 (*) [64])((long)(ppp_Var43 + 0x10) + lVar55);
                  auVar122 = *(undefined1 (*) [64])((long)(ppp_Var43 + 0x18) + lVar55);
                  auVar117 = vfmadd231ps_avx512f(auVar117,auVar5,
                                                 *(undefined1 (*) [64])((long)ppp_Var43 + lVar55));
                  auVar118 = vfmadd231ps_avx512f(auVar118,auVar5,
                                                 *(undefined1 (*) [64])
                                                  ((long)(ppp_Var43 + 8) + lVar55));
                  auVar119 = vfmadd231ps_avx512f(auVar119,auVar5,auVar120);
                  auVar121 = vfmadd231ps_avx512f(auVar121,auVar5,auVar122);
                  auVar117 = vfmadd231ps_avx512f(auVar117,auVar6,
                                                 *(undefined1 (*) [64])
                                                  ((long)(ppp_Var43 + 8) + lVar55));
                  auVar118 = vfmadd231ps_avx512f(auVar118,auVar6,auVar120);
                  auVar119 = vfmadd231ps_avx512f(auVar119,auVar6,auVar122);
                  auVar121 = vfmadd231ps_avx512f(auVar121,auVar6,
                                                 *(undefined1 (*) [64])
                                                  ((long)(ppp_Var43 + 0x20) + lVar55));
                  auVar123 = vfmadd231ps_avx512f(auVar117,auVar7,auVar120);
                  auVar124 = vfmadd231ps_avx512f(auVar118,auVar7,auVar122);
                  auVar119 = vfmadd231ps_avx512f(auVar119,auVar7,
                                                 *(undefined1 (*) [64])
                                                  ((long)(ppp_Var43 + 0x20) + lVar55));
                  auVar121 = vfmadd231ps_avx512f(auVar121,auVar7,
                                                 *(undefined1 (*) [64])
                                                  ((long)(ppp_Var43 + 0x28) + lVar55));
                  auVar120 = *(undefined1 (*) [64])((long)pvVar67 + lVar55 + 0x40);
                  auVar122 = *(undefined1 (*) [64])((long)pvVar67 + lVar55 + 0x80);
                  auVar117 = *(undefined1 (*) [64])((long)pvVar67 + lVar55 + 0xc0);
                  auVar118 = *(undefined1 (*) [64])((long)pvVar67 + lVar55 + 0x100);
                  auVar123 = vfmadd231ps_avx512f(auVar123,auVar8,
                                                 *(undefined1 (*) [64])((long)pvVar67 + lVar55));
                  auVar124 = vfmadd231ps_avx512f(auVar124,auVar8,auVar120);
                  auVar119 = vfmadd231ps_avx512f(auVar119,auVar8,auVar122);
                  auVar121 = vfmadd231ps_avx512f(auVar121,auVar8,auVar117);
                  auVar120 = vfmadd231ps_avx512f(auVar123,auVar9,auVar120);
                  auVar123 = vfmadd231ps_avx512f(auVar124,auVar9,auVar122);
                  auVar119 = vfmadd231ps_avx512f(auVar119,auVar9,auVar117);
                  auVar121 = vfmadd231ps_avx512f(auVar121,auVar9,auVar118);
                  auVar120 = vfmadd231ps_avx512f(auVar120,auVar10,auVar122);
                  auVar122 = vfmadd231ps_avx512f(auVar123,auVar10,auVar117);
                  auVar117 = vfmadd231ps_avx512f(auVar119,auVar10,auVar118);
                  auVar118 = vfmadd231ps_avx512f(auVar121,auVar10,
                                                 *(undefined1 (*) [64])
                                                  ((long)pvVar67 + lVar55 + 0x140));
                  *(undefined1 (*) [64])((long)pvVar64 + lVar55) = auVar120;
                  *(undefined1 (*) [64])((long)pvVar64 + lVar55 + 0x40) = auVar122;
                  *(undefined1 (*) [64])((long)pvVar64 + lVar55 + 0x80) = auVar117;
                  *(undefined1 (*) [64])((long)pvVar64 + lVar55 + 0xc0) = auVar118;
                  lVar55 = lVar55 + 0x100;
                }
                for (; iVar53 + 1 < iVar33; iVar53 = iVar53 + 2) {
                  auVar120 = vfmadd213ps_avx512f(*(undefined1 (*) [64])((long)ppp_Var42 + lVar55),
                                                 auVar130,auVar133);
                  auVar120 = vfmadd231ps_avx512f(auVar120,auVar3,
                                                 *(undefined1 (*) [64])
                                                  ((long)(ppp_Var42 + 8) + lVar55));
                  auVar122 = vfmadd213ps_avx512f(*(undefined1 (*) [64])
                                                  ((long)(ppp_Var42 + 8) + lVar55),auVar130,auVar133
                                                );
                  auVar122 = vfmadd231ps_avx512f(auVar122,auVar3,
                                                 *(undefined1 (*) [64])
                                                  ((long)(ppp_Var42 + 0x10) + lVar55));
                  auVar120 = vfmadd231ps_avx512f(auVar120,auVar4,
                                                 *(undefined1 (*) [64])
                                                  ((long)(ppp_Var42 + 0x10) + lVar55));
                  auVar122 = vfmadd231ps_avx512f(auVar122,auVar4,
                                                 *(undefined1 (*) [64])
                                                  ((long)(ppp_Var42 + 0x18) + lVar55));
                  auVar120 = vfmadd231ps_avx512f(auVar120,auVar5,
                                                 *(undefined1 (*) [64])((long)ppp_Var43 + lVar55));
                  auVar122 = vfmadd231ps_avx512f(auVar122,auVar5,
                                                 *(undefined1 (*) [64])
                                                  ((long)(ppp_Var43 + 8) + lVar55));
                  auVar120 = vfmadd231ps_avx512f(auVar120,auVar6,
                                                 *(undefined1 (*) [64])
                                                  ((long)(ppp_Var43 + 8) + lVar55));
                  auVar122 = vfmadd231ps_avx512f(auVar122,auVar6,
                                                 *(undefined1 (*) [64])
                                                  ((long)(ppp_Var43 + 0x10) + lVar55));
                  auVar117 = vfmadd231ps_avx512f(auVar120,auVar7,
                                                 *(undefined1 (*) [64])
                                                  ((long)(ppp_Var43 + 0x10) + lVar55));
                  auVar118 = vfmadd231ps_avx512f(auVar122,auVar7,
                                                 *(undefined1 (*) [64])
                                                  ((long)(ppp_Var43 + 0x18) + lVar55));
                  auVar120 = *(undefined1 (*) [64])((long)pvVar67 + lVar55 + 0x40);
                  auVar122 = *(undefined1 (*) [64])((long)pvVar67 + lVar55 + 0x80);
                  auVar117 = vfmadd231ps_avx512f(auVar117,auVar8,
                                                 *(undefined1 (*) [64])((long)pvVar67 + lVar55));
                  auVar118 = vfmadd231ps_avx512f(auVar118,auVar8,auVar120);
                  auVar120 = vfmadd231ps_avx512f(auVar117,auVar9,auVar120);
                  auVar117 = vfmadd231ps_avx512f(auVar118,auVar9,auVar122);
                  auVar120 = vfmadd231ps_avx512f(auVar120,auVar10,auVar122);
                  auVar122 = vfmadd231ps_avx512f(auVar117,auVar10,
                                                 *(undefined1 (*) [64])
                                                  ((long)pvVar67 + lVar55 + 0xc0));
                  *(undefined1 (*) [64])((long)pvVar64 + lVar55) = auVar120;
                  *(undefined1 (*) [64])((long)pvVar64 + lVar55 + 0x40) = auVar122;
                  lVar55 = lVar55 + 0x80;
                }
                for (; iVar53 < iVar33; iVar53 = iVar53 + 1) {
                  auVar120 = vfmadd213ps_avx512f(*(undefined1 (*) [64])((long)ppp_Var42 + lVar55),
                                                 auVar130,auVar133);
                  auVar120 = vfmadd231ps_avx512f(auVar120,auVar3,
                                                 *(undefined1 (*) [64])
                                                  ((long)(ppp_Var42 + 8) + lVar55));
                  auVar120 = vfmadd231ps_avx512f(auVar120,auVar4,
                                                 *(undefined1 (*) [64])
                                                  ((long)(ppp_Var42 + 0x10) + lVar55));
                  auVar120 = vfmadd231ps_avx512f(auVar120,auVar5,
                                                 *(undefined1 (*) [64])((long)ppp_Var43 + lVar55));
                  auVar120 = vfmadd231ps_avx512f(auVar120,auVar6,
                                                 *(undefined1 (*) [64])
                                                  ((long)(ppp_Var43 + 8) + lVar55));
                  auVar120 = vfmadd231ps_avx512f(auVar120,auVar7,
                                                 *(undefined1 (*) [64])
                                                  ((long)(ppp_Var43 + 0x10) + lVar55));
                  auVar120 = vfmadd231ps_avx512f(auVar120,auVar8,
                                                 *(undefined1 (*) [64])((long)pvVar67 + lVar55));
                  auVar120 = vfmadd231ps_avx512f(auVar120,auVar9,
                                                 *(undefined1 (*) [64])
                                                  ((long)pvVar67 + lVar55 + 0x40));
                  auVar120 = vfmadd231ps_avx512f(auVar120,auVar10,
                                                 *(undefined1 (*) [64])
                                                  ((long)pvVar67 + lVar55 + 0x80));
                  *(undefined1 (*) [64])((long)pvVar64 + lVar55) = auVar120;
                  lVar55 = lVar55 + 0x40;
                }
                ppp_Var42 = (_func_int ***)((long)(ppp_Var42 + 0x10) + lVar55);
                ppp_Var43 = (_func_int ***)((long)(ppp_Var43 + 0x10) + lVar55);
                pvVar67 = (void *)((long)pvVar67 + lVar55 + 0x80);
                pvVar64 = (void *)((long)pvVar64 + lVar55);
              }
            }
          }
          else {
            iVar37 = 3;
            if ((((*(int *)(&this->field_0xdc + (long)p_Var40) != 1) ||
                 (*(int *)(&this->field_0xe0 + (long)p_Var40) != 1)) ||
                (*(int *)(&this->field_0xe4 + (long)p_Var40) != 2)) ||
               (*(int *)(&this->field_0xe8 + (long)p_Var40) != 2)) goto LAB_003dcfd8;
            iVar33 = top_blob->w;
            lVar56 = *(long *)(&this->field_0x1b0 + (long)p_Var40);
            uVar72 = 0;
            uVar66 = (ulong)(uint)top_blob->h;
            if (top_blob->h < 1) {
              uVar66 = uVar72;
            }
            uVar44 = local_218.c;
            if (local_218.c < 1) {
              uVar44 = 0;
            }
            lVar51 = (long)((local_218.w - iVar33) * 0x20) * 4;
            for (; uVar72 != uVar44; uVar72 = uVar72 + 1) {
              if (lVar56 == 0) {
                auVar133 = ZEXT1664(ZEXT816(0) << 0x40);
              }
              else {
                auVar133 = *(undefined1 (*) [64])(lVar56 + uVar72 * 0x40);
              }
              pauVar61 = (undefined1 (*) [64])
                         (top_blob->cstep * uVar72 * top_blob->elemsize + (long)top_blob->data);
              pvVar14 = (this->weight_data_tm).data;
              lVar58 = (long)(this->weight_data_tm).w * uVar72 * (this->weight_data_tm).elemsize;
              ppp_Var42 = (_func_int ***)
                          ((long)(_func_int ***)local_218.data +
                          local_218.cstep * uVar72 * local_218.elemsize);
              ppp_Var43 = (_func_int ***)((long)ppp_Var42 + (long)local_218.w * local_218.elemsize);
              pvVar67 = (void *)((long)ppp_Var42 + (long)local_218.w * local_218.elemsize * 2);
              auVar130 = *(undefined1 (*) [64])((long)pvVar14 + lVar58);
              auVar3 = *(undefined1 (*) [64])((long)pvVar14 + lVar58 + 0x40);
              auVar4 = *(undefined1 (*) [64])((long)pvVar14 + lVar58 + 0x80);
              auVar5 = *(undefined1 (*) [64])((long)pvVar14 + lVar58 + 0xc0);
              auVar6 = *(undefined1 (*) [64])((long)pvVar14 + lVar58 + 0x100);
              auVar7 = *(undefined1 (*) [64])((long)pvVar14 + lVar58 + 0x140);
              auVar8 = *(undefined1 (*) [64])((long)pvVar14 + lVar58 + 0x180);
              auVar9 = *(undefined1 (*) [64])((long)pvVar14 + lVar58 + 0x1c0);
              auVar10 = *(undefined1 (*) [64])((long)pvVar14 + lVar58 + 0x200);
              for (iVar45 = 0; iVar45 != (int)uVar66; iVar45 = iVar45 + 1) {
                lVar58 = 0;
                for (iVar53 = 0; iVar53 + 3 < iVar33; iVar53 = iVar53 + 4) {
                  auVar120 = vfmadd213ps_avx512f(*(undefined1 (*) [64])((long)ppp_Var42 + lVar58),
                                                 auVar130,auVar133);
                  auVar120 = vfmadd231ps_avx512f(auVar120,auVar3,
                                                 *(undefined1 (*) [64])
                                                  ((long)(ppp_Var42 + 8) + lVar58));
                  auVar120 = vfmadd231ps_avx512f(auVar120,auVar4,
                                                 *(undefined1 (*) [64])
                                                  ((long)(ppp_Var42 + 0x10) + lVar58));
                  auVar122 = vfmadd213ps_avx512f(*(undefined1 (*) [64])
                                                  ((long)(ppp_Var42 + 0x10) + lVar58),auVar130,
                                                 auVar133);
                  auVar122 = vfmadd231ps_avx512f(auVar122,auVar3,
                                                 *(undefined1 (*) [64])
                                                  ((long)(ppp_Var42 + 0x18) + lVar58));
                  auVar122 = vfmadd231ps_avx512f(auVar122,auVar4,
                                                 *(undefined1 (*) [64])
                                                  ((long)(ppp_Var42 + 0x20) + lVar58));
                  auVar117 = vfmadd213ps_avx512f(*(undefined1 (*) [64])
                                                  ((long)(ppp_Var42 + 0x20) + lVar58),auVar130,
                                                 auVar133);
                  auVar118 = vfmadd213ps_avx512f(*(undefined1 (*) [64])
                                                  ((long)(ppp_Var42 + 0x30) + lVar58),auVar130,
                                                 auVar133);
                  auVar117 = vfmadd231ps_avx512f(auVar117,auVar3,
                                                 *(undefined1 (*) [64])
                                                  ((long)(ppp_Var42 + 0x28) + lVar58));
                  auVar118 = vfmadd231ps_avx512f(auVar118,auVar3,
                                                 *(undefined1 (*) [64])
                                                  ((long)(ppp_Var42 + 0x38) + lVar58));
                  auVar117 = vfmadd231ps_avx512f(auVar117,auVar4,
                                                 *(undefined1 (*) [64])
                                                  ((long)(ppp_Var42 + 0x30) + lVar58));
                  auVar118 = vfmadd231ps_avx512f(auVar118,auVar4,
                                                 *(undefined1 (*) [64])
                                                  ((long)(ppp_Var42 + 0x40) + lVar58));
                  auVar120 = vfmadd231ps_avx512f(auVar120,auVar5,
                                                 *(undefined1 (*) [64])((long)ppp_Var43 + lVar58));
                  auVar122 = vfmadd231ps_avx512f(auVar122,auVar5,
                                                 *(undefined1 (*) [64])
                                                  ((long)(ppp_Var43 + 0x10) + lVar58));
                  auVar117 = vfmadd231ps_avx512f(auVar117,auVar5,
                                                 *(undefined1 (*) [64])
                                                  ((long)(ppp_Var43 + 0x20) + lVar58));
                  auVar120 = vfmadd231ps_avx512f(auVar120,auVar6,
                                                 *(undefined1 (*) [64])
                                                  ((long)(ppp_Var43 + 8) + lVar58));
                  auVar122 = vfmadd231ps_avx512f(auVar122,auVar6,
                                                 *(undefined1 (*) [64])
                                                  ((long)(ppp_Var43 + 0x18) + lVar58));
                  auVar117 = vfmadd231ps_avx512f(auVar117,auVar6,
                                                 *(undefined1 (*) [64])
                                                  ((long)(ppp_Var43 + 0x28) + lVar58));
                  auVar118 = vfmadd231ps_avx512f(auVar118,auVar5,
                                                 *(undefined1 (*) [64])
                                                  ((long)(ppp_Var43 + 0x30) + lVar58));
                  auVar118 = vfmadd231ps_avx512f(auVar118,auVar6,
                                                 *(undefined1 (*) [64])
                                                  ((long)(ppp_Var43 + 0x38) + lVar58));
                  auVar119 = vfmadd231ps_avx512f(auVar120,auVar7,
                                                 *(undefined1 (*) [64])
                                                  ((long)(ppp_Var43 + 0x10) + lVar58));
                  auVar121 = vfmadd231ps_avx512f(auVar122,auVar7,
                                                 *(undefined1 (*) [64])
                                                  ((long)(ppp_Var43 + 0x20) + lVar58));
                  auVar123 = vfmadd231ps_avx512f(auVar117,auVar7,
                                                 *(undefined1 (*) [64])
                                                  ((long)(ppp_Var43 + 0x30) + lVar58));
                  auVar118 = vfmadd231ps_avx512f(auVar118,auVar7,
                                                 *(undefined1 (*) [64])
                                                  ((long)(ppp_Var43 + 0x40) + lVar58));
                  auVar120 = *(undefined1 (*) [64])((long)pvVar67 + lVar58 + 0x80);
                  auVar122 = *(undefined1 (*) [64])((long)pvVar67 + lVar58 + 0x100);
                  auVar119 = vfmadd231ps_avx512f(auVar119,auVar8,
                                                 *(undefined1 (*) [64])((long)pvVar67 + lVar58));
                  auVar117 = *(undefined1 (*) [64])((long)pvVar67 + lVar58 + 0x180);
                  auVar121 = vfmadd231ps_avx512f(auVar121,auVar8,auVar120);
                  auVar123 = vfmadd231ps_avx512f(auVar123,auVar8,auVar122);
                  auVar118 = vfmadd231ps_avx512f(auVar118,auVar8,auVar117);
                  auVar119 = vfmadd231ps_avx512f(auVar119,auVar9,
                                                 *(undefined1 (*) [64])
                                                  ((long)pvVar67 + lVar58 + 0x40));
                  auVar121 = vfmadd231ps_avx512f(auVar121,auVar9,
                                                 *(undefined1 (*) [64])
                                                  ((long)pvVar67 + lVar58 + 0xc0));
                  auVar123 = vfmadd231ps_avx512f(auVar123,auVar9,
                                                 *(undefined1 (*) [64])
                                                  ((long)pvVar67 + lVar58 + 0x140));
                  auVar118 = vfmadd231ps_avx512f(auVar118,auVar9,
                                                 *(undefined1 (*) [64])
                                                  ((long)pvVar67 + lVar58 + 0x1c0));
                  auVar120 = vfmadd231ps_avx512f(auVar119,auVar10,auVar120);
                  auVar122 = vfmadd231ps_avx512f(auVar121,auVar10,auVar122);
                  auVar118 = vfmadd231ps_avx512f(auVar118,auVar10,
                                                 *(undefined1 (*) [64])
                                                  ((long)pvVar67 + lVar58 + 0x200));
                  auVar117 = vfmadd231ps_avx512f(auVar123,auVar10,auVar117);
                  *pauVar61 = auVar120;
                  pauVar61[1] = auVar122;
                  pauVar61[2] = auVar117;
                  pauVar61[3] = auVar118;
                  pauVar61 = pauVar61 + 4;
                  lVar58 = lVar58 + 0x200;
                }
                for (; iVar53 + 1 < iVar33; iVar53 = iVar53 + 2) {
                  auVar120 = vfmadd213ps_avx512f(*(undefined1 (*) [64])((long)ppp_Var42 + lVar58),
                                                 auVar130,auVar133);
                  auVar120 = vfmadd231ps_avx512f(auVar120,auVar3,
                                                 *(undefined1 (*) [64])
                                                  ((long)(ppp_Var42 + 8) + lVar58));
                  auVar120 = vfmadd231ps_avx512f(auVar120,auVar4,
                                                 *(undefined1 (*) [64])
                                                  ((long)(ppp_Var42 + 0x10) + lVar58));
                  auVar122 = vfmadd213ps_avx512f(*(undefined1 (*) [64])
                                                  ((long)(ppp_Var42 + 0x10) + lVar58),auVar130,
                                                 auVar133);
                  auVar122 = vfmadd231ps_avx512f(auVar122,auVar3,
                                                 *(undefined1 (*) [64])
                                                  ((long)(ppp_Var42 + 0x18) + lVar58));
                  auVar122 = vfmadd231ps_avx512f(auVar122,auVar4,
                                                 *(undefined1 (*) [64])
                                                  ((long)(ppp_Var42 + 0x20) + lVar58));
                  auVar120 = vfmadd231ps_avx512f(auVar120,auVar5,
                                                 *(undefined1 (*) [64])((long)ppp_Var43 + lVar58));
                  auVar122 = vfmadd231ps_avx512f(auVar122,auVar5,
                                                 *(undefined1 (*) [64])
                                                  ((long)(ppp_Var43 + 0x10) + lVar58));
                  auVar120 = vfmadd231ps_avx512f(auVar120,auVar6,
                                                 *(undefined1 (*) [64])
                                                  ((long)(ppp_Var43 + 8) + lVar58));
                  auVar122 = vfmadd231ps_avx512f(auVar122,auVar6,
                                                 *(undefined1 (*) [64])
                                                  ((long)(ppp_Var43 + 0x18) + lVar58));
                  auVar117 = vfmadd231ps_avx512f(auVar120,auVar7,
                                                 *(undefined1 (*) [64])
                                                  ((long)(ppp_Var43 + 0x10) + lVar58));
                  auVar122 = vfmadd231ps_avx512f(auVar122,auVar7,
                                                 *(undefined1 (*) [64])
                                                  ((long)(ppp_Var43 + 0x20) + lVar58));
                  auVar120 = *(undefined1 (*) [64])((long)pvVar67 + lVar58 + 0x80);
                  auVar117 = vfmadd231ps_avx512f(auVar117,auVar8,
                                                 *(undefined1 (*) [64])((long)pvVar67 + lVar58));
                  auVar122 = vfmadd231ps_avx512f(auVar122,auVar8,auVar120);
                  auVar117 = vfmadd231ps_avx512f(auVar117,auVar9,
                                                 *(undefined1 (*) [64])
                                                  ((long)pvVar67 + lVar58 + 0x40));
                  auVar122 = vfmadd231ps_avx512f(auVar122,auVar9,
                                                 *(undefined1 (*) [64])
                                                  ((long)pvVar67 + lVar58 + 0xc0));
                  auVar120 = vfmadd231ps_avx512f(auVar117,auVar10,auVar120);
                  auVar122 = vfmadd231ps_avx512f(auVar122,auVar10,
                                                 *(undefined1 (*) [64])
                                                  ((long)pvVar67 + lVar58 + 0x100));
                  *pauVar61 = auVar120;
                  pauVar61[1] = auVar122;
                  pauVar61 = pauVar61 + 2;
                  lVar58 = lVar58 + 0x100;
                }
                for (; iVar53 < iVar33; iVar53 = iVar53 + 1) {
                  auVar120 = vfmadd213ps_avx512f(*(undefined1 (*) [64])((long)ppp_Var42 + lVar58),
                                                 auVar130,auVar133);
                  auVar120 = vfmadd231ps_avx512f(auVar120,auVar3,
                                                 *(undefined1 (*) [64])
                                                  ((long)(ppp_Var42 + 8) + lVar58));
                  auVar120 = vfmadd231ps_avx512f(auVar120,auVar4,
                                                 *(undefined1 (*) [64])
                                                  ((long)(ppp_Var42 + 0x10) + lVar58));
                  auVar120 = vfmadd231ps_avx512f(auVar120,auVar5,
                                                 *(undefined1 (*) [64])((long)ppp_Var43 + lVar58));
                  auVar120 = vfmadd231ps_avx512f(auVar120,auVar6,
                                                 *(undefined1 (*) [64])
                                                  ((long)(ppp_Var43 + 8) + lVar58));
                  auVar120 = vfmadd231ps_avx512f(auVar120,auVar7,
                                                 *(undefined1 (*) [64])
                                                  ((long)(ppp_Var43 + 0x10) + lVar58));
                  auVar120 = vfmadd231ps_avx512f(auVar120,auVar8,
                                                 *(undefined1 (*) [64])((long)pvVar67 + lVar58));
                  auVar120 = vfmadd231ps_avx512f(auVar120,auVar9,
                                                 *(undefined1 (*) [64])
                                                  ((long)pvVar67 + lVar58 + 0x40));
                  auVar120 = vfmadd231ps_avx512f(auVar120,auVar10,
                                                 *(undefined1 (*) [64])
                                                  ((long)pvVar67 + lVar58 + 0x80));
                  *pauVar61 = auVar120;
                  pauVar61 = pauVar61 + 1;
                  lVar58 = lVar58 + 0x80;
                }
                ppp_Var42 = (_func_int ***)((long)ppp_Var42 + lVar58 + lVar51);
                ppp_Var43 = (_func_int ***)((long)ppp_Var43 + lVar58 + lVar51);
                pvVar67 = (void *)((long)pvVar67 + lVar58 + lVar51);
              }
            }
          }
          goto LAB_003dd74c;
        }
LAB_003dcfd8:
        uVar41 = iVar37 * iVar33;
        std::vector<int,_std::allocator<int>_>::vector
                  (&_space_ofs,(long)(int)uVar41,(allocator_type *)&opt_p);
        pp_Var17 = this->_vptr_ConvolutionDepthWise_x86_avx512;
        p_Var40 = pp_Var17[-3];
        iVar33 = *(int *)(&this->field_0xe0 + (long)p_Var40);
        iVar37 = *(int *)(&this->field_0xdc + (long)p_Var40);
        iVar11 = *(int *)(&this->field_0xd4 + (long)p_Var40);
        iVar48 = 0;
        lVar56 = 0;
        for (iVar49 = 0; iVar49 < *(int *)(&this->field_0xd8 + (long)p_Var40); iVar49 = iVar49 + 1)
        {
          for (lVar51 = 0; (int)lVar51 < *(int *)(&this->field_0xd4 + (long)p_Var40);
              lVar51 = lVar51 + 1) {
            _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
            ._M_start[(int)lVar56 + lVar51] = iVar48;
            p_Var40 = pp_Var17[-3];
            iVar48 = iVar48 + *(int *)(&this->field_0xdc + (long)p_Var40);
          }
          iVar48 = iVar48 + (iVar31 * iVar33 - iVar37 * iVar11);
          lVar56 = (int)lVar56 + lVar51;
        }
        uVar36 = 0;
        uVar57 = uVar41;
        if ((int)uVar41 < 1) {
          uVar57 = uVar36;
        }
        if ((int)uVar44 < 1) {
          uVar72 = 0;
        }
        for (uVar66 = 0; uVar66 != uVar72; uVar66 = uVar66 + 1) {
          pauVar61 = (undefined1 (*) [64])
                     (top_blob->cstep * uVar66 * top_blob->elemsize + (long)top_blob->data);
          pvVar67 = (this->weight_data_tm).data;
          for (iVar33 = 0; iVar33 <= iVar53; iVar33 = iVar33 + 1) {
            pp_Var17 = this->_vptr_ConvolutionDepthWise_x86_avx512;
            for (iVar37 = 0; iVar37 <= iVar45; iVar37 = iVar37 + 1) {
              p_Var40 = pp_Var17[-3];
              if (*(int *)(&this->field_0x100 + (long)p_Var40) == 0) {
                auVar133 = ZEXT1664(ZEXT816(0) << 0x40);
              }
              else {
                auVar133 = *(undefined1 (*) [64])
                            (*(long *)(&this->field_0x1b0 + (long)p_Var40) + uVar66 * 0x40);
              }
              pauVar52 = (undefined1 (*) [64])((long)(int)uVar36 * 4 + (long)pvVar67);
              for (uVar50 = 0; uVar57 != uVar50; uVar50 = uVar50 + 1) {
                auVar133 = vfmadd231ps_avx512f(auVar133,*(undefined1 (*) [64])
                                                         ((long)&((Allocator *)
                                                                 ((long)local_218.data +
                                                                 (long)_space_ofs.
                                                                                                                                              
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start[uVar50] *
                                                  8 * 8))->_vptr_Allocator +
                                                  (long)(*(int *)(&this->field_0xe4 + (long)p_Var40)
                                                         * iVar37 * 0x10) * 4 +
                                                  (long)iVar33 *
                                                  (long)*(int *)(&this->field_0xe8 + (long)p_Var40)
                                                  * (long)local_218.w * local_218.elemsize +
                                                  local_218.cstep * uVar66 * local_218.elemsize),
                                               *pauVar52);
                pauVar52 = pauVar52 + 1;
              }
              *pauVar61 = auVar133;
              pauVar61 = pauVar61 + 1;
            }
          }
          uVar36 = uVar36 + uVar41 * 0x10;
        }
        pLVar18 = this->activation;
        if (pLVar18 != (Layer *)0x0) {
          (*pLVar18->_vptr_Layer[9])(pLVar18,top_blob,opt);
        }
      }
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&_space_ofs.super__Vector_base<int,_std::allocator<int>_>);
    }
    iVar49 = 0;
    goto LAB_003dd700;
  }
LAB_003db252:
  uVar66 = (long)iVar34 / (long)iVar12;
  uVar72 = (long)iVar49 / (long)iVar12;
  if (opt->use_packing_layout == true) {
    iVar45 = 0x10;
    uVar44 = 0x10;
    if ((uVar66 & 0xf) != 0) {
      if ((uVar66 & 7) == 0) {
        iVar45 = 8;
      }
      else {
        iVar45 = (uint)((uVar66 & 3) == 0) * 3 + 1;
      }
    }
    if ((uVar72 & 0xf) != 0) {
      if ((uVar72 & 7) == 0) {
        uVar44 = 8;
      }
      else {
        uVar44 = (uint)((uVar72 & 3) == 0) * 3 + 1;
      }
    }
  }
  else {
    iVar45 = 1;
    uVar44 = 1;
  }
  piVar16 = (int *)CONCAT44(local_218.refcount._4_4_,(int)local_218.refcount);
  _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)CONCAT44(local_218.refcount._4_4_,(int)local_218.refcount);
  _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)local_218.data;
  _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)local_218.elemsize;
  uVar28._4_4_ = local_218.w;
  uVar28._0_4_ = local_218.dims;
  uVar29._4_4_ = local_218.d;
  uVar29._0_4_ = local_218.h;
  if (piVar16 != (int *)0x0) {
    LOCK();
    *piVar16 = *piVar16 + 1;
    UNLOCK();
  }
  if (iVar45 < iVar33) {
    opt_p.lightmode = opt->lightmode;
    opt_p._1_3_ = *(undefined3 *)&opt->field_0x1;
    opt_p.num_threads = opt->num_threads;
    opt_p.workspace_allocator = opt->workspace_allocator;
    opt_p.openmp_blocktime = opt->openmp_blocktime;
    opt_p.use_winograd_convolution = opt->use_winograd_convolution;
    opt_p.use_sgemm_convolution = opt->use_sgemm_convolution;
    opt_p.use_int8_inference = opt->use_int8_inference;
    opt_p.use_vulkan_compute = opt->use_vulkan_compute;
    opt_p.use_bf16_storage = opt->use_bf16_storage;
    opt_p.use_fp16_packed = opt->use_fp16_packed;
    opt_p.use_fp16_storage = opt->use_fp16_storage;
    opt_p.use_fp16_arithmetic = opt->use_fp16_arithmetic;
    opt_p.use_int8_packed = opt->use_int8_packed;
    opt_p.use_int8_storage = opt->use_int8_storage;
    opt_p.use_int8_arithmetic = opt->use_int8_arithmetic;
    opt_p.use_packing_layout = opt->use_packing_layout;
    opt_p.use_shader_pack8 = opt->use_shader_pack8;
    opt_p.use_subgroup_basic = opt->use_subgroup_basic;
    opt_p.use_subgroup_vote = opt->use_subgroup_vote;
    opt_p.use_subgroup_ballot = opt->use_subgroup_ballot;
    opt_p.use_subgroup_shuffle = opt->use_subgroup_shuffle;
    opt_p.use_image_storage = opt->use_image_storage;
    opt_p.use_tensor_storage = opt->use_tensor_storage;
    opt_p.use_reserved_0 = opt->use_reserved_0;
    opt_p.flush_denormals = opt->flush_denormals;
    opt_p.use_local_pool_allocator = opt->use_local_pool_allocator;
    opt_p.use_shader_local_memory = opt->use_shader_local_memory;
    opt_p.use_cooperative_matrix = opt->use_cooperative_matrix;
    opt_p.use_winograd23_convolution = opt->use_winograd23_convolution;
    opt_p.use_winograd43_convolution = opt->use_winograd43_convolution;
    opt_p.use_winograd63_convolution = opt->use_winograd63_convolution;
    opt_p.use_reserved_6 = opt->use_reserved_6;
    opt_p.use_reserved_7 = opt->use_reserved_7;
    opt_p.use_reserved_8 = opt->use_reserved_8;
    opt_p.use_reserved_9 = opt->use_reserved_9;
    opt_p.use_reserved_10 = opt->use_reserved_10;
    opt_p.use_reserved_11 = opt->use_reserved_11;
    opt_p.blob_allocator = opt->workspace_allocator;
    convert_packing(&local_218,(Mat *)&_space_ofs,iVar45,&opt_p);
  }
  piVar16 = top_blob->refcount;
  opt_p._0_8_ = top_blob->data;
  opt_p.blob_allocator = (Allocator *)top_blob->refcount;
  opt_p.workspace_allocator = (Allocator *)top_blob->elemsize;
  opt_p.openmp_blocktime = top_blob->elempack;
  opt_p._32_8_ = top_blob->allocator;
  opt_p._40_8_ = *(undefined8 *)&top_blob->dims;
  opt_p._48_8_ = *(undefined8 *)&top_blob->h;
  opt_p._56_4_ = top_blob->c;
  sVar13 = top_blob->cstep;
  if (piVar16 != (int *)0x0) {
    LOCK();
    *piVar16 = *piVar16 + 1;
    UNLOCK();
  }
  if (uVar44 < uVar57) {
    Mat::create((Mat *)&opt_p,iVar48,(int)local_1d0,
                *(int *)(&this->field_0xd0 + (long)this->_vptr_ConvolutionDepthWise_x86_avx512[-3])
                / (int)uVar44,(ulong)uVar44 * (_elemsize / uVar57),uVar44,opt->workspace_allocator);
    iVar49 = -100;
    if ((opt_p._0_8_ != 0) && ((long)(int)opt_p._56_4_ * sVar13 != 0)) goto LAB_003db484;
  }
  else {
LAB_003db484:
    iVar33 = 0;
    iVar53 = 0;
    for (lVar56 = 0;
        lVar56 < *(int *)(&this->field_0x108 + (long)this->_vptr_ConvolutionDepthWise_x86_avx512[-3]
                         ); lVar56 = lVar56 + 1) {
      m.c = (int)uVar66 / iVar45;
      m.data = (void *)((long)(iVar33 / iVar45) * sVar15 *
                        (long)_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage +
                       (long)_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start);
      m.refcount = (int *)0x0;
      m.elemsize = (size_t)_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage;
      m.elempack = iVar37;
      m.allocator = pAVar30;
      m.cstep = ((long)iVar32 *
                 (long)_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage * (long)iVar54 * (long)iVar11 +
                 0xfU & 0xfffffffffffffff0) /
                (ulong)_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage;
      m_1.c = (int)uVar72 / (int)uVar44;
      m_1.data = (void *)((long)(iVar53 / (int)uVar44) * sVar13 * (long)opt_p.workspace_allocator +
                         opt_p._0_8_);
      m_1.refcount = (int *)0x0;
      m_1.elemsize = (size_t)opt_p.workspace_allocator;
      m_1.elempack = opt_p.openmp_blocktime;
      m_1.allocator = (Allocator *)opt_p._32_8_;
      m_1.cstep = ((long)(int)opt_p._52_4_ * (long)opt_p.workspace_allocator *
                   (long)opt_p.flush_denormals * (long)(int)opt_p._44_4_ + 0xfU & 0xfffffffffffffff0
                  ) / (ulong)opt_p.workspace_allocator;
      m_1._40_8_ = opt_p._40_8_;
      m_1._48_8_ = opt_p._48_8_;
      pLVar18 = (this->group_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
                _M_impl.super__Vector_impl_data._M_start[lVar56];
      opt_g.lightmode = opt->lightmode;
      opt_g._1_3_ = *(undefined3 *)&opt->field_0x1;
      opt_g.num_threads = opt->num_threads;
      opt_g.workspace_allocator = opt->workspace_allocator;
      opt_g.openmp_blocktime = opt->openmp_blocktime;
      opt_g.use_winograd_convolution = opt->use_winograd_convolution;
      opt_g.use_sgemm_convolution = opt->use_sgemm_convolution;
      opt_g.use_int8_inference = opt->use_int8_inference;
      opt_g.use_vulkan_compute = opt->use_vulkan_compute;
      opt_g.use_bf16_storage = opt->use_bf16_storage;
      opt_g.use_fp16_packed = opt->use_fp16_packed;
      opt_g.use_fp16_storage = opt->use_fp16_storage;
      opt_g.use_fp16_arithmetic = opt->use_fp16_arithmetic;
      opt_g.use_int8_packed = opt->use_int8_packed;
      opt_g.use_int8_storage = opt->use_int8_storage;
      opt_g.use_int8_arithmetic = opt->use_int8_arithmetic;
      opt_g.use_packing_layout = opt->use_packing_layout;
      opt_g.use_shader_pack8 = opt->use_shader_pack8;
      opt_g.use_subgroup_basic = opt->use_subgroup_basic;
      opt_g.use_subgroup_vote = opt->use_subgroup_vote;
      opt_g.use_subgroup_ballot = opt->use_subgroup_ballot;
      opt_g.use_subgroup_shuffle = opt->use_subgroup_shuffle;
      opt_g.use_image_storage = opt->use_image_storage;
      opt_g.use_tensor_storage = opt->use_tensor_storage;
      opt_g.use_reserved_0 = opt->use_reserved_0;
      opt_g.flush_denormals = opt->flush_denormals;
      opt_g.use_local_pool_allocator = opt->use_local_pool_allocator;
      opt_g.use_shader_local_memory = opt->use_shader_local_memory;
      opt_g.use_cooperative_matrix = opt->use_cooperative_matrix;
      opt_g.use_winograd23_convolution = opt->use_winograd23_convolution;
      opt_g.use_winograd43_convolution = opt->use_winograd43_convolution;
      opt_g.use_winograd63_convolution = opt->use_winograd63_convolution;
      opt_g.use_reserved_6 = opt->use_reserved_6;
      opt_g.use_reserved_7 = opt->use_reserved_7;
      opt_g.use_reserved_8 = opt->use_reserved_8;
      opt_g.use_reserved_9 = opt->use_reserved_9;
      opt_g.use_reserved_10 = opt->use_reserved_10;
      opt_g.use_reserved_11 = opt->use_reserved_11;
      opt_g.blob_allocator = (Allocator *)opt_p._32_8_;
      m._40_8_ = uVar28;
      m._48_8_ = uVar29;
      (*pLVar18->_vptr_Layer[7])(pLVar18,&m,&m_1,&opt_g);
      if (m_1.refcount != (int *)0x0) {
        LOCK();
        *m_1.refcount = *m_1.refcount + -1;
        UNLOCK();
        if (*m_1.refcount == 0) {
          if (m_1.allocator == (Allocator *)0x0) {
            free(m_1.data);
          }
          else {
            (*(m_1.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      if (m.refcount != (int *)0x0) {
        LOCK();
        *m.refcount = *m.refcount + -1;
        UNLOCK();
        if (*m.refcount == 0) {
          if (m.allocator == (Allocator *)0x0) {
            free(m.data);
          }
          else {
            (*(m.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      iVar53 = iVar53 + (int)uVar72;
      iVar33 = iVar33 + (int)uVar66;
    }
    if (uVar44 < uVar57) {
      iVar49 = 0;
      convert_packing((Mat *)&opt_p,top_blob,uVar57,opt);
    }
    else {
      iVar49 = 0;
      if ((Mat *)&opt_p != top_blob) {
        if (opt_p.blob_allocator != (Allocator *)0x0) {
          LOCK();
          *(int *)&(opt_p.blob_allocator)->_vptr_Allocator =
               *(int *)&(opt_p.blob_allocator)->_vptr_Allocator + 1;
          UNLOCK();
        }
        piVar16 = top_blob->refcount;
        if (piVar16 != (int *)0x0) {
          LOCK();
          *piVar16 = *piVar16 + -1;
          UNLOCK();
          if (*piVar16 == 0) {
            if (top_blob->allocator == (Allocator *)0x0) {
              free(top_blob->data);
            }
            else {
              (*top_blob->allocator->_vptr_Allocator[3])();
            }
          }
        }
        top_blob->data = (void *)opt_p._0_8_;
        top_blob->refcount = (int *)opt_p.blob_allocator;
        top_blob->elemsize = (size_t)opt_p.workspace_allocator;
        top_blob->elempack = opt_p.openmp_blocktime;
        top_blob->allocator = (Allocator *)opt_p._32_8_;
        *(undefined8 *)&top_blob->dims = opt_p._40_8_;
        *(undefined8 *)&top_blob->h = opt_p._48_8_;
        top_blob->c = opt_p._56_4_;
        top_blob->cstep = sVar13;
      }
    }
  }
  if (opt_p.blob_allocator != (Allocator *)0x0) {
    LOCK();
    *(int *)&(opt_p.blob_allocator)->_vptr_Allocator =
         *(int *)&(opt_p.blob_allocator)->_vptr_Allocator + -1;
    UNLOCK();
    if (*(int *)&(opt_p.blob_allocator)->_vptr_Allocator == 0) {
      if (opt_p._32_8_ == 0) {
        free((void *)opt_p._0_8_);
      }
      else {
        (**(code **)(*(long *)opt_p._32_8_ + 0x18))();
      }
    }
  }
  if (_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish != (pointer)0x0) {
    LOCK();
    *_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
     _M_finish = *_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish + -1;
    UNLOCK();
    if (*_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_finish == 0) {
      if (pAVar30 == (Allocator *)0x0) {
        free(_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start);
      }
      else {
        (*pAVar30->_vptr_Allocator[3])();
      }
    }
  }
LAB_003dd700:
  piVar16 = (int *)CONCAT44(local_218.refcount._4_4_,(int)local_218.refcount);
  if (piVar16 != (int *)0x0) {
    LOCK();
    *piVar16 = *piVar16 + -1;
    UNLOCK();
    if (*piVar16 == 0) {
      if (local_218.allocator == (Allocator *)0x0) {
        free(local_218.data);
      }
      else {
        (*(local_218.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar49;
}

Assistant:

int ConvolutionDepthWise_x86_avx512::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
#if NCNN_INT8
    if (opt.use_int8_inference && int8_scale_term)
    {
        return forward_int8_x86(bottom_blob, top_blob, opt);
    }
#endif

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    Mat bottom_blob_bordered;
    make_padding(bottom_blob, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    w = bottom_blob_bordered.w;
    h = bottom_blob_bordered.h;

    int outw = (w - kernel_extent_w) / stride_w + 1;
    int outh = (h - kernel_extent_h) / stride_h + 1;
    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__
    size_t out_elemsize = elemsize / elempack * out_elempack;

    top_blob.create(outw, outh, num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // depth-wise
    if (channels * elempack == group && group == num_output)
    {
#if __SSE2__
#if __AVX__
#if __AVX512F__
        if (elempack == 16)
        {
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            {
                convdw3x3s1_pack16_avx512(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            {
                convdw3x3s2_pack16_avx512(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 5 && kernel_h == 5 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            {
                convdw5x5s1_pack16_avx512(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 5 && kernel_h == 5 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            {
                convdw5x5s2_pack16_avx512(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            else
            {
                const int maxk = kernel_w * kernel_h;

                // kernel offsets
                std::vector<int> _space_ofs(maxk);
                int* space_ofs = &_space_ofs[0];
                {
                    int p1 = 0;
                    int p2 = 0;
                    int gap = w * dilation_h - kernel_w * dilation_w;
                    for (int i = 0; i < kernel_h; i++)
                    {
                        for (int j = 0; j < kernel_w; j++)
                        {
                            space_ofs[p1] = p2;
                            p1++;
                            p2 += dilation_w;
                        }
                        p2 += gap;
                    }
                }

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int g = 0; g < channels; g++)
                {
                    float* outptr = top_blob.channel(g);
                    const float* kptr = (const float*)weight_data_tm + maxk * g * 16;
                    const Mat m = bottom_blob_bordered.channel(g);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            __m512 _sum = _mm512_set1_ps(0.f);

                            if (bias_term)
                            {
                                _sum = _mm512_loadu_ps(((const float*)bias_data) + g * 16);
                            }

                            const float* sptr = m.row(i * stride_h) + j * stride_w * 16;

                            for (int k = 0; k < maxk; k++)
                            {
                                __m512 _val = _mm512_loadu_ps(sptr + space_ofs[k] * 16);
                                __m512 _w = _mm512_loadu_ps(kptr + k * 16);
                                _sum = _mm512_fmadd_ps(_val, _w, _sum);
                            }

                            _mm512_storeu_ps(outptr, _sum);
                            outptr += 16;
                        }
                    }
                }

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
        }
#endif // __AVX512F__
        if (elempack == 8)
        {
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            {
                convdw3x3s1_pack8_avx(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            {
                convdw3x3s2_pack8_avx(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 5 && kernel_h == 5 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            {
                convdw5x5s1_pack8_avx(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 5 && kernel_h == 5 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            {
                convdw5x5s2_pack8_avx(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            else
            {
                const int maxk = kernel_w * kernel_h;

                // kernel offsets
                std::vector<int> _space_ofs(maxk);
                int* space_ofs = &_space_ofs[0];
                {
                    int p1 = 0;
                    int p2 = 0;
                    int gap = w * dilation_h - kernel_w * dilation_w;
                    for (int i = 0; i < kernel_h; i++)
                    {
                        for (int j = 0; j < kernel_w; j++)
                        {
                            space_ofs[p1] = p2;
                            p1++;
                            p2 += dilation_w;
                        }
                        p2 += gap;
                    }
                }

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int g = 0; g < channels; g++)
                {
                    float* outptr = top_blob.channel(g);
                    const float* kptr = (const float*)weight_data_tm + maxk * g * 8;
                    const Mat m = bottom_blob_bordered.channel(g);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            __m256 _sum = _mm256_set1_ps(0.f);

                            if (bias_term)
                            {
                                _sum = _mm256_loadu_ps(((const float*)bias_data) + g * 8);
                            }

                            const float* sptr = m.row(i * stride_h) + j * stride_w * 8;

                            for (int k = 0; k < maxk; k++)
                            {
                                __m256 _val = _mm256_loadu_ps(sptr + space_ofs[k] * 8);
                                __m256 _w = _mm256_loadu_ps(kptr + k * 8);
                                _sum = _mm256_comp_fmadd_ps(_val, _w, _sum);
                            }

                            _mm256_storeu_ps(outptr + j * 8, _sum);
                        }

                        outptr += outw * 8;
                    }
                }

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
        }
#endif // __AVX__

        if (elempack == 4)
        {
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            {
                convdw3x3s1_pack4_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            {
                convdw3x3s2_pack4_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 5 && kernel_h == 5 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            {
                convdw5x5s1_pack4_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 5 && kernel_h == 5 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            {
                convdw5x5s2_pack4_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            {
                const int maxk = kernel_w * kernel_h;

                // kernel offsets
                std::vector<int> _space_ofs(maxk);
                int* space_ofs = &_space_ofs[0];
                {
                    int p1 = 0;
                    int p2 = 0;
                    int gap = w * dilation_h - kernel_w * dilation_w;
                    for (int i = 0; i < kernel_h; i++)
                    {
                        for (int j = 0; j < kernel_w; j++)
                        {
                            space_ofs[p1] = p2;
                            p1++;
                            p2 += dilation_w;
                        }
                        p2 += gap;
                    }
                }

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int g = 0; g < channels; g++)
                {
                    float* outptr = top_blob.channel(g);
                    const float* kptr = (const float*)weight_data_tm + maxk * g * 4;
                    const Mat m = bottom_blob_bordered.channel(g);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            __m128 _sum = _mm_set1_ps(0.f);

                            if (bias_term)
                            {
                                _sum = _mm_loadu_ps(((const float*)bias_data) + g * 4);
                            }

                            const float* sptr = m.row(i * stride_h) + j * stride_w * 4;

                            for (int k = 0; k < maxk; k++)
                            {
                                __m128 _val = _mm_loadu_ps(sptr + space_ofs[k] * 4);
                                __m128 _w = _mm_loadu_ps(kptr + k * 4);
                                _sum = _mm_add_ps(_mm_mul_ps(_val, _w), _sum);
                            }

                            _sum = activation_sse(_sum, activation_type, activation_params);

                            _mm_storeu_ps(outptr + j * 4, _sum);
                        }

                        outptr += outw * 4;
                    }
                }

                return 0;
            }
        }
#endif // __SSE2__

        if (elempack == 1)
        {
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            {
                convdw3x3s1_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            {
                convdw3x3s2_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
        }
    }

    // group convolution
    const int channels_g = channels * elempack / group;
    const int num_output_g = num_output / group;

    int g_elempack = 1;
    int out_g_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        g_elempack = channels_g % 16 == 0 ? 16 : channels_g % 8 == 0 ? 8 : channels_g % 4 == 0 ? 4 : 1;
        out_g_elempack = num_output_g % 16 == 0 ? 16 : num_output_g % 8 == 0 ? 8 : num_output_g % 4 == 0 ? 4 : 1;
#elif __AVX__
        g_elempack = channels_g % 8 == 0 ? 8 : channels_g % 4 == 0 ? 4 : 1;
        out_g_elempack = num_output_g % 8 == 0 ? 8 : num_output_g % 4 == 0 ? 4 : 1;
#else
        g_elempack = channels_g % 4 == 0 ? 4 : 1;
        out_g_elempack = num_output_g % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__

    // unpacking
    Mat bottom_blob_bordered_unpacked = bottom_blob_bordered;
    if (elempack > g_elempack)
    {
        Option opt_p = opt;
        opt_p.blob_allocator = opt.workspace_allocator;
        convert_packing(bottom_blob_bordered, bottom_blob_bordered_unpacked, g_elempack, opt_p);
    }

    Mat top_blob_unpacked = top_blob;
    if (out_g_elempack < out_elempack)
    {
        top_blob_unpacked.create(outw, outh, num_output / out_g_elempack, out_elemsize / out_elempack * out_g_elempack, out_g_elempack, opt.workspace_allocator);
        if (top_blob_unpacked.empty())
            return -100;
    }

    for (int g = 0; g < group; g++)
    {
        const Mat bottom_blob_bordered_g = bottom_blob_bordered_unpacked.channel_range(channels_g * g / g_elempack, channels_g / g_elempack);
        Mat top_blob_g = top_blob_unpacked.channel_range(num_output_g * g / out_g_elempack, num_output_g / out_g_elempack);

        const ncnn::Layer* op = group_ops[g];

        Option opt_g = opt;
        opt_g.blob_allocator = top_blob_unpacked.allocator;

        // forward
        op->forward(bottom_blob_bordered_g, top_blob_g, opt_g);
    }

    // packing
    if (out_g_elempack < out_elempack)
    {
        convert_packing(top_blob_unpacked, top_blob, out_elempack, opt);
    }
    else
    {
        top_blob = top_blob_unpacked;
    }

    return 0;
}